

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  undefined1 (*pauVar4) [32];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  uint uVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  long lVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [24];
  undefined1 auVar129 [28];
  undefined8 uVar130;
  undefined8 uVar131;
  int iVar132;
  RTCIntersectArguments *pRVar133;
  RayK<4> *pRVar134;
  byte bVar135;
  uint uVar136;
  ulong uVar137;
  ulong uVar138;
  undefined1 auVar168 [16];
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar169 [32];
  undefined1 auVar185 [16];
  long lVar139;
  long lVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar157;
  float fVar161;
  float fVar162;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  float fVar163;
  float fVar179;
  float fVar181;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar164;
  float fVar182;
  undefined1 auVar167 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar188;
  undefined1 auVar174 [32];
  float fVar180;
  float fVar183;
  float fVar189;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar194 [16];
  float fVar203;
  undefined1 auVar202 [32];
  float fVar204;
  float fVar219;
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  float fVar217;
  float fVar218;
  float fVar221;
  float fVar223;
  float fVar226;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar206 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar220;
  float fVar222;
  float fVar224;
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  float fVar229;
  float fVar230;
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar235 [32];
  float fVar242;
  float fVar244;
  float fVar246;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar250;
  undefined1 auVar240 [64];
  float fVar251;
  float fVar262;
  float fVar264;
  undefined1 auVar253 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar255 [32];
  undefined1 auVar254 [16];
  float fVar252;
  float fVar267;
  undefined1 auVar256 [32];
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar268;
  float fVar269;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar273;
  float fVar282;
  float fVar283;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar284;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar285;
  float fVar286;
  undefined1 auVar281 [32];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar314;
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar315;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [64];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [64];
  float in_register_0000151c;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar348;
  float fVar350;
  undefined1 auVar345 [32];
  float fVar349;
  float fVar351;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar352;
  float fVar355;
  float fVar356;
  float fVar357;
  float in_register_0000159c;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar358;
  float fVar362;
  float fVar363;
  float fVar364;
  float in_register_000015dc;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  ulong local_840;
  uint local_7a0;
  undefined4 uStack_79c;
  undefined1 local_780 [16];
  ulong local_768;
  uint local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined1 auStack_6f8 [8];
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 (*local_6b8) [16];
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 auStack_630 [8];
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  RTCHitN local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_260 [32];
  float local_240 [4];
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar18 = prim[1];
  uVar138 = (ulong)(byte)PVar18;
  lVar139 = uVar138 * 5;
  lVar114 = uVar138 * 0x19;
  auVar207 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar207 = vinsertps_avx(auVar207,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar195 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar204 = *(float *)(prim + lVar114 + 0x12);
  auVar207 = vsubps_avx(auVar207,*(undefined1 (*) [16])(prim + lVar114 + 6));
  auVar165._0_4_ = fVar204 * auVar207._0_4_;
  auVar165._4_4_ = fVar204 * auVar207._4_4_;
  auVar165._8_4_ = fVar204 * auVar207._8_4_;
  auVar165._12_4_ = fVar204 * auVar207._12_4_;
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 4 + 6)));
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 4 + 10)));
  auVar253._0_4_ = fVar204 * auVar195._0_4_;
  auVar253._4_4_ = fVar204 * auVar195._4_4_;
  auVar253._8_4_ = fVar204 * auVar195._8_4_;
  auVar253._12_4_ = fVar204 * auVar195._12_4_;
  auVar144._16_16_ = auVar185;
  auVar144._0_16_ = auVar207;
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar139 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar139 + 10)));
  auVar198._16_16_ = auVar195;
  auVar198._0_16_ = auVar207;
  auVar306 = vcvtdq2ps_avx(auVar198);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 6 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 6 + 10)));
  auVar208._16_16_ = auVar195;
  auVar208._0_16_ = auVar207;
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xb + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xb + 10)));
  auVar23 = vcvtdq2ps_avx(auVar208);
  auVar209._16_16_ = auVar195;
  auVar209._0_16_ = auVar207;
  auVar24 = vcvtdq2ps_avx(auVar209);
  uVar137 = (ulong)((uint)(byte)PVar18 * 0xc);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar276._16_16_ = auVar195;
  auVar276._0_16_ = auVar207;
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar138 + 6)));
  auVar319 = vcvtdq2ps_avx(auVar276);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar138 + 10)));
  auVar287._16_16_ = auVar195;
  auVar287._0_16_ = auVar207;
  lVar140 = uVar138 * 9;
  uVar137 = (ulong)(uint)((int)lVar140 * 2);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar287);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar288._16_16_ = auVar195;
  auVar288._0_16_ = auVar207;
  auVar26 = vcvtdq2ps_avx(auVar288);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar138 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar138 + 10)));
  auVar316._16_16_ = auVar195;
  auVar316._0_16_ = auVar207;
  uVar137 = (ulong)(uint)((int)lVar139 << 2);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar27 = vcvtdq2ps_avx(auVar316);
  auVar330._16_16_ = auVar195;
  auVar330._0_16_ = auVar207;
  auVar28 = vcvtdq2ps_avx(auVar330);
  auVar207 = vshufps_avx(auVar253,auVar253,0);
  auVar195 = vshufps_avx(auVar253,auVar253,0x55);
  auVar185 = vshufps_avx(auVar253,auVar253,0xaa);
  fVar204 = auVar185._0_4_;
  fVar217 = auVar185._4_4_;
  fVar218 = auVar185._8_4_;
  fVar219 = auVar185._12_4_;
  fVar221 = auVar195._0_4_;
  fVar223 = auVar195._4_4_;
  fVar226 = auVar195._8_4_;
  fVar229 = auVar195._12_4_;
  fVar241 = auVar207._0_4_;
  fVar243 = auVar207._4_4_;
  fVar245 = auVar207._8_4_;
  fVar247 = auVar207._12_4_;
  auVar338._0_4_ = fVar241 * auVar144._0_4_ + fVar221 * auVar306._0_4_ + fVar204 * auVar23._0_4_;
  auVar338._4_4_ = fVar243 * auVar144._4_4_ + fVar223 * auVar306._4_4_ + fVar217 * auVar23._4_4_;
  auVar338._8_4_ = fVar245 * auVar144._8_4_ + fVar226 * auVar306._8_4_ + fVar218 * auVar23._8_4_;
  auVar338._12_4_ = fVar247 * auVar144._12_4_ + fVar229 * auVar306._12_4_ + fVar219 * auVar23._12_4_
  ;
  auVar338._16_4_ = fVar241 * auVar144._16_4_ + fVar221 * auVar306._16_4_ + fVar204 * auVar23._16_4_
  ;
  auVar338._20_4_ = fVar243 * auVar144._20_4_ + fVar223 * auVar306._20_4_ + fVar217 * auVar23._20_4_
  ;
  auVar338._24_4_ = fVar245 * auVar144._24_4_ + fVar226 * auVar306._24_4_ + fVar218 * auVar23._24_4_
  ;
  auVar338._28_4_ = fVar229 + in_register_000015dc + in_register_0000151c;
  auVar334._0_4_ = fVar241 * auVar24._0_4_ + fVar221 * auVar319._0_4_ + auVar25._0_4_ * fVar204;
  auVar334._4_4_ = fVar243 * auVar24._4_4_ + fVar223 * auVar319._4_4_ + auVar25._4_4_ * fVar217;
  auVar334._8_4_ = fVar245 * auVar24._8_4_ + fVar226 * auVar319._8_4_ + auVar25._8_4_ * fVar218;
  auVar334._12_4_ = fVar247 * auVar24._12_4_ + fVar229 * auVar319._12_4_ + auVar25._12_4_ * fVar219;
  auVar334._16_4_ = fVar241 * auVar24._16_4_ + fVar221 * auVar319._16_4_ + auVar25._16_4_ * fVar204;
  auVar334._20_4_ = fVar243 * auVar24._20_4_ + fVar223 * auVar319._20_4_ + auVar25._20_4_ * fVar217;
  auVar334._24_4_ = fVar245 * auVar24._24_4_ + fVar226 * auVar319._24_4_ + auVar25._24_4_ * fVar218;
  auVar334._28_4_ = fVar229 + in_register_000015dc + in_register_0000159c;
  auVar255._0_4_ = fVar241 * auVar26._0_4_ + fVar221 * auVar27._0_4_ + auVar28._0_4_ * fVar204;
  auVar255._4_4_ = fVar243 * auVar26._4_4_ + fVar223 * auVar27._4_4_ + auVar28._4_4_ * fVar217;
  auVar255._8_4_ = fVar245 * auVar26._8_4_ + fVar226 * auVar27._8_4_ + auVar28._8_4_ * fVar218;
  auVar255._12_4_ = fVar247 * auVar26._12_4_ + fVar229 * auVar27._12_4_ + auVar28._12_4_ * fVar219;
  auVar255._16_4_ = fVar241 * auVar26._16_4_ + fVar221 * auVar27._16_4_ + auVar28._16_4_ * fVar204;
  auVar255._20_4_ = fVar243 * auVar26._20_4_ + fVar223 * auVar27._20_4_ + auVar28._20_4_ * fVar217;
  auVar255._24_4_ = fVar245 * auVar26._24_4_ + fVar226 * auVar27._24_4_ + auVar28._24_4_ * fVar218;
  auVar255._28_4_ = fVar247 + fVar229 + fVar219;
  auVar207 = vshufps_avx(auVar165,auVar165,0);
  auVar195 = vshufps_avx(auVar165,auVar165,0x55);
  auVar185 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar217 = auVar185._0_4_;
  fVar218 = auVar185._4_4_;
  fVar219 = auVar185._8_4_;
  fVar221 = auVar185._12_4_;
  fVar243 = auVar195._0_4_;
  fVar245 = auVar195._4_4_;
  fVar247 = auVar195._8_4_;
  fVar248 = auVar195._12_4_;
  fVar223 = auVar207._0_4_;
  fVar226 = auVar207._4_4_;
  fVar229 = auVar207._8_4_;
  fVar241 = auVar207._12_4_;
  fVar204 = auVar144._28_4_;
  auVar277._0_4_ = fVar223 * auVar144._0_4_ + fVar243 * auVar306._0_4_ + fVar217 * auVar23._0_4_;
  auVar277._4_4_ = fVar226 * auVar144._4_4_ + fVar245 * auVar306._4_4_ + fVar218 * auVar23._4_4_;
  auVar277._8_4_ = fVar229 * auVar144._8_4_ + fVar247 * auVar306._8_4_ + fVar219 * auVar23._8_4_;
  auVar277._12_4_ = fVar241 * auVar144._12_4_ + fVar248 * auVar306._12_4_ + fVar221 * auVar23._12_4_
  ;
  auVar277._16_4_ = fVar223 * auVar144._16_4_ + fVar243 * auVar306._16_4_ + fVar217 * auVar23._16_4_
  ;
  auVar277._20_4_ = fVar226 * auVar144._20_4_ + fVar245 * auVar306._20_4_ + fVar218 * auVar23._20_4_
  ;
  auVar277._24_4_ = fVar229 * auVar144._24_4_ + fVar247 * auVar306._24_4_ + fVar219 * auVar23._24_4_
  ;
  auVar277._28_4_ = fVar204 + auVar306._28_4_ + auVar23._28_4_;
  auVar169._0_4_ = fVar223 * auVar24._0_4_ + auVar25._0_4_ * fVar217 + fVar243 * auVar319._0_4_;
  auVar169._4_4_ = fVar226 * auVar24._4_4_ + auVar25._4_4_ * fVar218 + fVar245 * auVar319._4_4_;
  auVar169._8_4_ = fVar229 * auVar24._8_4_ + auVar25._8_4_ * fVar219 + fVar247 * auVar319._8_4_;
  auVar169._12_4_ = fVar241 * auVar24._12_4_ + auVar25._12_4_ * fVar221 + fVar248 * auVar319._12_4_;
  auVar169._16_4_ = fVar223 * auVar24._16_4_ + auVar25._16_4_ * fVar217 + fVar243 * auVar319._16_4_;
  auVar169._20_4_ = fVar226 * auVar24._20_4_ + auVar25._20_4_ * fVar218 + fVar245 * auVar319._20_4_;
  auVar169._24_4_ = fVar229 * auVar24._24_4_ + auVar25._24_4_ * fVar219 + fVar247 * auVar319._24_4_;
  auVar169._28_4_ = fVar204 + auVar25._28_4_ + auVar23._28_4_;
  auVar289._8_4_ = 0x7fffffff;
  auVar289._0_8_ = 0x7fffffff7fffffff;
  auVar289._12_4_ = 0x7fffffff;
  auVar289._16_4_ = 0x7fffffff;
  auVar289._20_4_ = 0x7fffffff;
  auVar289._24_4_ = 0x7fffffff;
  auVar289._28_4_ = 0x7fffffff;
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar199._16_4_ = 0x219392ef;
  auVar199._20_4_ = 0x219392ef;
  auVar199._24_4_ = 0x219392ef;
  auVar199._28_4_ = 0x219392ef;
  auVar144 = vandps_avx(auVar338,auVar289);
  auVar144 = vcmpps_avx(auVar144,auVar199,1);
  auVar306 = vblendvps_avx(auVar338,auVar199,auVar144);
  auVar144 = vandps_avx(auVar334,auVar289);
  auVar144 = vcmpps_avx(auVar144,auVar199,1);
  auVar23 = vblendvps_avx(auVar334,auVar199,auVar144);
  auVar144 = vandps_avx(auVar255,auVar289);
  auVar144 = vcmpps_avx(auVar144,auVar199,1);
  auVar144 = vblendvps_avx(auVar255,auVar199,auVar144);
  auVar200._0_4_ = fVar243 * auVar27._0_4_ + auVar28._0_4_ * fVar217 + fVar223 * auVar26._0_4_;
  auVar200._4_4_ = fVar245 * auVar27._4_4_ + auVar28._4_4_ * fVar218 + fVar226 * auVar26._4_4_;
  auVar200._8_4_ = fVar247 * auVar27._8_4_ + auVar28._8_4_ * fVar219 + fVar229 * auVar26._8_4_;
  auVar200._12_4_ = fVar248 * auVar27._12_4_ + auVar28._12_4_ * fVar221 + fVar241 * auVar26._12_4_;
  auVar200._16_4_ = fVar243 * auVar27._16_4_ + auVar28._16_4_ * fVar217 + fVar223 * auVar26._16_4_;
  auVar200._20_4_ = fVar245 * auVar27._20_4_ + auVar28._20_4_ * fVar218 + fVar226 * auVar26._20_4_;
  auVar200._24_4_ = fVar247 * auVar27._24_4_ + auVar28._24_4_ * fVar219 + fVar229 * auVar26._24_4_;
  auVar200._28_4_ = auVar319._28_4_ + fVar221 + fVar204;
  auVar24 = vrcpps_avx(auVar306);
  fVar204 = auVar24._0_4_;
  fVar217 = auVar24._4_4_;
  auVar319._4_4_ = auVar306._4_4_ * fVar217;
  auVar319._0_4_ = auVar306._0_4_ * fVar204;
  fVar218 = auVar24._8_4_;
  auVar319._8_4_ = auVar306._8_4_ * fVar218;
  fVar219 = auVar24._12_4_;
  auVar319._12_4_ = auVar306._12_4_ * fVar219;
  fVar221 = auVar24._16_4_;
  auVar319._16_4_ = auVar306._16_4_ * fVar221;
  fVar223 = auVar24._20_4_;
  auVar319._20_4_ = auVar306._20_4_ * fVar223;
  fVar226 = auVar24._24_4_;
  auVar319._24_4_ = auVar306._24_4_ * fVar226;
  auVar319._28_4_ = auVar306._28_4_;
  auVar303._8_4_ = 0x3f800000;
  auVar303._0_8_ = 0x3f8000003f800000;
  auVar303._12_4_ = 0x3f800000;
  auVar303._16_4_ = 0x3f800000;
  auVar303._20_4_ = 0x3f800000;
  auVar303._24_4_ = 0x3f800000;
  auVar303._28_4_ = 0x3f800000;
  auVar319 = vsubps_avx(auVar303,auVar319);
  auVar306 = vrcpps_avx(auVar23);
  fVar204 = fVar204 + fVar204 * auVar319._0_4_;
  fVar217 = fVar217 + fVar217 * auVar319._4_4_;
  fVar218 = fVar218 + fVar218 * auVar319._8_4_;
  fVar219 = fVar219 + fVar219 * auVar319._12_4_;
  fVar221 = fVar221 + fVar221 * auVar319._16_4_;
  fVar223 = fVar223 + fVar223 * auVar319._20_4_;
  fVar226 = fVar226 + fVar226 * auVar319._24_4_;
  fVar251 = auVar306._0_4_;
  fVar262 = auVar306._4_4_;
  auVar25._4_4_ = fVar262 * auVar23._4_4_;
  auVar25._0_4_ = fVar251 * auVar23._0_4_;
  fVar264 = auVar306._8_4_;
  auVar25._8_4_ = fVar264 * auVar23._8_4_;
  fVar267 = auVar306._12_4_;
  auVar25._12_4_ = fVar267 * auVar23._12_4_;
  fVar270 = auVar306._16_4_;
  auVar25._16_4_ = fVar270 * auVar23._16_4_;
  fVar271 = auVar306._20_4_;
  auVar25._20_4_ = fVar271 * auVar23._20_4_;
  fVar272 = auVar306._24_4_;
  auVar25._24_4_ = fVar272 * auVar23._24_4_;
  auVar25._28_4_ = auVar24._28_4_;
  auVar306 = vsubps_avx(auVar303,auVar25);
  fVar251 = fVar251 + fVar251 * auVar306._0_4_;
  fVar262 = fVar262 + fVar262 * auVar306._4_4_;
  fVar264 = fVar264 + fVar264 * auVar306._8_4_;
  fVar267 = fVar267 + fVar267 * auVar306._12_4_;
  fVar270 = fVar270 + fVar270 * auVar306._16_4_;
  fVar271 = fVar271 + fVar271 * auVar306._20_4_;
  fVar272 = fVar272 + fVar272 * auVar306._24_4_;
  auVar306 = vrcpps_avx(auVar144);
  fVar229 = auVar306._0_4_;
  fVar241 = auVar306._4_4_;
  auVar26._4_4_ = fVar241 * auVar144._4_4_;
  auVar26._0_4_ = fVar229 * auVar144._0_4_;
  fVar243 = auVar306._8_4_;
  auVar26._8_4_ = fVar243 * auVar144._8_4_;
  fVar245 = auVar306._12_4_;
  auVar26._12_4_ = fVar245 * auVar144._12_4_;
  fVar247 = auVar306._16_4_;
  auVar26._16_4_ = fVar247 * auVar144._16_4_;
  fVar248 = auVar306._20_4_;
  auVar26._20_4_ = fVar248 * auVar144._20_4_;
  fVar249 = auVar306._24_4_;
  auVar26._24_4_ = fVar249 * auVar144._24_4_;
  auVar26._28_4_ = auVar23._28_4_;
  auVar144 = vsubps_avx(auVar303,auVar26);
  fVar229 = fVar229 + fVar229 * auVar144._0_4_;
  fVar241 = fVar241 + fVar241 * auVar144._4_4_;
  fVar243 = fVar243 + fVar243 * auVar144._8_4_;
  fVar245 = fVar245 + fVar245 * auVar144._12_4_;
  fVar247 = fVar247 + fVar247 * auVar144._16_4_;
  fVar248 = fVar248 + fVar248 * auVar144._20_4_;
  fVar249 = fVar249 + fVar249 * auVar144._24_4_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar138 * 7 + 6);
  auVar207 = vpmovsxwd_avx(auVar207);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar138 * 7 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar195);
  auVar145._16_16_ = auVar195;
  auVar145._0_16_ = auVar207;
  auVar144 = vcvtdq2ps_avx(auVar145);
  auVar144 = vsubps_avx(auVar144,auVar277);
  auVar142._0_4_ = fVar204 * auVar144._0_4_;
  auVar142._4_4_ = fVar217 * auVar144._4_4_;
  auVar142._8_4_ = fVar218 * auVar144._8_4_;
  auVar142._12_4_ = fVar219 * auVar144._12_4_;
  auVar23._16_4_ = fVar221 * auVar144._16_4_;
  auVar23._0_16_ = auVar142;
  auVar23._20_4_ = fVar223 * auVar144._20_4_;
  auVar23._24_4_ = fVar226 * auVar144._24_4_;
  auVar23._28_4_ = auVar144._28_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + lVar140 + 6);
  auVar207 = vpmovsxwd_avx(auVar185);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + lVar140 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar192);
  auVar290._16_16_ = auVar195;
  auVar290._0_16_ = auVar207;
  auVar144 = vcvtdq2ps_avx(auVar290);
  auVar144 = vsubps_avx(auVar144,auVar277);
  auVar205._0_4_ = fVar204 * auVar144._0_4_;
  auVar205._4_4_ = fVar217 * auVar144._4_4_;
  auVar205._8_4_ = fVar218 * auVar144._8_4_;
  auVar205._12_4_ = fVar219 * auVar144._12_4_;
  auVar27._16_4_ = fVar221 * auVar144._16_4_;
  auVar27._0_16_ = auVar205;
  auVar27._20_4_ = fVar223 * auVar144._20_4_;
  auVar27._24_4_ = fVar226 * auVar144._24_4_;
  auVar27._28_4_ = auVar24._28_4_ + auVar319._28_4_;
  lVar139 = (ulong)(byte)PVar18 * 0x10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar139 + 6);
  auVar207 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar139 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar11);
  lVar139 = lVar139 + uVar138 * -2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar139 + 6);
  auVar185 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar139 + 0xe);
  auVar192 = vpmovsxwd_avx(auVar13);
  auVar278._16_16_ = auVar192;
  auVar278._0_16_ = auVar185;
  auVar144 = vcvtdq2ps_avx(auVar278);
  auVar144 = vsubps_avx(auVar144,auVar169);
  auVar274._0_4_ = fVar251 * auVar144._0_4_;
  auVar274._4_4_ = fVar262 * auVar144._4_4_;
  auVar274._8_4_ = fVar264 * auVar144._8_4_;
  auVar274._12_4_ = fVar267 * auVar144._12_4_;
  auVar24._16_4_ = fVar270 * auVar144._16_4_;
  auVar24._0_16_ = auVar274;
  auVar24._20_4_ = fVar271 * auVar144._20_4_;
  auVar24._24_4_ = fVar272 * auVar144._24_4_;
  auVar24._28_4_ = auVar144._28_4_;
  auVar291._16_16_ = auVar195;
  auVar291._0_16_ = auVar207;
  auVar144 = vcvtdq2ps_avx(auVar291);
  auVar144 = vsubps_avx(auVar144,auVar169);
  auVar166._0_4_ = fVar251 * auVar144._0_4_;
  auVar166._4_4_ = fVar262 * auVar144._4_4_;
  auVar166._8_4_ = fVar264 * auVar144._8_4_;
  auVar166._12_4_ = fVar267 * auVar144._12_4_;
  auVar306._16_4_ = fVar270 * auVar144._16_4_;
  auVar306._0_16_ = auVar166;
  auVar306._20_4_ = fVar271 * auVar144._20_4_;
  auVar306._24_4_ = fVar272 * auVar144._24_4_;
  auVar306._28_4_ = auVar144._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar137 + uVar138 + 6);
  auVar207 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar137 + uVar138 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar15);
  auVar256._16_16_ = auVar195;
  auVar256._0_16_ = auVar207;
  auVar144 = vcvtdq2ps_avx(auVar256);
  auVar144 = vsubps_avx(auVar144,auVar200);
  auVar254._0_4_ = fVar229 * auVar144._0_4_;
  auVar254._4_4_ = fVar241 * auVar144._4_4_;
  auVar254._8_4_ = fVar243 * auVar144._8_4_;
  auVar254._12_4_ = fVar245 * auVar144._12_4_;
  auVar28._16_4_ = fVar247 * auVar144._16_4_;
  auVar28._0_16_ = auVar254;
  auVar28._20_4_ = fVar248 * auVar144._20_4_;
  auVar28._24_4_ = fVar249 * auVar144._24_4_;
  auVar28._28_4_ = auVar144._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar138 * 0x17 + 6);
  auVar207 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar138 * 0x17 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar17);
  auVar292._16_16_ = auVar195;
  auVar292._0_16_ = auVar207;
  auVar144 = vcvtdq2ps_avx(auVar292);
  auVar144 = vsubps_avx(auVar144,auVar200);
  auVar190._0_4_ = fVar229 * auVar144._0_4_;
  auVar190._4_4_ = fVar241 * auVar144._4_4_;
  auVar190._8_4_ = fVar243 * auVar144._8_4_;
  auVar190._12_4_ = fVar245 * auVar144._12_4_;
  auVar29._16_4_ = fVar247 * auVar144._16_4_;
  auVar29._0_16_ = auVar190;
  auVar29._20_4_ = fVar248 * auVar144._20_4_;
  auVar29._24_4_ = fVar249 * auVar144._24_4_;
  auVar29._28_4_ = auVar144._28_4_;
  auVar207 = vpminsd_avx(auVar23._16_16_,auVar27._16_16_);
  auVar195 = vpminsd_avx(auVar142,auVar205);
  auVar304._16_16_ = auVar207;
  auVar304._0_16_ = auVar195;
  auVar185 = auVar306._16_16_;
  auVar323 = ZEXT1664(auVar185);
  auVar207 = vpminsd_avx(auVar24._16_16_,auVar185);
  auVar195 = vpminsd_avx(auVar274,auVar166);
  auVar335._16_16_ = auVar207;
  auVar335._0_16_ = auVar195;
  auVar144 = vmaxps_avx(auVar304,auVar335);
  auVar207 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar195 = vpminsd_avx(auVar254,auVar190);
  auVar345._16_16_ = auVar207;
  auVar345._0_16_ = auVar195;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar353._4_4_ = uVar8;
  auVar353._0_4_ = uVar8;
  auVar353._8_4_ = uVar8;
  auVar353._12_4_ = uVar8;
  auVar353._16_4_ = uVar8;
  auVar353._20_4_ = uVar8;
  auVar353._24_4_ = uVar8;
  auVar353._28_4_ = uVar8;
  auVar306 = vmaxps_avx(auVar345,auVar353);
  auVar144 = vmaxps_avx(auVar144,auVar306);
  local_80._4_4_ = auVar144._4_4_ * 0.99999964;
  local_80._0_4_ = auVar144._0_4_ * 0.99999964;
  local_80._8_4_ = auVar144._8_4_ * 0.99999964;
  local_80._12_4_ = auVar144._12_4_ * 0.99999964;
  local_80._16_4_ = auVar144._16_4_ * 0.99999964;
  local_80._20_4_ = auVar144._20_4_ * 0.99999964;
  local_80._24_4_ = auVar144._24_4_ * 0.99999964;
  local_80._28_4_ = auVar144._28_4_;
  auVar309 = ZEXT3264(local_80);
  auVar207 = vpmaxsd_avx(auVar23._16_16_,auVar27._16_16_);
  auVar195 = vpmaxsd_avx(auVar142,auVar205);
  auVar146._16_16_ = auVar207;
  auVar146._0_16_ = auVar195;
  auVar207 = vpmaxsd_avx(auVar24._16_16_,auVar185);
  auVar195 = vpmaxsd_avx(auVar274,auVar166);
  auVar170._16_16_ = auVar207;
  auVar170._0_16_ = auVar195;
  auVar144 = vminps_avx(auVar146,auVar170);
  auVar207 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar195 = vpmaxsd_avx(auVar254,auVar190);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar210._4_4_ = uVar8;
  auVar210._0_4_ = uVar8;
  auVar210._8_4_ = uVar8;
  auVar210._12_4_ = uVar8;
  auVar210._16_4_ = uVar8;
  auVar210._20_4_ = uVar8;
  auVar210._24_4_ = uVar8;
  auVar210._28_4_ = uVar8;
  auVar171._16_16_ = auVar207;
  auVar171._0_16_ = auVar195;
  auVar306 = vminps_avx(auVar171,auVar210);
  auVar144 = vminps_avx(auVar144,auVar306);
  auVar30._4_4_ = auVar144._4_4_ * 1.0000004;
  auVar30._0_4_ = auVar144._0_4_ * 1.0000004;
  auVar30._8_4_ = auVar144._8_4_ * 1.0000004;
  auVar30._12_4_ = auVar144._12_4_ * 1.0000004;
  auVar30._16_4_ = auVar144._16_4_ * 1.0000004;
  auVar30._20_4_ = auVar144._20_4_ * 1.0000004;
  auVar30._24_4_ = auVar144._24_4_ * 1.0000004;
  auVar30._28_4_ = auVar144._28_4_;
  auVar144 = vcmpps_avx(local_80,auVar30,2);
  auVar207 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar172._16_16_ = auVar207;
  auVar172._0_16_ = auVar207;
  auVar306 = vcvtdq2ps_avx(auVar172);
  auVar306 = vcmpps_avx(_DAT_01faff40,auVar306,1);
  auVar144 = vandps_avx(auVar144,auVar306);
  uVar136 = vmovmskps_avx(auVar144);
  if (uVar136 == 0) {
    bVar135 = 0;
  }
  else {
    uVar136 = uVar136 & 0xff;
    local_580 = mm_lookupmask_ps._16_8_;
    uStack_578 = mm_lookupmask_ps._24_8_;
    uStack_570 = mm_lookupmask_ps._16_8_;
    uStack_568 = mm_lookupmask_ps._24_8_;
    local_6b8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar138 = (ulong)uVar136;
      auVar306 = auVar323._0_32_;
      auVar144 = auVar309._0_32_;
      lVar139 = 0;
      if (uVar138 != 0) {
        for (; (uVar136 >> lVar139 & 1) == 0; lVar139 = lVar139 + 1) {
        }
      }
      uVar138 = uVar138 - 1 & uVar138;
      uVar136 = *(uint *)(prim + lVar139 * 4 + 6);
      local_5f0._0_4_ = uVar136;
      lVar139 = lVar139 * 0x40;
      lVar140 = 0;
      if (uVar138 != 0) {
        for (; (uVar138 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
        }
      }
      uVar19 = *(uint *)(prim + 2);
      local_768 = (ulong)uVar19;
      pGVar21 = (context->scene->geometries).items[local_768].ptr;
      auVar207 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x16);
      if (((uVar138 != 0) && (uVar137 = uVar138 - 1 & uVar138, uVar137 != 0)) &&
         (lVar140 = 0, uVar137 != 0)) {
        for (; (uVar137 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
        }
      }
      _local_6d0 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x26);
      _local_5d0 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x36);
      _local_5e0 = *(undefined1 (*) [16])(prim + lVar139 + lVar114 + 0x46);
      uVar20 = (uint)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar10 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar192 = vsubps_avx(auVar207,auVar10);
      auVar195 = vshufps_avx(auVar192,auVar192,0);
      auVar185 = vshufps_avx(auVar192,auVar192,0x55);
      auVar192 = vshufps_avx(auVar192,auVar192,0xaa);
      fVar204 = pre->ray_space[k].vx.field_0.m128[0];
      fVar217 = pre->ray_space[k].vx.field_0.m128[1];
      fVar218 = pre->ray_space[k].vx.field_0.m128[2];
      fVar219 = pre->ray_space[k].vx.field_0.m128[3];
      fVar221 = pre->ray_space[k].vy.field_0.m128[0];
      fVar223 = pre->ray_space[k].vy.field_0.m128[1];
      fVar226 = pre->ray_space[k].vy.field_0.m128[2];
      fVar229 = pre->ray_space[k].vy.field_0.m128[3];
      fVar241 = pre->ray_space[k].vz.field_0.m128[0];
      fVar243 = pre->ray_space[k].vz.field_0.m128[1];
      fVar245 = pre->ray_space[k].vz.field_0.m128[2];
      fVar247 = pre->ray_space[k].vz.field_0.m128[3];
      auVar231._0_4_ =
           auVar195._0_4_ * fVar204 + auVar185._0_4_ * fVar221 + fVar241 * auVar192._0_4_;
      auVar231._4_4_ =
           auVar195._4_4_ * fVar217 + auVar185._4_4_ * fVar223 + fVar243 * auVar192._4_4_;
      auVar231._8_4_ =
           auVar195._8_4_ * fVar218 + auVar185._8_4_ * fVar226 + fVar245 * auVar192._8_4_;
      auVar231._12_4_ =
           auVar195._12_4_ * fVar219 + auVar185._12_4_ * fVar229 + fVar247 * auVar192._12_4_;
      auVar195 = vblendps_avx(auVar231,auVar207,8);
      auVar11 = vsubps_avx(_local_6d0,auVar10);
      auVar185 = vshufps_avx(auVar11,auVar11,0);
      auVar192 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar232._0_8_ =
           CONCAT44(auVar185._4_4_ * fVar217 + auVar192._4_4_ * fVar223 + fVar243 * auVar11._4_4_,
                    auVar185._0_4_ * fVar204 + auVar192._0_4_ * fVar221 + fVar241 * auVar11._0_4_);
      auVar232._8_4_ = auVar185._8_4_ * fVar218 + auVar192._8_4_ * fVar226 + fVar245 * auVar11._8_4_
      ;
      auVar232._12_4_ =
           auVar185._12_4_ * fVar219 + auVar192._12_4_ * fVar229 + fVar247 * auVar11._12_4_;
      auVar185 = vblendps_avx(auVar232,_local_6d0,8);
      auVar12 = vsubps_avx(_local_5d0,auVar10);
      auVar192 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar233._0_4_ = auVar192._0_4_ * fVar204 + auVar11._0_4_ * fVar221 + fVar241 * auVar12._0_4_;
      auVar233._4_4_ = auVar192._4_4_ * fVar217 + auVar11._4_4_ * fVar223 + fVar243 * auVar12._4_4_;
      auVar233._8_4_ = auVar192._8_4_ * fVar218 + auVar11._8_4_ * fVar226 + fVar245 * auVar12._8_4_;
      auVar233._12_4_ =
           auVar192._12_4_ * fVar219 + auVar11._12_4_ * fVar229 + fVar247 * auVar12._12_4_;
      auVar192 = vblendps_avx(auVar233,_local_5d0,8);
      auVar12 = vsubps_avx(_local_5e0,auVar10);
      auVar10 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar275._0_4_ = auVar10._0_4_ * fVar204 + auVar11._0_4_ * fVar221 + fVar241 * auVar12._0_4_;
      auVar275._4_4_ = auVar10._4_4_ * fVar217 + auVar11._4_4_ * fVar223 + fVar243 * auVar12._4_4_;
      auVar275._8_4_ = auVar10._8_4_ * fVar218 + auVar11._8_4_ * fVar226 + fVar245 * auVar12._8_4_;
      auVar275._12_4_ =
           auVar10._12_4_ * fVar219 + auVar11._12_4_ * fVar229 + fVar247 * auVar12._12_4_;
      auVar10 = vblendps_avx(auVar275,_local_5e0,8);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar195 = vandps_avx(auVar195,auVar206);
      auVar185 = vandps_avx(auVar185,auVar206);
      auVar11 = vmaxps_avx(auVar195,auVar185);
      auVar195 = vandps_avx(auVar192,auVar206);
      auVar185 = vandps_avx(auVar10,auVar206);
      auVar195 = vmaxps_avx(auVar195,auVar185);
      auVar195 = vmaxps_avx(auVar11,auVar195);
      auVar185 = vmovshdup_avx(auVar195);
      auVar185 = vmaxss_avx(auVar185,auVar195);
      auVar195 = vshufpd_avx(auVar195,auVar195,1);
      auVar195 = vmaxss_avx(auVar195,auVar185);
      lVar139 = (long)(int)uVar20 * 0x44;
      fVar229 = *(float *)(bezier_basis0 + lVar139 + 0x908);
      fVar241 = *(float *)(bezier_basis0 + lVar139 + 0x90c);
      fVar243 = *(float *)(bezier_basis0 + lVar139 + 0x910);
      fVar245 = *(float *)(bezier_basis0 + lVar139 + 0x914);
      fVar247 = *(float *)(bezier_basis0 + lVar139 + 0x918);
      fVar248 = *(float *)(bezier_basis0 + lVar139 + 0x91c);
      fVar249 = *(float *)(bezier_basis0 + lVar139 + 0x920);
      auVar185 = vshufps_avx(auVar233,auVar233,0);
      auVar173._16_16_ = auVar185;
      auVar173._0_16_ = auVar185;
      auVar192 = vshufps_avx(auVar233,auVar233,0x55);
      fVar204 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0xd8c);
      fVar217 = *(float *)(bezier_basis0 + lVar139 + 0xd90);
      fVar218 = *(float *)(bezier_basis0 + lVar139 + 0xd94);
      fVar219 = *(float *)(bezier_basis0 + lVar139 + 0xd98);
      fVar221 = *(float *)(bezier_basis0 + lVar139 + 0xd9c);
      fVar223 = *(float *)(bezier_basis0 + lVar139 + 0xda0);
      fVar226 = *(float *)(bezier_basis0 + lVar139 + 0xda4);
      auVar125 = *(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0xd8c);
      auVar10 = vshufps_avx(auVar275,auVar275,0);
      register0x000015d0 = auVar10;
      _local_4a0 = auVar10;
      auVar11 = vshufps_avx(auVar275,auVar275,0x55);
      fVar358 = auVar10._0_4_;
      fVar362 = auVar10._4_4_;
      fVar363 = auVar10._8_4_;
      fVar364 = auVar10._12_4_;
      fVar163 = auVar185._0_4_;
      fVar179 = auVar185._4_4_;
      fVar181 = auVar185._8_4_;
      fVar182 = auVar185._12_4_;
      fVar273 = auVar11._0_4_;
      fVar282 = auVar11._4_4_;
      fVar283 = auVar11._8_4_;
      fVar284 = auVar11._12_4_;
      fVar252 = auVar192._0_4_;
      fVar263 = auVar192._4_4_;
      fVar265 = auVar192._8_4_;
      fVar268 = auVar192._12_4_;
      auVar185 = vshufps_avx(_local_5d0,_local_5d0,0xff);
      register0x00001490 = auVar185;
      _local_160 = auVar185;
      auVar192 = vshufps_avx(_local_5e0,_local_5e0,0xff);
      register0x00001410 = auVar192;
      _local_180 = auVar192;
      fVar230 = auVar192._0_4_;
      fVar242 = auVar192._4_4_;
      fVar244 = auVar192._8_4_;
      fVar246 = auVar192._12_4_;
      fVar301 = auVar185._0_4_;
      fVar302 = auVar185._4_4_;
      fVar315 = auVar185._8_4_;
      auVar115._8_4_ = auVar232._8_4_;
      auVar115._0_8_ = auVar232._0_8_;
      auVar115._12_4_ = auVar232._12_4_;
      auVar192 = vshufps_avx(auVar115,auVar115,0);
      register0x00001550 = auVar192;
      _local_380 = auVar192;
      fVar251 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0x484);
      fVar262 = *(float *)(bezier_basis0 + lVar139 + 0x488);
      fVar264 = *(float *)(bezier_basis0 + lVar139 + 0x48c);
      fVar267 = *(float *)(bezier_basis0 + lVar139 + 0x490);
      fVar270 = *(float *)(bezier_basis0 + lVar139 + 0x494);
      fVar271 = *(float *)(bezier_basis0 + lVar139 + 0x498);
      fVar272 = *(float *)(bezier_basis0 + lVar139 + 0x49c);
      auVar126 = *(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0x484);
      fVar328 = auVar192._0_4_;
      fVar329 = auVar192._4_4_;
      fVar348 = auVar192._8_4_;
      fVar350 = auVar192._12_4_;
      auVar192 = vshufps_avx(auVar115,auVar115,0x55);
      register0x00001350 = auVar192;
      _local_120 = auVar192;
      fVar189 = auVar192._0_4_;
      fVar286 = auVar192._4_4_;
      fVar266 = auVar192._8_4_;
      fVar269 = auVar192._12_4_;
      auVar192 = vpermilps_avx(_local_6d0,0xff);
      register0x00001590 = auVar192;
      _local_a0 = auVar192;
      fVar349 = auVar192._0_4_;
      fVar351 = auVar192._4_4_;
      fVar352 = auVar192._8_4_;
      fVar355 = auVar192._12_4_;
      auVar192 = vshufps_avx(auVar231,auVar231,0);
      register0x00001310 = auVar192;
      _local_360 = auVar192;
      fVar310 = *(float *)(bezier_basis0 + lVar139);
      fVar311 = *(float *)(bezier_basis0 + lVar139 + 4);
      fVar225 = *(float *)(bezier_basis0 + lVar139 + 8);
      fVar313 = *(float *)(bezier_basis0 + lVar139 + 0xc);
      fVar312 = *(float *)(bezier_basis0 + lVar139 + 0x10);
      fVar314 = *(float *)(bezier_basis0 + lVar139 + 0x14);
      fVar228 = *(float *)(bezier_basis0 + lVar139 + 0x18);
      fVar183 = auVar192._0_4_;
      fVar184 = auVar192._4_4_;
      fVar186 = auVar192._8_4_;
      fVar187 = auVar192._12_4_;
      auVar336._0_4_ = fVar183 * fVar310 + fVar328 * fVar251 + fVar163 * fVar229 + fVar358 * fVar204
      ;
      auVar336._4_4_ = fVar184 * fVar311 + fVar329 * fVar262 + fVar179 * fVar241 + fVar362 * fVar217
      ;
      auVar336._8_4_ = fVar186 * fVar225 + fVar348 * fVar264 + fVar181 * fVar243 + fVar363 * fVar218
      ;
      auVar336._12_4_ =
           fVar187 * fVar313 + fVar350 * fVar267 + fVar182 * fVar245 + fVar364 * fVar219;
      auVar336._16_4_ =
           fVar183 * fVar312 + fVar328 * fVar270 + fVar163 * fVar247 + fVar358 * fVar221;
      auVar336._20_4_ =
           fVar184 * fVar314 + fVar329 * fVar271 + fVar179 * fVar248 + fVar362 * fVar223;
      auVar336._24_4_ =
           fVar186 * fVar228 + fVar348 * fVar272 + fVar181 * fVar249 + fVar363 * fVar226;
      auVar336._28_4_ = fVar182 + 0.0 + 0.0 + 0.0;
      auVar192 = vshufps_avx(auVar231,auVar231,0x55);
      register0x00001510 = auVar192;
      _local_140 = auVar192;
      fVar324 = auVar192._0_4_;
      fVar325 = auVar192._4_4_;
      fVar326 = auVar192._8_4_;
      fVar327 = auVar192._12_4_;
      auVar279._0_4_ = fVar324 * fVar310 + fVar189 * fVar251 + fVar252 * fVar229 + fVar273 * fVar204
      ;
      auVar279._4_4_ = fVar325 * fVar311 + fVar286 * fVar262 + fVar263 * fVar241 + fVar282 * fVar217
      ;
      auVar279._8_4_ = fVar326 * fVar225 + fVar266 * fVar264 + fVar265 * fVar243 + fVar283 * fVar218
      ;
      auVar279._12_4_ =
           fVar327 * fVar313 + fVar269 * fVar267 + fVar268 * fVar245 + fVar284 * fVar219;
      auVar279._16_4_ =
           fVar324 * fVar312 + fVar189 * fVar270 + fVar252 * fVar247 + fVar273 * fVar221;
      auVar279._20_4_ =
           fVar325 * fVar314 + fVar286 * fVar271 + fVar263 * fVar248 + fVar282 * fVar223;
      auVar279._24_4_ =
           fVar326 * fVar228 + fVar266 * fVar272 + fVar265 * fVar249 + fVar283 * fVar226;
      auVar279._28_4_ = fVar182 + 0.0 + 0.0 + 0.0;
      auVar192 = vpermilps_avx(auVar207,0xff);
      register0x00001450 = auVar192;
      _local_1a0 = auVar192;
      fVar298 = auVar192._0_4_;
      fVar299 = auVar192._4_4_;
      fVar300 = auVar192._8_4_;
      fVar141 = fVar298 * fVar310 + fVar349 * fVar251 + fVar301 * fVar229 + fVar230 * fVar204;
      fStack_75c = fVar299 * fVar311 + fVar351 * fVar262 + fVar302 * fVar241 + fVar242 * fVar217;
      fStack_758 = fVar300 * fVar225 + fVar352 * fVar264 + fVar315 * fVar243 + fVar244 * fVar218;
      fStack_754 = auVar192._12_4_ * fVar313 +
                   fVar355 * fVar267 + auVar185._12_4_ * fVar245 + fVar246 * fVar219;
      fStack_750 = fVar298 * fVar312 + fVar349 * fVar270 + fVar301 * fVar247 + fVar230 * fVar221;
      fStack_74c = fVar299 * fVar314 + fVar351 * fVar271 + fVar302 * fVar248 + fVar242 * fVar223;
      fStack_748 = fVar300 * fVar228 + fVar352 * fVar272 + fVar315 * fVar249 + fVar244 * fVar226;
      fStack_744 = *(float *)(bezier_basis0 + lVar139 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar251 = *(float *)(bezier_basis1 + lVar139 + 0x908);
      fVar262 = *(float *)(bezier_basis1 + lVar139 + 0x90c);
      fVar264 = *(float *)(bezier_basis1 + lVar139 + 0x910);
      fVar267 = *(float *)(bezier_basis1 + lVar139 + 0x914);
      fVar270 = *(float *)(bezier_basis1 + lVar139 + 0x918);
      fVar271 = *(float *)(bezier_basis1 + lVar139 + 0x91c);
      fVar272 = *(float *)(bezier_basis1 + lVar139 + 0x920);
      fVar188 = *(float *)(bezier_basis1 + lVar139 + 0xd8c);
      fVar203 = *(float *)(bezier_basis1 + lVar139 + 0xd90);
      fVar155 = *(float *)(bezier_basis1 + lVar139 + 0xd94);
      fVar156 = *(float *)(bezier_basis1 + lVar139 + 0xd98);
      fStack_510 = *(float *)(bezier_basis1 + lVar139 + 0xd9c);
      fStack_50c = *(float *)(bezier_basis1 + lVar139 + 0xda0);
      fStack_508 = *(float *)(bezier_basis1 + lVar139 + 0xda4);
      fStack_504 = *(float *)(bezier_basis1 + lVar139 + 0xda8);
      fVar157 = *(float *)(bezier_basis1 + lVar139 + 0x484);
      fVar158 = *(float *)(bezier_basis1 + lVar139 + 0x488);
      fVar159 = *(float *)(bezier_basis1 + lVar139 + 0x48c);
      fVar160 = *(float *)(bezier_basis1 + lVar139 + 0x490);
      fVar161 = *(float *)(bezier_basis1 + lVar139 + 0x494);
      fVar250 = *(float *)(bezier_basis1 + lVar139 + 0x498);
      fVar285 = *(float *)(bezier_basis1 + lVar139 + 0x49c);
      fVar204 = fVar350 + 0.0;
      fVar220 = *(float *)(bezier_basis1 + lVar139);
      fVar222 = *(float *)(bezier_basis1 + lVar139 + 4);
      fVar224 = *(float *)(bezier_basis1 + lVar139 + 8);
      fVar227 = *(float *)(bezier_basis1 + lVar139 + 0xc);
      fVar162 = *(float *)(bezier_basis1 + lVar139 + 0x10);
      fVar164 = *(float *)(bezier_basis1 + lVar139 + 0x14);
      fVar180 = *(float *)(bezier_basis1 + lVar139 + 0x18);
      auVar235._0_4_ = fVar220 * fVar183 + fVar328 * fVar157 + fVar251 * fVar163 + fVar358 * fVar188
      ;
      auVar235._4_4_ = fVar222 * fVar184 + fVar329 * fVar158 + fVar262 * fVar179 + fVar362 * fVar203
      ;
      auVar235._8_4_ = fVar224 * fVar186 + fVar348 * fVar159 + fVar264 * fVar181 + fVar363 * fVar155
      ;
      auVar235._12_4_ =
           fVar227 * fVar187 + fVar350 * fVar160 + fVar267 * fVar182 + fVar364 * fVar156;
      auVar235._16_4_ =
           fVar162 * fVar183 + fVar328 * fVar161 + fVar270 * fVar163 + fVar358 * fStack_510;
      auVar235._20_4_ =
           fVar164 * fVar184 + fVar329 * fVar250 + fVar271 * fVar179 + fVar362 * fStack_50c;
      auVar235._24_4_ =
           fVar180 * fVar186 + fVar348 * fVar285 + fVar272 * fVar181 + fVar363 * fStack_508;
      auVar235._28_4_ = fVar355 + fVar204;
      auVar211._0_4_ = fVar324 * fVar220 + fVar189 * fVar157 + fVar251 * fVar252 + fVar188 * fVar273
      ;
      auVar211._4_4_ = fVar325 * fVar222 + fVar286 * fVar158 + fVar262 * fVar263 + fVar203 * fVar282
      ;
      auVar211._8_4_ = fVar326 * fVar224 + fVar266 * fVar159 + fVar264 * fVar265 + fVar155 * fVar283
      ;
      auVar211._12_4_ =
           fVar327 * fVar227 + fVar269 * fVar160 + fVar267 * fVar268 + fVar156 * fVar284;
      auVar211._16_4_ =
           fVar324 * fVar162 + fVar189 * fVar161 + fVar270 * fVar252 + fStack_510 * fVar273;
      auVar211._20_4_ =
           fVar325 * fVar164 + fVar286 * fVar250 + fVar271 * fVar263 + fStack_50c * fVar282;
      auVar211._24_4_ =
           fVar326 * fVar180 + fVar266 * fVar285 + fVar272 * fVar265 + fStack_508 * fVar283;
      auVar211._28_4_ = fVar204 + fVar350 + 0.0;
      auVar359._0_4_ = fVar349 * fVar157 + fVar301 * fVar251 + fVar230 * fVar188 + fVar298 * fVar220
      ;
      auVar359._4_4_ = fVar351 * fVar158 + fVar302 * fVar262 + fVar242 * fVar203 + fVar299 * fVar222
      ;
      auVar359._8_4_ = fVar352 * fVar159 + fVar315 * fVar264 + fVar244 * fVar155 + fVar300 * fVar224
      ;
      auVar359._12_4_ =
           fVar355 * fVar160 + auVar185._12_4_ * fVar267 + fVar246 * fVar156 +
           auVar192._12_4_ * fVar227;
      auVar359._16_4_ =
           fVar349 * fVar161 + fVar301 * fVar270 + fVar230 * fStack_510 + fVar298 * fVar162;
      auVar359._20_4_ =
           fVar351 * fVar250 + fVar302 * fVar271 + fVar242 * fStack_50c + fVar299 * fVar164;
      auVar359._24_4_ =
           fVar352 * fVar285 + fVar315 * fVar272 + fVar244 * fStack_508 + fVar300 * fVar180;
      auVar359._28_4_ = fVar350 + fVar246 + 0.0 + fVar204;
      auVar319 = vsubps_avx(auVar235,auVar336);
      auVar25 = vsubps_avx(auVar211,auVar279);
      fVar230 = auVar319._0_4_;
      fVar242 = auVar319._4_4_;
      auVar31._4_4_ = fVar242 * auVar279._4_4_;
      auVar31._0_4_ = fVar230 * auVar279._0_4_;
      fVar244 = auVar319._8_4_;
      auVar31._8_4_ = fVar244 * auVar279._8_4_;
      fVar246 = auVar319._12_4_;
      auVar31._12_4_ = fVar246 * auVar279._12_4_;
      fVar298 = auVar319._16_4_;
      auVar31._16_4_ = fVar298 * auVar279._16_4_;
      fVar299 = auVar319._20_4_;
      auVar31._20_4_ = fVar299 * auVar279._20_4_;
      fVar300 = auVar319._24_4_;
      auVar31._24_4_ = fVar300 * auVar279._24_4_;
      auVar31._28_4_ = fVar204;
      fVar204 = auVar25._0_4_;
      fVar217 = auVar25._4_4_;
      auVar32._4_4_ = auVar336._4_4_ * fVar217;
      auVar32._0_4_ = auVar336._0_4_ * fVar204;
      fVar218 = auVar25._8_4_;
      auVar32._8_4_ = auVar336._8_4_ * fVar218;
      fVar219 = auVar25._12_4_;
      auVar32._12_4_ = auVar336._12_4_ * fVar219;
      fVar221 = auVar25._16_4_;
      auVar32._16_4_ = auVar336._16_4_ * fVar221;
      fVar223 = auVar25._20_4_;
      auVar32._20_4_ = auVar336._20_4_ * fVar223;
      fVar226 = auVar25._24_4_;
      auVar32._24_4_ = auVar336._24_4_ * fVar226;
      auVar32._28_4_ = auVar211._28_4_;
      auVar24 = vsubps_avx(auVar31,auVar32);
      auVar118._4_4_ = fStack_75c;
      auVar118._0_4_ = fVar141;
      auVar118._8_4_ = fStack_758;
      auVar118._12_4_ = fStack_754;
      auVar118._16_4_ = fStack_750;
      auVar118._20_4_ = fStack_74c;
      auVar118._24_4_ = fStack_748;
      auVar118._28_4_ = fStack_744;
      auVar23 = vmaxps_avx(auVar118,auVar359);
      auVar33._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar242 * fVar242 + fVar217 * fVar217);
      auVar33._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar230 * fVar230 + fVar204 * fVar204);
      auVar33._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar244 * fVar244 + fVar218 * fVar218);
      auVar33._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar246 * fVar246 + fVar219 * fVar219);
      auVar33._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar298 * fVar298 + fVar221 * fVar221);
      auVar33._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar299 * fVar299 + fVar223 * fVar223);
      auVar33._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar300 * fVar300 + fVar226 * fVar226);
      auVar33._28_4_ = auVar25._28_4_ + auVar211._28_4_;
      auVar34._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar34._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar34._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar34._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar34._16_4_ = auVar24._16_4_ * auVar24._16_4_;
      auVar34._20_4_ = auVar24._20_4_ * auVar24._20_4_;
      auVar34._24_4_ = auVar24._24_4_ * auVar24._24_4_;
      auVar34._28_4_ = auVar24._28_4_;
      auVar23 = vcmpps_avx(auVar34,auVar33,2);
      auVar185 = ZEXT416((uint)(float)(int)uVar20);
      local_4c0._0_16_ = auVar185;
      auVar185 = vshufps_avx(auVar185,auVar185,0);
      auVar212._16_16_ = auVar185;
      auVar212._0_16_ = auVar185;
      auVar24 = vcmpps_avx(_DAT_01faff40,auVar212,1);
      auVar216 = ZEXT3264(auVar24);
      auVar185 = vpermilps_avx(auVar231,0xaa);
      register0x00001450 = auVar185;
      _local_540 = auVar185;
      auVar116._8_4_ = auVar232._8_4_;
      auVar116._0_8_ = auVar232._0_8_;
      auVar116._12_4_ = auVar232._12_4_;
      auVar192 = vpermilps_avx(auVar116,0xaa);
      register0x00001550 = auVar192;
      _local_c0 = auVar192;
      auVar10 = vpermilps_avx(auVar233,0xaa);
      register0x00001590 = auVar10;
      _local_e0 = auVar10;
      auVar11 = vpermilps_avx(auVar275,0xaa);
      register0x00001310 = auVar11;
      _local_720 = auVar11;
      auVar26 = auVar24 & auVar23;
      uVar9 = *(uint *)(ray + k * 4 + 0x30);
      auVar195 = ZEXT416((uint)(auVar195._0_4_ * 4.7683716e-07));
      _local_700 = auVar195;
      local_870 = auVar207._0_4_;
      fStack_86c = auVar207._4_4_;
      fStack_868 = auVar207._8_4_;
      fStack_864 = auVar207._12_4_;
      local_2b0 = auVar207._0_8_;
      uVar130 = local_2b0;
      uStack_2a8 = auVar207._8_8_;
      uVar131 = uStack_2a8;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      {
        auVar309 = ZEXT3264(auVar144);
        auVar323 = ZEXT3264(auVar306);
LAB_00ffabec:
        auVar240 = ZEXT3264(_local_720);
        pRVar133 = (RTCIntersectArguments *)0x0;
      }
      else {
        local_560._0_8_ = pGVar21;
        local_3a0 = vandps_avx(auVar23,auVar24);
        fVar298 = auVar185._0_4_;
        fVar299 = auVar185._4_4_;
        fVar300 = auVar185._8_4_;
        fVar301 = auVar185._12_4_;
        fVar302 = auVar192._0_4_;
        fVar315 = auVar192._4_4_;
        fVar349 = auVar192._8_4_;
        fVar351 = auVar192._12_4_;
        fVar352 = auVar10._0_4_;
        fVar355 = auVar10._4_4_;
        fVar356 = auVar10._8_4_;
        fVar357 = auVar10._12_4_;
        fVar230 = auVar11._0_4_;
        fVar242 = auVar11._4_4_;
        fVar244 = auVar11._8_4_;
        fVar246 = auVar11._12_4_;
        local_520 = fVar298 * fVar220 + fVar302 * fVar157 + fVar352 * fVar251 + fVar230 * fVar188;
        fStack_51c = fVar299 * fVar222 + fVar315 * fVar158 + fVar355 * fVar262 + fVar242 * fVar203;
        fStack_518 = fVar300 * fVar224 + fVar349 * fVar159 + fVar356 * fVar264 + fVar244 * fVar155;
        fStack_514 = fVar301 * fVar227 + fVar351 * fVar160 + fVar357 * fVar267 + fVar246 * fVar156;
        fStack_510 = fVar298 * fVar162 +
                     fVar302 * fVar161 + fVar352 * fVar270 + fVar230 * fStack_510;
        fStack_50c = fVar299 * fVar164 +
                     fVar315 * fVar250 + fVar355 * fVar271 + fVar242 * fStack_50c;
        fStack_508 = fVar300 * fVar180 +
                     fVar349 * fVar285 + fVar356 * fVar272 + fVar244 * fStack_508;
        fStack_504 = local_3a0._28_4_ +
                     auVar24._28_4_ + *(float *)(bezier_basis1 + lVar139 + 0x924) + 0.0;
        local_5a0._0_4_ = auVar126._0_4_;
        local_5a0._4_4_ = auVar126._4_4_;
        fStack_598 = auVar126._8_4_;
        fStack_594 = auVar126._12_4_;
        fStack_590 = auVar126._16_4_;
        fStack_58c = auVar126._20_4_;
        fStack_588 = auVar126._24_4_;
        local_680._0_4_ = auVar125._0_4_;
        local_680._4_4_ = auVar125._4_4_;
        fStack_678 = auVar125._8_4_;
        fStack_674 = auVar125._12_4_;
        fStack_670 = auVar125._16_4_;
        fStack_66c = auVar125._20_4_;
        fStack_668 = auVar125._24_4_;
        local_660 = fVar298 * fVar310 +
                    fVar302 * (float)local_5a0._0_4_ +
                    fVar352 * fVar229 + fVar230 * (float)local_680._0_4_;
        fStack_65c = fVar299 * fVar311 +
                     fVar315 * (float)local_5a0._4_4_ +
                     fVar355 * fVar241 + fVar242 * (float)local_680._4_4_;
        fStack_658 = fVar300 * fVar225 +
                     fVar349 * fStack_598 + fVar356 * fVar243 + fVar244 * fStack_678;
        fStack_654 = fVar301 * fVar313 +
                     fVar351 * fStack_594 + fVar357 * fVar245 + fVar246 * fStack_674;
        fStack_650 = fVar298 * fVar312 +
                     fVar302 * fStack_590 + fVar352 * fVar247 + fVar230 * fStack_670;
        fStack_64c = fVar299 * fVar314 +
                     fVar315 * fStack_58c + fVar355 * fVar248 + fVar242 * fStack_66c;
        fStack_648 = fVar300 * fVar228 +
                     fVar349 * fStack_588 + fVar356 * fVar249 + fVar244 * fStack_668;
        fStack_644 = fVar327 + fStack_504 + local_3a0._28_4_ + auVar24._28_4_;
        fVar204 = *(float *)(bezier_basis0 + lVar139 + 0x1210);
        fVar217 = *(float *)(bezier_basis0 + lVar139 + 0x1214);
        fVar218 = *(float *)(bezier_basis0 + lVar139 + 0x1218);
        fVar219 = *(float *)(bezier_basis0 + lVar139 + 0x121c);
        fVar221 = *(float *)(bezier_basis0 + lVar139 + 0x1220);
        fVar223 = *(float *)(bezier_basis0 + lVar139 + 0x1224);
        fVar226 = *(float *)(bezier_basis0 + lVar139 + 0x1228);
        fVar229 = *(float *)(bezier_basis0 + lVar139 + 0x1694);
        fVar241 = *(float *)(bezier_basis0 + lVar139 + 0x1698);
        fVar243 = *(float *)(bezier_basis0 + lVar139 + 0x169c);
        fVar245 = *(float *)(bezier_basis0 + lVar139 + 0x16a0);
        fVar247 = *(float *)(bezier_basis0 + lVar139 + 0x16a4);
        fVar248 = *(float *)(bezier_basis0 + lVar139 + 0x16a8);
        fVar249 = *(float *)(bezier_basis0 + lVar139 + 0x16ac);
        fVar251 = *(float *)(bezier_basis0 + lVar139 + 0x1b18);
        fVar262 = *(float *)(bezier_basis0 + lVar139 + 0x1b1c);
        fVar264 = *(float *)(bezier_basis0 + lVar139 + 0x1b20);
        fVar267 = *(float *)(bezier_basis0 + lVar139 + 0x1b24);
        fVar270 = *(float *)(bezier_basis0 + lVar139 + 0x1b28);
        fVar271 = *(float *)(bezier_basis0 + lVar139 + 0x1b2c);
        fVar272 = *(float *)(bezier_basis0 + lVar139 + 0x1b30);
        fVar310 = *(float *)(bezier_basis0 + lVar139 + 0x1f9c);
        fVar311 = *(float *)(bezier_basis0 + lVar139 + 0x1fa0);
        fVar225 = *(float *)(bezier_basis0 + lVar139 + 0x1fa4);
        fVar313 = *(float *)(bezier_basis0 + lVar139 + 0x1fa8);
        fVar312 = *(float *)(bezier_basis0 + lVar139 + 0x1fac);
        fVar314 = *(float *)(bezier_basis0 + lVar139 + 0x1fb0);
        fVar228 = *(float *)(bezier_basis0 + lVar139 + 0x1fb4);
        fVar188 = *(float *)(bezier_basis0 + lVar139 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar139 + 0x1fb8);
        fVar203 = *(float *)(bezier_basis0 + lVar139 + 0x16b0) + fVar188;
        local_5a0._4_4_ =
             fVar184 * fVar217 + fVar329 * fVar241 + fVar179 * fVar262 + fVar362 * fVar311;
        local_5a0._0_4_ =
             fVar183 * fVar204 + fVar328 * fVar229 + fVar163 * fVar251 + fVar358 * fVar310;
        fStack_598 = fVar186 * fVar218 + fVar348 * fVar243 + fVar181 * fVar264 + fVar363 * fVar225;
        fStack_594 = fVar187 * fVar219 + fVar350 * fVar245 + fVar182 * fVar267 + fVar364 * fVar313;
        fStack_590 = fVar183 * fVar221 + fVar328 * fVar247 + fVar163 * fVar270 + fVar358 * fVar312;
        fStack_58c = fVar184 * fVar223 + fVar329 * fVar248 + fVar179 * fVar271 + fVar362 * fVar314;
        fStack_588 = fVar186 * fVar226 + fVar348 * fVar249 + fVar181 * fVar272 + fVar363 * fVar228;
        fStack_584 = *(float *)(bezier_basis0 + lVar139 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar139 + 0x1fb8) +
                     fVar301 + *(float *)(bezier_basis1 + lVar139 + 0x4a0);
        auVar293._0_4_ =
             fVar324 * fVar204 + fVar252 * fVar251 + fVar273 * fVar310 + fVar189 * fVar229;
        auVar293._4_4_ =
             fVar325 * fVar217 + fVar263 * fVar262 + fVar282 * fVar311 + fVar286 * fVar241;
        auVar293._8_4_ =
             fVar326 * fVar218 + fVar265 * fVar264 + fVar283 * fVar225 + fVar266 * fVar243;
        auVar293._12_4_ =
             fVar327 * fVar219 + fVar268 * fVar267 + fVar284 * fVar313 + fVar269 * fVar245;
        auVar293._16_4_ =
             fVar324 * fVar221 + fVar252 * fVar270 + fVar273 * fVar312 + fVar189 * fVar247;
        auVar293._20_4_ =
             fVar325 * fVar223 + fVar263 * fVar271 + fVar282 * fVar314 + fVar286 * fVar248;
        auVar293._24_4_ =
             fVar326 * fVar226 + fVar265 * fVar272 + fVar283 * fVar228 + fVar266 * fVar249;
        auVar293._28_4_ =
             fVar188 + fVar301 + *(float *)(bezier_basis1 + lVar139 + 0x1c) +
                       fVar301 + *(float *)(bezier_basis1 + lVar139 + 0x4a0);
        local_5c0 = fVar302 * fVar229 + fVar352 * fVar251 + fVar230 * fVar310 + fVar298 * fVar204;
        fStack_5bc = fVar315 * fVar241 + fVar355 * fVar262 + fVar242 * fVar311 + fVar299 * fVar217;
        fStack_5b8 = fVar349 * fVar243 + fVar356 * fVar264 + fVar244 * fVar225 + fVar300 * fVar218;
        fStack_5b4 = fVar351 * fVar245 + fVar357 * fVar267 + fVar246 * fVar313 + fVar301 * fVar219;
        fStack_5b0 = fVar302 * fVar247 + fVar352 * fVar270 + fVar230 * fVar312 + fVar298 * fVar221;
        fStack_5ac = fVar315 * fVar248 + fVar355 * fVar271 + fVar242 * fVar314 + fVar299 * fVar223;
        fStack_5a8 = fVar349 * fVar249 + fVar356 * fVar272 + fVar244 * fVar228 + fVar300 * fVar226;
        fStack_5a4 = fVar203 + *(float *)(bezier_basis0 + lVar139 + 0x122c);
        fVar204 = *(float *)(bezier_basis1 + lVar139 + 0x1b18);
        fVar217 = *(float *)(bezier_basis1 + lVar139 + 0x1b1c);
        fVar218 = *(float *)(bezier_basis1 + lVar139 + 0x1b20);
        fVar219 = *(float *)(bezier_basis1 + lVar139 + 0x1b24);
        fVar221 = *(float *)(bezier_basis1 + lVar139 + 0x1b28);
        fVar223 = *(float *)(bezier_basis1 + lVar139 + 0x1b2c);
        fVar226 = *(float *)(bezier_basis1 + lVar139 + 0x1b30);
        fVar229 = *(float *)(bezier_basis1 + lVar139 + 0x1f9c);
        fVar241 = *(float *)(bezier_basis1 + lVar139 + 0x1fa0);
        fVar243 = *(float *)(bezier_basis1 + lVar139 + 0x1fa4);
        fVar245 = *(float *)(bezier_basis1 + lVar139 + 0x1fa8);
        fVar247 = *(float *)(bezier_basis1 + lVar139 + 0x1fac);
        fVar248 = *(float *)(bezier_basis1 + lVar139 + 0x1fb0);
        fVar249 = *(float *)(bezier_basis1 + lVar139 + 0x1fb4);
        fVar251 = *(float *)(bezier_basis1 + lVar139 + 0x1694);
        fVar262 = *(float *)(bezier_basis1 + lVar139 + 0x1698);
        fVar264 = *(float *)(bezier_basis1 + lVar139 + 0x169c);
        fVar267 = *(float *)(bezier_basis1 + lVar139 + 0x16a0);
        fVar270 = *(float *)(bezier_basis1 + lVar139 + 0x16a4);
        fVar271 = *(float *)(bezier_basis1 + lVar139 + 0x16a8);
        fVar272 = *(float *)(bezier_basis1 + lVar139 + 0x16ac);
        fVar310 = *(float *)(bezier_basis1 + lVar139 + 0x1210);
        fVar311 = *(float *)(bezier_basis1 + lVar139 + 0x1214);
        fVar225 = *(float *)(bezier_basis1 + lVar139 + 0x1218);
        fVar313 = *(float *)(bezier_basis1 + lVar139 + 0x121c);
        fVar312 = *(float *)(bezier_basis1 + lVar139 + 0x1220);
        fVar314 = *(float *)(bezier_basis1 + lVar139 + 0x1224);
        fVar228 = *(float *)(bezier_basis1 + lVar139 + 0x1228);
        auVar305._0_4_ =
             fVar183 * fVar310 + fVar328 * fVar251 + fVar163 * fVar204 + fVar358 * fVar229;
        auVar305._4_4_ =
             fVar184 * fVar311 + fVar329 * fVar262 + fVar179 * fVar217 + fVar362 * fVar241;
        auVar305._8_4_ =
             fVar186 * fVar225 + fVar348 * fVar264 + fVar181 * fVar218 + fVar363 * fVar243;
        auVar305._12_4_ =
             fVar187 * fVar313 + fVar350 * fVar267 + fVar182 * fVar219 + fVar364 * fVar245;
        auVar305._16_4_ =
             fVar183 * fVar312 + fVar328 * fVar270 + fVar163 * fVar221 + fVar358 * fVar247;
        auVar305._20_4_ =
             fVar184 * fVar314 + fVar329 * fVar271 + fVar179 * fVar223 + fVar362 * fVar248;
        auVar305._24_4_ =
             fVar186 * fVar228 + fVar348 * fVar272 + fVar181 * fVar226 + fVar363 * fVar249;
        auVar305._28_4_ = fVar182 + fVar182 + fVar301 + fVar203;
        auVar317._0_4_ =
             fVar324 * fVar310 + fVar189 * fVar251 + fVar252 * fVar204 + fVar273 * fVar229;
        auVar317._4_4_ =
             fVar325 * fVar311 + fVar286 * fVar262 + fVar263 * fVar217 + fVar282 * fVar241;
        auVar317._8_4_ =
             fVar326 * fVar225 + fVar266 * fVar264 + fVar265 * fVar218 + fVar283 * fVar243;
        auVar317._12_4_ =
             fVar327 * fVar313 + fVar269 * fVar267 + fVar268 * fVar219 + fVar284 * fVar245;
        auVar317._16_4_ =
             fVar324 * fVar312 + fVar189 * fVar270 + fVar252 * fVar221 + fVar273 * fVar247;
        auVar317._20_4_ =
             fVar325 * fVar314 + fVar286 * fVar271 + fVar263 * fVar223 + fVar282 * fVar248;
        auVar317._24_4_ =
             fVar326 * fVar228 + fVar266 * fVar272 + fVar265 * fVar226 + fVar283 * fVar249;
        auVar317._28_4_ = fVar182 + fVar182 + fVar182 + fVar301;
        auVar201._0_4_ =
             fVar298 * fVar310 + fVar302 * fVar251 + fVar352 * fVar204 + fVar229 * fVar230;
        auVar201._4_4_ =
             fVar299 * fVar311 + fVar315 * fVar262 + fVar355 * fVar217 + fVar241 * fVar242;
        auVar201._8_4_ =
             fVar300 * fVar225 + fVar349 * fVar264 + fVar356 * fVar218 + fVar243 * fVar244;
        auVar201._12_4_ =
             fVar301 * fVar313 + fVar351 * fVar267 + fVar357 * fVar219 + fVar245 * fVar246;
        auVar201._16_4_ =
             fVar298 * fVar312 + fVar302 * fVar270 + fVar352 * fVar221 + fVar247 * fVar230;
        auVar201._20_4_ =
             fVar299 * fVar314 + fVar315 * fVar271 + fVar355 * fVar223 + fVar248 * fVar242;
        auVar201._24_4_ =
             fVar300 * fVar228 + fVar349 * fVar272 + fVar356 * fVar226 + fVar249 * fVar244;
        auVar201._28_4_ =
             *(float *)(bezier_basis1 + lVar139 + 0x122c) +
             *(float *)(bezier_basis1 + lVar139 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar139 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar139 + 0x1fb8);
        auVar236._8_4_ = 0x7fffffff;
        auVar236._0_8_ = 0x7fffffff7fffffff;
        auVar236._12_4_ = 0x7fffffff;
        auVar236._16_4_ = 0x7fffffff;
        auVar236._20_4_ = 0x7fffffff;
        auVar236._24_4_ = 0x7fffffff;
        auVar236._28_4_ = 0x7fffffff;
        auVar23 = vandps_avx(_local_5a0,auVar236);
        auVar24 = vandps_avx(auVar293,auVar236);
        auVar24 = vmaxps_avx(auVar23,auVar24);
        auVar121._4_4_ = fStack_5bc;
        auVar121._0_4_ = local_5c0;
        auVar121._8_4_ = fStack_5b8;
        auVar121._12_4_ = fStack_5b4;
        auVar121._16_4_ = fStack_5b0;
        auVar121._20_4_ = fStack_5ac;
        auVar121._24_4_ = fStack_5a8;
        auVar121._28_4_ = fStack_5a4;
        auVar23 = vandps_avx(auVar236,auVar121);
        auVar23 = vmaxps_avx(auVar24,auVar23);
        auVar207 = vpermilps_avx(auVar195,0);
        auVar294._16_16_ = auVar207;
        auVar294._0_16_ = auVar207;
        auVar23 = vcmpps_avx(auVar23,auVar294,1);
        auVar26 = vblendvps_avx(_local_5a0,auVar319,auVar23);
        auVar27 = vblendvps_avx(auVar293,auVar25,auVar23);
        auVar23 = vandps_avx(auVar305,auVar236);
        auVar24 = vandps_avx(auVar317,auVar236);
        auVar28 = vmaxps_avx(auVar23,auVar24);
        auVar23 = vandps_avx(auVar201,auVar236);
        auVar23 = vmaxps_avx(auVar28,auVar23);
        auVar28 = vcmpps_avx(auVar23,auVar294,1);
        auVar23 = vblendvps_avx(auVar305,auVar319,auVar28);
        auVar319 = vblendvps_avx(auVar317,auVar25,auVar28);
        fVar203 = auVar26._0_4_;
        fVar155 = auVar26._4_4_;
        fVar156 = auVar26._8_4_;
        fVar157 = auVar26._12_4_;
        fVar158 = auVar26._16_4_;
        fVar159 = auVar26._20_4_;
        fVar160 = auVar26._24_4_;
        fVar161 = auVar23._0_4_;
        fVar250 = auVar23._4_4_;
        fVar285 = auVar23._8_4_;
        fVar220 = auVar23._12_4_;
        fVar222 = auVar23._16_4_;
        fVar224 = auVar23._20_4_;
        fVar227 = auVar23._24_4_;
        fVar162 = -auVar23._28_4_;
        fVar204 = auVar27._0_4_;
        fVar221 = auVar27._4_4_;
        fVar241 = auVar27._8_4_;
        fVar248 = auVar27._12_4_;
        fVar264 = auVar27._16_4_;
        fVar272 = auVar27._20_4_;
        fVar313 = auVar27._24_4_;
        auVar147._0_4_ = fVar204 * fVar204 + fVar203 * fVar203;
        auVar147._4_4_ = fVar221 * fVar221 + fVar155 * fVar155;
        auVar147._8_4_ = fVar241 * fVar241 + fVar156 * fVar156;
        auVar147._12_4_ = fVar248 * fVar248 + fVar157 * fVar157;
        auVar147._16_4_ = fVar264 * fVar264 + fVar158 * fVar158;
        auVar147._20_4_ = fVar272 * fVar272 + fVar159 * fVar159;
        auVar147._24_4_ = fVar313 * fVar313 + fVar160 * fVar160;
        auVar147._28_4_ = auVar317._28_4_ + auVar26._28_4_;
        auVar25 = vrsqrtps_avx(auVar147);
        fVar217 = auVar25._0_4_;
        fVar218 = auVar25._4_4_;
        auVar35._4_4_ = fVar218 * 1.5;
        auVar35._0_4_ = fVar217 * 1.5;
        fVar219 = auVar25._8_4_;
        auVar35._8_4_ = fVar219 * 1.5;
        fVar223 = auVar25._12_4_;
        auVar35._12_4_ = fVar223 * 1.5;
        fVar226 = auVar25._16_4_;
        auVar35._16_4_ = fVar226 * 1.5;
        fVar229 = auVar25._20_4_;
        auVar35._20_4_ = fVar229 * 1.5;
        fVar243 = auVar25._24_4_;
        fVar188 = auVar24._28_4_;
        auVar35._24_4_ = fVar243 * 1.5;
        auVar35._28_4_ = fVar188;
        auVar36._4_4_ = fVar218 * fVar218 * fVar218 * auVar147._4_4_ * 0.5;
        auVar36._0_4_ = fVar217 * fVar217 * fVar217 * auVar147._0_4_ * 0.5;
        auVar36._8_4_ = fVar219 * fVar219 * fVar219 * auVar147._8_4_ * 0.5;
        auVar36._12_4_ = fVar223 * fVar223 * fVar223 * auVar147._12_4_ * 0.5;
        auVar36._16_4_ = fVar226 * fVar226 * fVar226 * auVar147._16_4_ * 0.5;
        auVar36._20_4_ = fVar229 * fVar229 * fVar229 * auVar147._20_4_ * 0.5;
        auVar36._24_4_ = fVar243 * fVar243 * fVar243 * auVar147._24_4_ * 0.5;
        auVar36._28_4_ = auVar147._28_4_;
        auVar24 = vsubps_avx(auVar35,auVar36);
        fVar217 = auVar24._0_4_;
        fVar223 = auVar24._4_4_;
        fVar243 = auVar24._8_4_;
        fVar249 = auVar24._12_4_;
        fVar267 = auVar24._16_4_;
        fVar310 = auVar24._20_4_;
        fVar312 = auVar24._24_4_;
        fVar218 = auVar319._0_4_;
        fVar226 = auVar319._4_4_;
        fVar245 = auVar319._8_4_;
        fVar251 = auVar319._12_4_;
        fVar270 = auVar319._16_4_;
        fVar311 = auVar319._20_4_;
        fVar314 = auVar319._24_4_;
        auVar148._0_4_ = fVar218 * fVar218 + fVar161 * fVar161;
        auVar148._4_4_ = fVar226 * fVar226 + fVar250 * fVar250;
        auVar148._8_4_ = fVar245 * fVar245 + fVar285 * fVar285;
        auVar148._12_4_ = fVar251 * fVar251 + fVar220 * fVar220;
        auVar148._16_4_ = fVar270 * fVar270 + fVar222 * fVar222;
        auVar148._20_4_ = fVar311 * fVar311 + fVar224 * fVar224;
        auVar148._24_4_ = fVar314 * fVar314 + fVar227 * fVar227;
        auVar148._28_4_ = auVar23._28_4_ + auVar24._28_4_;
        auVar23 = vrsqrtps_avx(auVar148);
        fVar219 = auVar23._0_4_;
        fVar229 = auVar23._4_4_;
        auVar37._4_4_ = fVar229 * 1.5;
        auVar37._0_4_ = fVar219 * 1.5;
        fVar247 = auVar23._8_4_;
        auVar37._8_4_ = fVar247 * 1.5;
        fVar262 = auVar23._12_4_;
        auVar37._12_4_ = fVar262 * 1.5;
        fVar271 = auVar23._16_4_;
        auVar37._16_4_ = fVar271 * 1.5;
        fVar225 = auVar23._20_4_;
        auVar37._20_4_ = fVar225 * 1.5;
        fVar228 = auVar23._24_4_;
        auVar37._24_4_ = fVar228 * 1.5;
        auVar37._28_4_ = fVar188;
        auVar38._4_4_ = fVar229 * fVar229 * fVar229 * auVar148._4_4_ * 0.5;
        auVar38._0_4_ = fVar219 * fVar219 * fVar219 * auVar148._0_4_ * 0.5;
        auVar38._8_4_ = fVar247 * fVar247 * fVar247 * auVar148._8_4_ * 0.5;
        auVar38._12_4_ = fVar262 * fVar262 * fVar262 * auVar148._12_4_ * 0.5;
        auVar38._16_4_ = fVar271 * fVar271 * fVar271 * auVar148._16_4_ * 0.5;
        auVar38._20_4_ = fVar225 * fVar225 * fVar225 * auVar148._20_4_ * 0.5;
        auVar38._24_4_ = fVar228 * fVar228 * fVar228 * auVar148._24_4_ * 0.5;
        auVar38._28_4_ = auVar148._28_4_;
        auVar23 = vsubps_avx(auVar37,auVar38);
        fVar219 = auVar23._0_4_;
        fVar229 = auVar23._4_4_;
        fVar247 = auVar23._8_4_;
        fVar262 = auVar23._12_4_;
        fVar271 = auVar23._16_4_;
        fVar225 = auVar23._20_4_;
        fVar228 = auVar23._24_4_;
        fVar204 = fVar141 * fVar204 * fVar217;
        fVar221 = fStack_75c * fVar221 * fVar223;
        auVar39._4_4_ = fVar221;
        auVar39._0_4_ = fVar204;
        fVar241 = fStack_758 * fVar241 * fVar243;
        auVar39._8_4_ = fVar241;
        fVar248 = fStack_754 * fVar248 * fVar249;
        auVar39._12_4_ = fVar248;
        fVar264 = fStack_750 * fVar264 * fVar267;
        auVar39._16_4_ = fVar264;
        fVar272 = fStack_74c * fVar272 * fVar310;
        auVar39._20_4_ = fVar272;
        fVar313 = fStack_748 * fVar313 * fVar312;
        auVar39._24_4_ = fVar313;
        auVar39._28_4_ = fVar162;
        local_680._4_4_ = fVar221 + auVar336._4_4_;
        local_680._0_4_ = fVar204 + auVar336._0_4_;
        fStack_678 = fVar241 + auVar336._8_4_;
        fStack_674 = fVar248 + auVar336._12_4_;
        fStack_670 = fVar264 + auVar336._16_4_;
        fStack_66c = fVar272 + auVar336._20_4_;
        fStack_668 = fVar313 + auVar336._24_4_;
        fStack_664 = fVar162 + auVar336._28_4_;
        fVar204 = fVar141 * fVar217 * -fVar203;
        fVar221 = fStack_75c * fVar223 * -fVar155;
        auVar40._4_4_ = fVar221;
        auVar40._0_4_ = fVar204;
        fVar241 = fStack_758 * fVar243 * -fVar156;
        auVar40._8_4_ = fVar241;
        fVar248 = fStack_754 * fVar249 * -fVar157;
        auVar40._12_4_ = fVar248;
        fVar264 = fStack_750 * fVar267 * -fVar158;
        auVar40._16_4_ = fVar264;
        fVar272 = fStack_74c * fVar310 * -fVar159;
        auVar40._20_4_ = fVar272;
        fVar313 = fStack_748 * fVar312 * -fVar160;
        auVar40._24_4_ = fVar313;
        auVar40._28_4_ = fVar188;
        local_500._4_4_ = fVar221 + auVar279._4_4_;
        local_500._0_4_ = fVar204 + auVar279._0_4_;
        fStack_4f8 = fVar241 + auVar279._8_4_;
        fStack_4f4 = fVar248 + auVar279._12_4_;
        fStack_4f0 = fVar264 + auVar279._16_4_;
        fStack_4ec = fVar272 + auVar279._20_4_;
        fStack_4e8 = fVar313 + auVar279._24_4_;
        fStack_4e4 = fVar188 + auVar279._28_4_;
        fVar204 = fVar217 * 0.0 * fVar141;
        fVar217 = fVar223 * 0.0 * fStack_75c;
        auVar41._4_4_ = fVar217;
        auVar41._0_4_ = fVar204;
        fVar221 = fVar243 * 0.0 * fStack_758;
        auVar41._8_4_ = fVar221;
        fVar223 = fVar249 * 0.0 * fStack_754;
        auVar41._12_4_ = fVar223;
        fVar241 = fVar267 * 0.0 * fStack_750;
        auVar41._16_4_ = fVar241;
        fVar243 = fVar310 * 0.0 * fStack_74c;
        auVar41._20_4_ = fVar243;
        fVar248 = fVar312 * 0.0 * fStack_748;
        auVar41._24_4_ = fVar248;
        auVar41._28_4_ = fVar284;
        auVar119._4_4_ = fStack_65c;
        auVar119._0_4_ = local_660;
        auVar119._8_4_ = fStack_658;
        auVar119._12_4_ = fStack_654;
        auVar119._16_4_ = fStack_650;
        auVar119._20_4_ = fStack_64c;
        auVar119._24_4_ = fStack_648;
        auVar119._28_4_ = fStack_644;
        auVar295._0_4_ = fVar204 + local_660;
        auVar295._4_4_ = fVar217 + fStack_65c;
        auVar295._8_4_ = fVar221 + fStack_658;
        auVar295._12_4_ = fVar223 + fStack_654;
        auVar295._16_4_ = fVar241 + fStack_650;
        auVar295._20_4_ = fVar243 + fStack_64c;
        auVar295._24_4_ = fVar248 + fStack_648;
        auVar295._28_4_ = fVar284 + fStack_644;
        fVar204 = auVar359._0_4_ * fVar218 * fVar219;
        fVar217 = auVar359._4_4_ * fVar226 * fVar229;
        auVar42._4_4_ = fVar217;
        auVar42._0_4_ = fVar204;
        fVar218 = auVar359._8_4_ * fVar245 * fVar247;
        auVar42._8_4_ = fVar218;
        fVar221 = auVar359._12_4_ * fVar251 * fVar262;
        auVar42._12_4_ = fVar221;
        fVar223 = auVar359._16_4_ * fVar270 * fVar271;
        auVar42._16_4_ = fVar223;
        fVar226 = auVar359._20_4_ * fVar311 * fVar225;
        auVar42._20_4_ = fVar226;
        fVar241 = auVar359._24_4_ * fVar314 * fVar228;
        auVar42._24_4_ = fVar241;
        auVar42._28_4_ = auVar319._28_4_;
        auVar28 = vsubps_avx(auVar336,auVar39);
        auVar318._0_4_ = auVar235._0_4_ + fVar204;
        auVar318._4_4_ = auVar235._4_4_ + fVar217;
        auVar318._8_4_ = auVar235._8_4_ + fVar218;
        auVar318._12_4_ = auVar235._12_4_ + fVar221;
        auVar318._16_4_ = auVar235._16_4_ + fVar223;
        auVar318._20_4_ = auVar235._20_4_ + fVar226;
        auVar318._24_4_ = auVar235._24_4_ + fVar241;
        auVar318._28_4_ = auVar235._28_4_ + auVar319._28_4_;
        fVar204 = auVar359._0_4_ * -fVar161 * fVar219;
        fVar217 = auVar359._4_4_ * -fVar250 * fVar229;
        auVar43._4_4_ = fVar217;
        auVar43._0_4_ = fVar204;
        fVar218 = auVar359._8_4_ * -fVar285 * fVar247;
        auVar43._8_4_ = fVar218;
        fVar221 = auVar359._12_4_ * -fVar220 * fVar262;
        auVar43._12_4_ = fVar221;
        fVar223 = auVar359._16_4_ * -fVar222 * fVar271;
        auVar43._16_4_ = fVar223;
        fVar226 = auVar359._20_4_ * -fVar224 * fVar225;
        auVar43._20_4_ = fVar226;
        fVar241 = auVar359._24_4_ * -fVar227 * fVar228;
        auVar43._24_4_ = fVar241;
        auVar43._28_4_ = fVar351;
        auVar29 = vsubps_avx(auVar279,auVar40);
        auVar331._0_4_ = fVar204 + auVar211._0_4_;
        auVar331._4_4_ = fVar217 + auVar211._4_4_;
        auVar331._8_4_ = fVar218 + auVar211._8_4_;
        auVar331._12_4_ = fVar221 + auVar211._12_4_;
        auVar331._16_4_ = fVar223 + auVar211._16_4_;
        auVar331._20_4_ = fVar226 + auVar211._20_4_;
        auVar331._24_4_ = fVar241 + auVar211._24_4_;
        auVar331._28_4_ = fVar351 + auVar211._28_4_;
        fVar204 = fVar219 * 0.0 * auVar359._0_4_;
        fVar217 = fVar229 * 0.0 * auVar359._4_4_;
        auVar44._4_4_ = fVar217;
        auVar44._0_4_ = fVar204;
        fVar218 = fVar247 * 0.0 * auVar359._8_4_;
        auVar44._8_4_ = fVar218;
        fVar219 = fVar262 * 0.0 * auVar359._12_4_;
        auVar44._12_4_ = fVar219;
        fVar221 = fVar271 * 0.0 * auVar359._16_4_;
        auVar44._16_4_ = fVar221;
        fVar223 = fVar225 * 0.0 * auVar359._20_4_;
        auVar44._20_4_ = fVar223;
        fVar226 = fVar228 * 0.0 * auVar359._24_4_;
        auVar44._24_4_ = fVar226;
        auVar44._28_4_ = fVar357;
        auVar146 = vsubps_avx(auVar119,auVar41);
        auVar124._4_4_ = fStack_51c;
        auVar124._0_4_ = local_520;
        auVar124._8_4_ = fStack_518;
        auVar124._12_4_ = fStack_514;
        auVar124._16_4_ = fStack_510;
        auVar124._20_4_ = fStack_50c;
        auVar124._24_4_ = fStack_508;
        auVar124._28_4_ = fStack_504;
        auVar360._0_4_ = fVar204 + local_520;
        auVar360._4_4_ = fVar217 + fStack_51c;
        auVar360._8_4_ = fVar218 + fStack_518;
        auVar360._12_4_ = fVar219 + fStack_514;
        auVar360._16_4_ = fVar221 + fStack_510;
        auVar360._20_4_ = fVar223 + fStack_50c;
        auVar360._24_4_ = fVar226 + fStack_508;
        auVar360._28_4_ = fVar357 + fStack_504;
        auVar23 = vsubps_avx(auVar235,auVar42);
        auVar24 = vsubps_avx(auVar211,auVar43);
        auVar319 = vsubps_avx(auVar124,auVar44);
        auVar25 = vsubps_avx(auVar331,auVar29);
        auVar26 = vsubps_avx(auVar360,auVar146);
        auVar45._4_4_ = auVar146._4_4_ * auVar25._4_4_;
        auVar45._0_4_ = auVar146._0_4_ * auVar25._0_4_;
        auVar45._8_4_ = auVar146._8_4_ * auVar25._8_4_;
        auVar45._12_4_ = auVar146._12_4_ * auVar25._12_4_;
        auVar45._16_4_ = auVar146._16_4_ * auVar25._16_4_;
        auVar45._20_4_ = auVar146._20_4_ * auVar25._20_4_;
        auVar45._24_4_ = auVar146._24_4_ * auVar25._24_4_;
        auVar45._28_4_ = fVar357;
        auVar46._4_4_ = auVar29._4_4_ * auVar26._4_4_;
        auVar46._0_4_ = auVar29._0_4_ * auVar26._0_4_;
        auVar46._8_4_ = auVar29._8_4_ * auVar26._8_4_;
        auVar46._12_4_ = auVar29._12_4_ * auVar26._12_4_;
        auVar46._16_4_ = auVar29._16_4_ * auVar26._16_4_;
        auVar46._20_4_ = auVar29._20_4_ * auVar26._20_4_;
        auVar46._24_4_ = auVar29._24_4_ * auVar26._24_4_;
        auVar46._28_4_ = auVar211._28_4_;
        auVar27 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar28._4_4_ * auVar26._4_4_;
        auVar47._0_4_ = auVar28._0_4_ * auVar26._0_4_;
        auVar47._8_4_ = auVar28._8_4_ * auVar26._8_4_;
        auVar47._12_4_ = auVar28._12_4_ * auVar26._12_4_;
        auVar47._16_4_ = auVar28._16_4_ * auVar26._16_4_;
        auVar47._20_4_ = auVar28._20_4_ * auVar26._20_4_;
        auVar47._24_4_ = auVar28._24_4_ * auVar26._24_4_;
        auVar47._28_4_ = auVar26._28_4_;
        auVar30 = vsubps_avx(auVar318,auVar28);
        auVar48._4_4_ = auVar146._4_4_ * auVar30._4_4_;
        auVar48._0_4_ = auVar146._0_4_ * auVar30._0_4_;
        auVar48._8_4_ = auVar146._8_4_ * auVar30._8_4_;
        auVar48._12_4_ = auVar146._12_4_ * auVar30._12_4_;
        auVar48._16_4_ = auVar146._16_4_ * auVar30._16_4_;
        auVar48._20_4_ = auVar146._20_4_ * auVar30._20_4_;
        auVar48._24_4_ = auVar146._24_4_ * auVar30._24_4_;
        auVar48._28_4_ = auVar235._28_4_;
        auVar145 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = auVar30._4_4_ * auVar29._4_4_;
        auVar49._0_4_ = auVar30._0_4_ * auVar29._0_4_;
        auVar49._8_4_ = auVar30._8_4_ * auVar29._8_4_;
        auVar49._12_4_ = auVar30._12_4_ * auVar29._12_4_;
        auVar49._16_4_ = auVar30._16_4_ * auVar29._16_4_;
        auVar49._20_4_ = auVar30._20_4_ * auVar29._20_4_;
        auVar49._24_4_ = auVar30._24_4_ * auVar29._24_4_;
        auVar49._28_4_ = auVar26._28_4_;
        auVar50._4_4_ = auVar28._4_4_ * auVar25._4_4_;
        auVar50._0_4_ = auVar28._0_4_ * auVar25._0_4_;
        auVar50._8_4_ = auVar28._8_4_ * auVar25._8_4_;
        auVar50._12_4_ = auVar28._12_4_ * auVar25._12_4_;
        auVar50._16_4_ = auVar28._16_4_ * auVar25._16_4_;
        auVar50._20_4_ = auVar28._20_4_ * auVar25._20_4_;
        auVar50._24_4_ = auVar28._24_4_ * auVar25._24_4_;
        auVar50._28_4_ = auVar25._28_4_;
        auVar25 = vsubps_avx(auVar50,auVar49);
        auVar149._0_4_ = auVar27._0_4_ * 0.0 + auVar25._0_4_ + auVar145._0_4_ * 0.0;
        auVar149._4_4_ = auVar27._4_4_ * 0.0 + auVar25._4_4_ + auVar145._4_4_ * 0.0;
        auVar149._8_4_ = auVar27._8_4_ * 0.0 + auVar25._8_4_ + auVar145._8_4_ * 0.0;
        auVar149._12_4_ = auVar27._12_4_ * 0.0 + auVar25._12_4_ + auVar145._12_4_ * 0.0;
        auVar149._16_4_ = auVar27._16_4_ * 0.0 + auVar25._16_4_ + auVar145._16_4_ * 0.0;
        auVar149._20_4_ = auVar27._20_4_ * 0.0 + auVar25._20_4_ + auVar145._20_4_ * 0.0;
        auVar149._24_4_ = auVar27._24_4_ * 0.0 + auVar25._24_4_ + auVar145._24_4_ * 0.0;
        auVar149._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar145._28_4_;
        auVar145 = vcmpps_avx(auVar149,ZEXT432(0) << 0x20,2);
        auVar23 = vblendvps_avx(auVar23,_local_680,auVar145);
        auVar24 = vblendvps_avx(auVar24,_local_500,auVar145);
        auVar319 = vblendvps_avx(auVar319,auVar295,auVar145);
        auVar25 = vblendvps_avx(auVar28,auVar318,auVar145);
        auVar26 = vblendvps_avx(auVar29,auVar331,auVar145);
        auVar27 = vblendvps_avx(auVar146,auVar360,auVar145);
        auVar28 = vblendvps_avx(auVar318,auVar28,auVar145);
        auVar29 = vblendvps_avx(auVar331,auVar29,auVar145);
        auVar207 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
        auVar30 = vblendvps_avx(auVar360,auVar146,auVar145);
        auVar28 = vsubps_avx(auVar28,auVar23);
        auVar169 = vsubps_avx(auVar29,auVar24);
        auVar30 = vsubps_avx(auVar30,auVar319);
        auVar170 = vsubps_avx(auVar24,auVar26);
        fVar204 = auVar169._0_4_;
        fVar160 = auVar319._0_4_;
        fVar223 = auVar169._4_4_;
        fVar161 = auVar319._4_4_;
        auVar51._4_4_ = fVar161 * fVar223;
        auVar51._0_4_ = fVar160 * fVar204;
        fVar245 = auVar169._8_4_;
        fVar250 = auVar319._8_4_;
        auVar51._8_4_ = fVar250 * fVar245;
        fVar262 = auVar169._12_4_;
        fVar285 = auVar319._12_4_;
        auVar51._12_4_ = fVar285 * fVar262;
        fVar272 = auVar169._16_4_;
        fVar220 = auVar319._16_4_;
        auVar51._16_4_ = fVar220 * fVar272;
        fVar312 = auVar169._20_4_;
        fVar222 = auVar319._20_4_;
        auVar51._20_4_ = fVar222 * fVar312;
        fVar155 = auVar169._24_4_;
        fVar224 = auVar319._24_4_;
        auVar51._24_4_ = fVar224 * fVar155;
        auVar51._28_4_ = auVar29._28_4_;
        fVar217 = auVar24._0_4_;
        fVar187 = auVar30._0_4_;
        fVar226 = auVar24._4_4_;
        fVar189 = auVar30._4_4_;
        auVar52._4_4_ = fVar189 * fVar226;
        auVar52._0_4_ = fVar187 * fVar217;
        fVar247 = auVar24._8_4_;
        fVar286 = auVar30._8_4_;
        auVar52._8_4_ = fVar286 * fVar247;
        fVar264 = auVar24._12_4_;
        fVar266 = auVar30._12_4_;
        auVar52._12_4_ = fVar266 * fVar264;
        fVar310 = auVar24._16_4_;
        fVar269 = auVar30._16_4_;
        auVar52._16_4_ = fVar269 * fVar310;
        fVar314 = auVar24._20_4_;
        fVar230 = auVar30._20_4_;
        auVar52._20_4_ = fVar230 * fVar314;
        fVar156 = auVar24._24_4_;
        fVar242 = auVar30._24_4_;
        uVar8 = auVar146._28_4_;
        auVar52._24_4_ = fVar242 * fVar156;
        auVar52._28_4_ = uVar8;
        auVar29 = vsubps_avx(auVar52,auVar51);
        fVar218 = auVar23._0_4_;
        fVar229 = auVar23._4_4_;
        auVar53._4_4_ = fVar189 * fVar229;
        auVar53._0_4_ = fVar187 * fVar218;
        fVar248 = auVar23._8_4_;
        auVar53._8_4_ = fVar286 * fVar248;
        fVar267 = auVar23._12_4_;
        auVar53._12_4_ = fVar266 * fVar267;
        fVar311 = auVar23._16_4_;
        auVar53._16_4_ = fVar269 * fVar311;
        fVar228 = auVar23._20_4_;
        auVar53._20_4_ = fVar230 * fVar228;
        fVar157 = auVar23._24_4_;
        auVar53._24_4_ = fVar242 * fVar157;
        auVar53._28_4_ = uVar8;
        fVar219 = auVar28._0_4_;
        auVar354._0_4_ = fVar160 * fVar219;
        fVar241 = auVar28._4_4_;
        auVar354._4_4_ = fVar161 * fVar241;
        fVar249 = auVar28._8_4_;
        auVar354._8_4_ = fVar250 * fVar249;
        fVar270 = auVar28._12_4_;
        auVar354._12_4_ = fVar285 * fVar270;
        fVar225 = auVar28._16_4_;
        auVar354._16_4_ = fVar220 * fVar225;
        fVar188 = auVar28._20_4_;
        auVar354._20_4_ = fVar222 * fVar188;
        fVar158 = auVar28._24_4_;
        auVar354._24_4_ = fVar224 * fVar158;
        auVar354._28_4_ = 0;
        auVar146 = vsubps_avx(auVar354,auVar53);
        auVar54._4_4_ = fVar226 * fVar241;
        auVar54._0_4_ = fVar217 * fVar219;
        auVar54._8_4_ = fVar247 * fVar249;
        auVar54._12_4_ = fVar264 * fVar270;
        auVar54._16_4_ = fVar310 * fVar225;
        auVar54._20_4_ = fVar314 * fVar188;
        auVar54._24_4_ = fVar156 * fVar158;
        auVar54._28_4_ = uVar8;
        auVar55._4_4_ = fVar229 * fVar223;
        auVar55._0_4_ = fVar218 * fVar204;
        auVar55._8_4_ = fVar248 * fVar245;
        auVar55._12_4_ = fVar267 * fVar262;
        auVar55._16_4_ = fVar311 * fVar272;
        auVar55._20_4_ = fVar228 * fVar312;
        auVar55._24_4_ = fVar157 * fVar155;
        auVar55._28_4_ = auVar360._28_4_;
        auVar171 = vsubps_avx(auVar55,auVar54);
        auVar172 = vsubps_avx(auVar319,auVar27);
        fVar221 = auVar171._28_4_ + auVar146._28_4_;
        auVar296._0_4_ = auVar171._0_4_ + auVar146._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
        auVar296._4_4_ = auVar171._4_4_ + auVar146._4_4_ * 0.0 + auVar29._4_4_ * 0.0;
        auVar296._8_4_ = auVar171._8_4_ + auVar146._8_4_ * 0.0 + auVar29._8_4_ * 0.0;
        auVar296._12_4_ = auVar171._12_4_ + auVar146._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
        auVar296._16_4_ = auVar171._16_4_ + auVar146._16_4_ * 0.0 + auVar29._16_4_ * 0.0;
        auVar296._20_4_ = auVar171._20_4_ + auVar146._20_4_ * 0.0 + auVar29._20_4_ * 0.0;
        auVar296._24_4_ = auVar171._24_4_ + auVar146._24_4_ * 0.0 + auVar29._24_4_ * 0.0;
        auVar296._28_4_ = fVar221 + auVar29._28_4_;
        fVar227 = auVar170._0_4_;
        fVar162 = auVar170._4_4_;
        auVar56._4_4_ = fVar162 * auVar27._4_4_;
        auVar56._0_4_ = fVar227 * auVar27._0_4_;
        fVar164 = auVar170._8_4_;
        auVar56._8_4_ = fVar164 * auVar27._8_4_;
        fVar180 = auVar170._12_4_;
        auVar56._12_4_ = fVar180 * auVar27._12_4_;
        fVar183 = auVar170._16_4_;
        auVar56._16_4_ = fVar183 * auVar27._16_4_;
        fVar184 = auVar170._20_4_;
        auVar56._20_4_ = fVar184 * auVar27._20_4_;
        fVar186 = auVar170._24_4_;
        auVar56._24_4_ = fVar186 * auVar27._24_4_;
        auVar56._28_4_ = fVar221;
        fVar221 = auVar172._0_4_;
        fVar243 = auVar172._4_4_;
        auVar57._4_4_ = auVar26._4_4_ * fVar243;
        auVar57._0_4_ = auVar26._0_4_ * fVar221;
        fVar251 = auVar172._8_4_;
        auVar57._8_4_ = auVar26._8_4_ * fVar251;
        fVar271 = auVar172._12_4_;
        auVar57._12_4_ = auVar26._12_4_ * fVar271;
        fVar313 = auVar172._16_4_;
        auVar57._16_4_ = auVar26._16_4_ * fVar313;
        fVar203 = auVar172._20_4_;
        auVar57._20_4_ = auVar26._20_4_ * fVar203;
        fVar159 = auVar172._24_4_;
        auVar57._24_4_ = auVar26._24_4_ * fVar159;
        auVar57._28_4_ = auVar171._28_4_;
        auVar146 = vsubps_avx(auVar57,auVar56);
        auVar170 = vsubps_avx(auVar23,auVar25);
        fVar244 = auVar170._0_4_;
        fVar246 = auVar170._4_4_;
        auVar58._4_4_ = fVar246 * auVar27._4_4_;
        auVar58._0_4_ = fVar244 * auVar27._0_4_;
        fVar298 = auVar170._8_4_;
        auVar58._8_4_ = fVar298 * auVar27._8_4_;
        fVar299 = auVar170._12_4_;
        auVar58._12_4_ = fVar299 * auVar27._12_4_;
        fVar300 = auVar170._16_4_;
        auVar58._16_4_ = fVar300 * auVar27._16_4_;
        fVar301 = auVar170._20_4_;
        auVar58._20_4_ = fVar301 * auVar27._20_4_;
        fVar302 = auVar170._24_4_;
        auVar58._24_4_ = fVar302 * auVar27._24_4_;
        auVar58._28_4_ = auVar27._28_4_;
        auVar59._4_4_ = auVar25._4_4_ * fVar243;
        auVar59._0_4_ = auVar25._0_4_ * fVar221;
        auVar59._8_4_ = auVar25._8_4_ * fVar251;
        auVar59._12_4_ = auVar25._12_4_ * fVar271;
        auVar59._16_4_ = auVar25._16_4_ * fVar313;
        auVar59._20_4_ = auVar25._20_4_ * fVar203;
        auVar59._24_4_ = auVar25._24_4_ * fVar159;
        auVar59._28_4_ = auVar29._28_4_;
        auVar29 = vsubps_avx(auVar58,auVar59);
        auVar60._4_4_ = auVar26._4_4_ * fVar246;
        auVar60._0_4_ = auVar26._0_4_ * fVar244;
        auVar60._8_4_ = auVar26._8_4_ * fVar298;
        auVar60._12_4_ = auVar26._12_4_ * fVar299;
        auVar60._16_4_ = auVar26._16_4_ * fVar300;
        auVar60._20_4_ = auVar26._20_4_ * fVar301;
        auVar60._24_4_ = auVar26._24_4_ * fVar302;
        auVar60._28_4_ = auVar27._28_4_;
        auVar61._4_4_ = auVar25._4_4_ * fVar162;
        auVar61._0_4_ = auVar25._0_4_ * fVar227;
        auVar61._8_4_ = auVar25._8_4_ * fVar164;
        auVar61._12_4_ = auVar25._12_4_ * fVar180;
        auVar61._16_4_ = auVar25._16_4_ * fVar183;
        auVar61._20_4_ = auVar25._20_4_ * fVar184;
        auVar61._24_4_ = auVar25._24_4_ * fVar186;
        auVar61._28_4_ = auVar25._28_4_;
        auVar25 = vsubps_avx(auVar61,auVar60);
        auVar237._0_4_ = auVar146._0_4_ * 0.0 + auVar25._0_4_ + auVar29._0_4_ * 0.0;
        auVar237._4_4_ = auVar146._4_4_ * 0.0 + auVar25._4_4_ + auVar29._4_4_ * 0.0;
        auVar237._8_4_ = auVar146._8_4_ * 0.0 + auVar25._8_4_ + auVar29._8_4_ * 0.0;
        auVar237._12_4_ = auVar146._12_4_ * 0.0 + auVar25._12_4_ + auVar29._12_4_ * 0.0;
        auVar237._16_4_ = auVar146._16_4_ * 0.0 + auVar25._16_4_ + auVar29._16_4_ * 0.0;
        auVar237._20_4_ = auVar146._20_4_ * 0.0 + auVar25._20_4_ + auVar29._20_4_ * 0.0;
        auVar237._24_4_ = auVar146._24_4_ * 0.0 + auVar25._24_4_ + auVar29._24_4_ * 0.0;
        auVar237._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar29._28_4_;
        auVar25 = vmaxps_avx(auVar296,auVar237);
        auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
        auVar195 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auVar207 = vpand_avx(auVar207,auVar195);
        auVar195 = vpmovsxwd_avx(auVar207);
        auVar185 = vpunpckhwd_avx(auVar207,auVar207);
        auVar213._16_16_ = auVar185;
        auVar213._0_16_ = auVar195;
        if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar213 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar213 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar213 >> 0x7f,0) == '\0') &&
              (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar185 >> 0x3f,0) == '\0') &&
            (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar185[0xf]) {
LAB_00ffc820:
          auVar216 = ZEXT3264(auVar213);
          auVar259._8_8_ = uStack_578;
          auVar259._0_8_ = local_580;
          auVar259._16_8_ = uStack_570;
          auVar259._24_8_ = uStack_568;
          auVar309 = ZEXT3264(auVar144);
          auVar323 = ZEXT3264(auVar306);
          auVar341._4_4_ = fStack_75c;
          auVar341._0_4_ = fVar141;
          auVar341._8_4_ = fStack_758;
          auVar341._12_4_ = fStack_754;
          auVar341._16_4_ = fStack_750;
          auVar341._20_4_ = fStack_74c;
          auVar341._24_4_ = fStack_748;
          auVar341._28_4_ = fStack_744;
        }
        else {
          auVar62._4_4_ = fVar243 * fVar223;
          auVar62._0_4_ = fVar221 * fVar204;
          auVar62._8_4_ = fVar251 * fVar245;
          auVar62._12_4_ = fVar271 * fVar262;
          auVar62._16_4_ = fVar313 * fVar272;
          auVar62._20_4_ = fVar203 * fVar312;
          auVar62._24_4_ = fVar159 * fVar155;
          auVar62._28_4_ = auVar185._12_4_;
          auVar339._0_4_ = fVar227 * fVar187;
          auVar339._4_4_ = fVar162 * fVar189;
          auVar339._8_4_ = fVar164 * fVar286;
          auVar339._12_4_ = fVar180 * fVar266;
          auVar339._16_4_ = fVar183 * fVar269;
          auVar339._20_4_ = fVar184 * fVar230;
          auVar339._24_4_ = fVar186 * fVar242;
          auVar339._28_4_ = 0;
          auVar25 = vsubps_avx(auVar339,auVar62);
          auVar63._4_4_ = fVar246 * fVar189;
          auVar63._0_4_ = fVar244 * fVar187;
          auVar63._8_4_ = fVar298 * fVar286;
          auVar63._12_4_ = fVar299 * fVar266;
          auVar63._16_4_ = fVar300 * fVar269;
          auVar63._20_4_ = fVar301 * fVar230;
          auVar63._24_4_ = fVar302 * fVar242;
          auVar63._28_4_ = auVar30._28_4_;
          auVar64._4_4_ = fVar243 * fVar241;
          auVar64._0_4_ = fVar221 * fVar219;
          auVar64._8_4_ = fVar251 * fVar249;
          auVar64._12_4_ = fVar271 * fVar270;
          auVar64._16_4_ = fVar313 * fVar225;
          auVar64._20_4_ = fVar203 * fVar188;
          auVar64._24_4_ = fVar159 * fVar158;
          auVar64._28_4_ = auVar172._28_4_;
          auVar27 = vsubps_avx(auVar64,auVar63);
          auVar65._4_4_ = fVar162 * fVar241;
          auVar65._0_4_ = fVar227 * fVar219;
          auVar65._8_4_ = fVar164 * fVar249;
          auVar65._12_4_ = fVar180 * fVar270;
          auVar65._16_4_ = fVar183 * fVar225;
          auVar65._20_4_ = fVar184 * fVar188;
          auVar65._24_4_ = fVar186 * fVar158;
          auVar65._28_4_ = auVar28._28_4_;
          auVar66._4_4_ = fVar246 * fVar223;
          auVar66._0_4_ = fVar244 * fVar204;
          auVar66._8_4_ = fVar298 * fVar245;
          auVar66._12_4_ = fVar299 * fVar262;
          auVar66._16_4_ = fVar300 * fVar272;
          auVar66._20_4_ = fVar301 * fVar312;
          auVar66._24_4_ = fVar302 * fVar155;
          auVar66._28_4_ = auVar296._28_4_;
          auVar29 = vsubps_avx(auVar66,auVar65);
          auVar297._0_4_ = auVar25._0_4_ * 0.0 + auVar29._0_4_ + auVar27._0_4_ * 0.0;
          auVar297._4_4_ = auVar25._4_4_ * 0.0 + auVar29._4_4_ + auVar27._4_4_ * 0.0;
          auVar297._8_4_ = auVar25._8_4_ * 0.0 + auVar29._8_4_ + auVar27._8_4_ * 0.0;
          auVar297._12_4_ = auVar25._12_4_ * 0.0 + auVar29._12_4_ + auVar27._12_4_ * 0.0;
          auVar297._16_4_ = auVar25._16_4_ * 0.0 + auVar29._16_4_ + auVar27._16_4_ * 0.0;
          auVar297._20_4_ = auVar25._20_4_ * 0.0 + auVar29._20_4_ + auVar27._20_4_ * 0.0;
          auVar297._24_4_ = auVar25._24_4_ * 0.0 + auVar29._24_4_ + auVar27._24_4_ * 0.0;
          auVar297._28_4_ = auVar296._28_4_ + auVar29._28_4_ + auVar28._28_4_;
          auVar26 = vrcpps_avx(auVar297);
          fVar204 = auVar26._0_4_;
          fVar219 = auVar26._4_4_;
          auVar67._4_4_ = auVar297._4_4_ * fVar219;
          auVar67._0_4_ = auVar297._0_4_ * fVar204;
          fVar221 = auVar26._8_4_;
          auVar67._8_4_ = auVar297._8_4_ * fVar221;
          fVar223 = auVar26._12_4_;
          auVar67._12_4_ = auVar297._12_4_ * fVar223;
          fVar241 = auVar26._16_4_;
          auVar67._16_4_ = auVar297._16_4_ * fVar241;
          fVar243 = auVar26._20_4_;
          auVar67._20_4_ = auVar297._20_4_ * fVar243;
          fVar245 = auVar26._24_4_;
          auVar67._24_4_ = auVar297._24_4_ * fVar245;
          auVar67._28_4_ = auVar172._28_4_;
          auVar340._8_4_ = 0x3f800000;
          auVar340._0_8_ = 0x3f8000003f800000;
          auVar340._12_4_ = 0x3f800000;
          auVar340._16_4_ = 0x3f800000;
          auVar340._20_4_ = 0x3f800000;
          auVar340._24_4_ = 0x3f800000;
          auVar340._28_4_ = 0x3f800000;
          auVar28 = vsubps_avx(auVar340,auVar67);
          fVar204 = auVar28._0_4_ * fVar204 + fVar204;
          fVar219 = auVar28._4_4_ * fVar219 + fVar219;
          fVar221 = auVar28._8_4_ * fVar221 + fVar221;
          fVar223 = auVar28._12_4_ * fVar223 + fVar223;
          fVar241 = auVar28._16_4_ * fVar241 + fVar241;
          fVar243 = auVar28._20_4_ * fVar243 + fVar243;
          fVar245 = auVar28._24_4_ * fVar245 + fVar245;
          auVar68._4_4_ =
               (auVar25._4_4_ * fVar229 + auVar27._4_4_ * fVar226 + auVar29._4_4_ * fVar161) *
               fVar219;
          auVar68._0_4_ =
               (auVar25._0_4_ * fVar218 + auVar27._0_4_ * fVar217 + auVar29._0_4_ * fVar160) *
               fVar204;
          auVar68._8_4_ =
               (auVar25._8_4_ * fVar248 + auVar27._8_4_ * fVar247 + auVar29._8_4_ * fVar250) *
               fVar221;
          auVar68._12_4_ =
               (auVar25._12_4_ * fVar267 + auVar27._12_4_ * fVar264 + auVar29._12_4_ * fVar285) *
               fVar223;
          auVar68._16_4_ =
               (auVar25._16_4_ * fVar311 + auVar27._16_4_ * fVar310 + auVar29._16_4_ * fVar220) *
               fVar241;
          auVar68._20_4_ =
               (auVar25._20_4_ * fVar228 + auVar27._20_4_ * fVar314 + auVar29._20_4_ * fVar222) *
               fVar243;
          auVar68._24_4_ =
               (auVar25._24_4_ * fVar157 + auVar27._24_4_ * fVar156 + auVar29._24_4_ * fVar224) *
               fVar245;
          auVar68._28_4_ = auVar23._28_4_ + auVar169._28_4_ + auVar319._28_4_;
          auVar195 = vpermilps_avx(ZEXT416(uVar9),0);
          auVar214._16_16_ = auVar195;
          auVar214._0_16_ = auVar195;
          auVar319 = vcmpps_avx(auVar214,auVar68,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar257._4_4_ = uVar8;
          auVar257._0_4_ = uVar8;
          auVar257._8_4_ = uVar8;
          auVar257._12_4_ = uVar8;
          auVar257._16_4_ = uVar8;
          auVar257._20_4_ = uVar8;
          auVar257._24_4_ = uVar8;
          auVar257._28_4_ = uVar8;
          auVar25 = vcmpps_avx(auVar68,auVar257,2);
          auVar319 = vandps_avx(auVar25,auVar319);
          auVar195 = vpackssdw_avx(auVar319._0_16_,auVar319._16_16_);
          auVar207 = vpand_avx(auVar207,auVar195);
          auVar195 = vpmovsxwd_avx(auVar207);
          auVar185 = vpshufd_avx(auVar207,0xee);
          auVar185 = vpmovsxwd_avx(auVar185);
          auVar213._16_16_ = auVar185;
          auVar213._0_16_ = auVar195;
          if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar213 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar213 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar213 >> 0x7f,0) == '\0') &&
                (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar185 >> 0x3f,0) == '\0') &&
              (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar185[0xf]) goto LAB_00ffc820;
          auVar319 = vcmpps_avx(ZEXT832(0) << 0x20,auVar297,4);
          auVar195 = vpackssdw_avx(auVar319._0_16_,auVar319._16_16_);
          auVar207 = vpand_avx(auVar207,auVar195);
          auVar195 = vpmovsxwd_avx(auVar207);
          auVar207 = vpunpckhwd_avx(auVar207,auVar207);
          auVar216 = ZEXT1664(auVar207);
          auVar280._16_16_ = auVar207;
          auVar280._0_16_ = auVar195;
          auVar259._8_8_ = uStack_578;
          auVar259._0_8_ = local_580;
          auVar259._16_8_ = uStack_570;
          auVar259._24_8_ = uStack_568;
          auVar309 = ZEXT3264(auVar144);
          auVar323 = ZEXT3264(auVar306);
          auVar341._4_4_ = fStack_75c;
          auVar341._0_4_ = fVar141;
          auVar341._8_4_ = fStack_758;
          auVar341._12_4_ = fStack_754;
          auVar341._16_4_ = fStack_750;
          auVar341._20_4_ = fStack_74c;
          auVar341._24_4_ = fStack_748;
          auVar341._28_4_ = fStack_744;
          if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar280 >> 0x7f,0) != '\0') ||
                (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar207 >> 0x3f,0) != '\0') ||
              (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar207[0xf] < '\0') {
            auVar215._0_4_ = auVar296._0_4_ * fVar204;
            auVar215._4_4_ = auVar296._4_4_ * fVar219;
            auVar215._8_4_ = auVar296._8_4_ * fVar221;
            auVar215._12_4_ = auVar296._12_4_ * fVar223;
            auVar215._16_4_ = auVar296._16_4_ * fVar241;
            auVar215._20_4_ = auVar296._20_4_ * fVar243;
            auVar215._24_4_ = auVar296._24_4_ * fVar245;
            auVar215._28_4_ = 0;
            auVar69._4_4_ = auVar237._4_4_ * fVar219;
            auVar69._0_4_ = auVar237._0_4_ * fVar204;
            auVar69._8_4_ = auVar237._8_4_ * fVar221;
            auVar69._12_4_ = auVar237._12_4_ * fVar223;
            auVar69._16_4_ = auVar237._16_4_ * fVar241;
            auVar69._20_4_ = auVar237._20_4_ * fVar243;
            auVar69._24_4_ = auVar237._24_4_ * fVar245;
            auVar69._28_4_ = auVar28._28_4_ + auVar26._28_4_;
            auVar258._8_4_ = 0x3f800000;
            auVar258._0_8_ = 0x3f8000003f800000;
            auVar258._12_4_ = 0x3f800000;
            auVar258._16_4_ = 0x3f800000;
            auVar258._20_4_ = 0x3f800000;
            auVar258._24_4_ = 0x3f800000;
            auVar258._28_4_ = 0x3f800000;
            auVar144 = vsubps_avx(auVar258,auVar215);
            auVar144 = vblendvps_avx(auVar144,auVar215,auVar145);
            auVar309 = ZEXT3264(auVar144);
            auVar144 = vsubps_avx(auVar258,auVar69);
            auVar216 = ZEXT3264(auVar144);
            _local_3c0 = vblendvps_avx(auVar144,auVar69,auVar145);
            auVar323 = ZEXT3264(auVar68);
            auVar259 = auVar280;
          }
        }
        if ((((((((auVar259 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar259 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar259 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar259 >> 0x7f,0) != '\0') ||
              (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar259 >> 0xbf,0) != '\0') ||
            (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar259[0x1f] < '\0') {
          auVar144 = vsubps_avx(auVar359,auVar341);
          fVar217 = auVar341._0_4_ + auVar309._0_4_ * auVar144._0_4_;
          fVar218 = auVar341._4_4_ + auVar309._4_4_ * auVar144._4_4_;
          fVar219 = auVar341._8_4_ + auVar309._8_4_ * auVar144._8_4_;
          fVar221 = auVar341._12_4_ + auVar309._12_4_ * auVar144._12_4_;
          fVar223 = auVar341._16_4_ + auVar309._16_4_ * auVar144._16_4_;
          fVar226 = auVar341._20_4_ + auVar309._20_4_ * auVar144._20_4_;
          fVar229 = auVar341._24_4_ + auVar309._24_4_ * auVar144._24_4_;
          fVar241 = auVar341._28_4_ + auVar144._28_4_;
          fVar204 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar70._4_4_ = (fVar218 + fVar218) * fVar204;
          auVar70._0_4_ = (fVar217 + fVar217) * fVar204;
          auVar70._8_4_ = (fVar219 + fVar219) * fVar204;
          auVar70._12_4_ = (fVar221 + fVar221) * fVar204;
          auVar70._16_4_ = (fVar223 + fVar223) * fVar204;
          auVar70._20_4_ = (fVar226 + fVar226) * fVar204;
          auVar70._24_4_ = (fVar229 + fVar229) * fVar204;
          auVar70._28_4_ = fVar241 + fVar241;
          auVar319 = auVar323._0_32_;
          auVar144 = vcmpps_avx(auVar319,auVar70,6);
          auVar306 = auVar259 & auVar144;
          auVar240 = ZEXT3264(_local_720);
          if ((((((((auVar306 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar306 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar306 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar306 >> 0x7f,0) != '\0') ||
                (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar306 >> 0xbf,0) != '\0') ||
              (auVar306 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar306[0x1f] < '\0') {
            local_260 = vandps_avx(auVar144,auVar259);
            local_300 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            fStack_2fc = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            fStack_2f8 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            fStack_2f4 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            fStack_2f0 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            fStack_2ec = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            fStack_2e8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            fStack_2e4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            auVar306 = auVar309._0_32_;
            local_2c0 = 0;
            local_2a0 = local_6d0;
            uStack_298 = uStack_6c8;
            local_290 = local_5d0;
            uStack_288 = uStack_5c8;
            local_280 = local_5e0;
            uStack_278 = uStack_5d8;
            local_3c0._4_4_ = fStack_2fc;
            local_3c0._0_4_ = local_300;
            uStack_3b8._0_4_ = fStack_2f8;
            uStack_3b8._4_4_ = fStack_2f4;
            uStack_3b0._0_4_ = fStack_2f0;
            uStack_3b0._4_4_ = fStack_2ec;
            auVar128 = _local_3c0;
            uStack_3a8._0_4_ = fStack_2e8;
            uStack_3a8._4_4_ = fStack_2e4;
            auVar144 = _local_3c0;
            if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              pRVar133 = context->args;
              _local_3c0 = auVar144;
              if ((pRVar133->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar133 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar133 >> 8),1),
                 pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar191._0_4_ = 1.0 / (float)(int)uVar20;
                auVar191._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar207 = vshufps_avx(auVar191,auVar191,0);
                local_240[0] = auVar207._0_4_ * (auVar309._0_4_ + 0.0);
                local_240[1] = auVar207._4_4_ * (auVar309._4_4_ + 1.0);
                local_240[2] = auVar207._8_4_ * (auVar309._8_4_ + 2.0);
                local_240[3] = auVar207._12_4_ * (auVar309._12_4_ + 3.0);
                fStack_230 = auVar207._0_4_ * (auVar309._16_4_ + 4.0);
                fStack_22c = auVar207._4_4_ * (auVar309._20_4_ + 5.0);
                fStack_228 = auVar207._8_4_ * (auVar309._24_4_ + 6.0);
                fStack_224 = auVar309._28_4_ + 7.0;
                uStack_3b0 = auVar128._16_8_;
                uStack_3a8 = auVar144._24_8_;
                local_220 = local_3c0;
                uStack_218 = uStack_3b8;
                uStack_210 = uStack_3b0;
                uStack_208 = uStack_3a8;
                local_200 = auVar319;
                iVar132 = vmovmskps_avx(local_260);
                local_840 = CONCAT44((int)((ulong)pRVar133 >> 0x20),iVar132);
                lVar140 = 0;
                if (local_840 != 0) {
                  for (; (local_840 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
                  }
                }
                if (iVar132 == 0) {
                  pRVar133 = (RTCIntersectArguments *)0x0;
                }
                else {
                  local_740 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
                  auStack_730 = auVar23._16_16_;
                  local_620 = vshufps_avx(ZEXT416(uVar136),ZEXT416(uVar136),0);
                  auStack_610 = auVar24._16_16_;
                  _auStack_630 = auVar235._16_16_;
                  _local_640 = *local_6b8;
                  local_4e0._4_28_ = auVar211._4_28_;
                  local_4e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_320 = auVar306;
                  local_2e0 = auVar319;
                  local_2bc = uVar20;
                  do {
                    local_440 = local_240[lVar140];
                    local_760 = (uint)lVar140;
                    fStack_75c = (float)((ulong)lVar140 >> 0x20);
                    local_430 = *(undefined4 *)((long)&local_220 + lVar140 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_200 + lVar140 * 4);
                    fVar217 = 1.0 - local_440;
                    fVar204 = local_440 * fVar217 + local_440 * fVar217;
                    auVar207 = ZEXT416((uint)(local_440 * local_440 * 3.0));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    auVar195 = ZEXT416((uint)((fVar204 - local_440 * local_440) * 3.0));
                    auVar195 = vshufps_avx(auVar195,auVar195,0);
                    auVar185 = ZEXT416((uint)((fVar217 * fVar217 - fVar204) * 3.0));
                    auVar185 = vshufps_avx(auVar185,auVar185,0);
                    local_6b0.context = context->user;
                    auVar192 = ZEXT416((uint)(fVar217 * fVar217 * -3.0));
                    auVar192 = vshufps_avx(auVar192,auVar192,0);
                    auVar193._0_4_ =
                         local_870 * auVar192._0_4_ +
                         auVar185._0_4_ * (float)local_6d0._0_4_ +
                         auVar207._0_4_ * (float)local_5e0._0_4_ +
                         auVar195._0_4_ * (float)local_5d0._0_4_;
                    auVar193._4_4_ =
                         fStack_86c * auVar192._4_4_ +
                         auVar185._4_4_ * (float)local_6d0._4_4_ +
                         auVar207._4_4_ * (float)local_5e0._4_4_ +
                         auVar195._4_4_ * (float)local_5d0._4_4_;
                    auVar193._8_4_ =
                         fStack_868 * auVar192._8_4_ +
                         auVar185._8_4_ * (float)uStack_6c8 +
                         auVar207._8_4_ * (float)uStack_5d8 + auVar195._8_4_ * (float)uStack_5c8;
                    auVar193._12_4_ =
                         fStack_864 * auVar192._12_4_ +
                         auVar185._12_4_ * uStack_6c8._4_4_ +
                         auVar207._12_4_ * uStack_5d8._4_4_ + auVar195._12_4_ * uStack_5c8._4_4_;
                    local_470 = (RTCHitN  [16])vshufps_avx(auVar193,auVar193,0);
                    local_460 = vshufps_avx(auVar193,auVar193,0x55);
                    auVar216 = ZEXT1664(local_460);
                    local_450 = vshufps_avx(auVar193,auVar193,0xaa);
                    local_420 = local_620._0_8_;
                    uStack_418 = local_620._8_8_;
                    local_410 = local_740._0_8_;
                    uStack_408 = local_740._8_8_;
                    vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_3fc = (local_6b0.context)->instID[0];
                    local_400 = uStack_3fc;
                    uStack_3f8 = uStack_3fc;
                    uStack_3f4 = uStack_3fc;
                    uStack_3f0 = (local_6b0.context)->instPrimID[0];
                    uStack_3ec = uStack_3f0;
                    uStack_3e8 = uStack_3f0;
                    uStack_3e4 = uStack_3f0;
                    local_780 = _local_640;
                    local_6b0.valid = (int *)local_780;
                    local_6b0.geometryUserPtr = *(void **)(local_560._0_8_ + 0x18);
                    local_6b0.hit = local_470;
                    local_6b0.N = 4;
                    pRVar134 = *(RayK<4> **)(local_560._0_8_ + 0x48);
                    local_6b0.ray = (RTCRayN *)ray;
                    fStack_43c = local_440;
                    fStack_438 = local_440;
                    fStack_434 = local_440;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    if (pRVar134 != (RayK<4> *)0x0) {
                      auVar216 = ZEXT1664(local_460);
                      pRVar134 = (RayK<4> *)(*(code *)pRVar134)(&local_6b0);
                      auVar323 = ZEXT3264(auVar319);
                      auVar309 = ZEXT3264(auVar306);
                    }
                    if (local_780 == (undefined1  [16])0x0) {
                      auVar207 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar207 = auVar207 ^ _DAT_01f7ae20;
                      auVar240 = ZEXT3264(_local_720);
                    }
                    else {
                      p_Var22 = context->args->filter;
                      if (p_Var22 == (RTCFilterFunctionN)0x0) {
                        auVar240 = ZEXT3264(_local_720);
                      }
                      else {
                        auVar240 = ZEXT3264(_local_720);
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_560._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar216 = ZEXT1664(auVar216._0_16_);
                          (*p_Var22)(&local_6b0);
                          auVar240 = ZEXT3264(_local_720);
                          auVar323 = ZEXT3264(auVar319);
                          auVar309 = ZEXT3264(auVar306);
                        }
                      }
                      auVar195 = vpcmpeqd_avx(local_780,_DAT_01f7aa10);
                      auVar207 = auVar195 ^ _DAT_01f7ae20;
                      auVar194._8_4_ = 0xff800000;
                      auVar194._0_8_ = 0xff800000ff800000;
                      auVar194._12_4_ = 0xff800000;
                      auVar195 = vblendvps_avx(auVar194,*(undefined1 (*) [16])(local_6b0.ray + 0x80)
                                               ,auVar195);
                      *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar195;
                      pRVar134 = (RayK<4> *)local_6b0.ray;
                    }
                    auVar167._8_8_ = 0x100000001;
                    auVar167._0_8_ = 0x100000001;
                    if ((auVar167 & auVar207) != (undefined1  [16])0x0) {
                      pRVar133 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar134 >> 8),1);
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_4e0._0_4_;
                    local_840 = local_840 ^ 1L << ((ulong)local_760 & 0x3f);
                    lVar140 = 0;
                    if (local_840 != 0) {
                      for (; (local_840 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
                      }
                    }
                    fStack_75c = (float)((ulong)lVar140 >> 0x20);
                    pRVar133 = (RTCIntersectArguments *)0x0;
                  } while (local_840 != 0);
                }
              }
              goto LAB_00ffb2b1;
            }
          }
          goto LAB_00ffabec;
        }
        pRVar133 = (RTCIntersectArguments *)0x0;
        auVar240 = ZEXT3264(_local_720);
      }
LAB_00ffb2b1:
      auVar337 = ZEXT3264(auVar173);
      uVar136 = (uint)pRVar133;
      if (8 < (int)uVar20) {
        _local_720 = auVar240._0_32_;
        auVar207 = vpshufd_avx(ZEXT416(uVar20),0);
        local_520 = auVar207._0_4_;
        fStack_51c = auVar207._4_4_;
        fStack_518 = auVar207._8_4_;
        fStack_514 = auVar207._12_4_;
        auVar207 = vshufps_avx(_local_700,_local_700,0);
        local_3a0._16_16_ = auVar207;
        local_3a0._0_16_ = auVar207;
        auVar207 = vpermilps_avx(ZEXT416(uVar9),0);
        local_560._16_16_ = auVar207;
        local_560._0_16_ = auVar207;
        auVar143._0_4_ = 1.0 / (float)local_4c0._0_4_;
        auVar143._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar207 = vshufps_avx(auVar143,auVar143,0);
        register0x00001210 = auVar207;
        _local_100 = auVar207;
        local_330 = vshufps_avx(ZEXT416((uint)local_768),ZEXT416((uint)local_768),0);
        local_5f0 = vshufps_avx(ZEXT416((uint)local_5f0._0_4_),ZEXT416((uint)local_5f0._0_4_),0);
        auVar154 = ZEXT1664(local_5f0);
        local_740._0_8_ = 8;
        auVar144 = auVar309._0_32_;
        auVar306 = auVar323._0_32_;
        do {
          local_760 = (uint)pRVar133;
          pauVar1 = (undefined1 (*) [28])(bezier_basis0 + local_740._0_8_ * 4 + lVar139);
          fVar204 = *(float *)*pauVar1;
          fVar217 = *(float *)(*pauVar1 + 4);
          fVar218 = *(float *)(*pauVar1 + 8);
          fVar219 = *(float *)(*pauVar1 + 0xc);
          fVar221 = *(float *)(*pauVar1 + 0x10);
          fVar223 = *(float *)(*pauVar1 + 0x14);
          fVar226 = *(float *)(*pauVar1 + 0x18);
          auVar127 = *pauVar1;
          fVar229 = *(float *)pauVar1[1];
          pfVar3 = (float *)(lVar139 + 0x21aa768 + local_740._0_8_ * 4);
          fVar251 = *pfVar3;
          fVar262 = pfVar3[1];
          fVar264 = pfVar3[2];
          fVar267 = pfVar3[3];
          fVar270 = pfVar3[4];
          fVar271 = pfVar3[5];
          fVar272 = pfVar3[6];
          pauVar1 = (undefined1 (*) [28])(lVar139 + 0x21aabec + local_740._0_8_ * 4);
          fVar241 = *(float *)*pauVar1;
          fVar243 = *(float *)(*pauVar1 + 4);
          fVar245 = *(float *)(*pauVar1 + 8);
          fVar247 = *(float *)(*pauVar1 + 0xc);
          fVar248 = *(float *)(*pauVar1 + 0x10);
          fVar249 = *(float *)(*pauVar1 + 0x14);
          fVar310 = *(float *)(*pauVar1 + 0x18);
          auVar126 = *pauVar1;
          pauVar4 = (undefined1 (*) [32])(lVar139 + 0x21ab070 + local_740._0_8_ * 4);
          fVar311 = *(float *)*pauVar4;
          fVar225 = *(float *)(*pauVar4 + 4);
          fVar313 = *(float *)(*pauVar4 + 8);
          fVar312 = *(float *)(*pauVar4 + 0xc);
          fVar314 = *(float *)(*pauVar4 + 0x10);
          fVar228 = *(float *)(*pauVar4 + 0x14);
          fVar188 = *(float *)(*pauVar4 + 0x18);
          auVar125 = *(undefined1 (*) [28])*pauVar4;
          fVar155 = auVar216._28_4_;
          fVar203 = fVar155 + *(float *)(*pauVar4 + 0x1c);
          fVar161 = fVar155 + fVar155 + auVar154._28_4_;
          fVar250 = fVar155 + fVar203;
          auVar307._0_4_ =
               (float)local_360._0_4_ * fVar204 +
               (float)local_380._0_4_ * fVar251 +
               auVar337._0_4_ * fVar241 + (float)local_4a0._0_4_ * fVar311;
          auVar307._4_4_ =
               (float)local_360._4_4_ * fVar217 +
               (float)local_380._4_4_ * fVar262 +
               auVar337._4_4_ * fVar243 + (float)local_4a0._4_4_ * fVar225;
          auVar307._8_4_ =
               fStack_358 * fVar218 +
               fStack_378 * fVar264 + auVar337._8_4_ * fVar245 + fStack_498 * fVar313;
          auVar307._12_4_ =
               fStack_354 * fVar219 +
               fStack_374 * fVar267 + auVar337._12_4_ * fVar247 + fStack_494 * fVar312;
          auVar307._16_4_ =
               fStack_350 * fVar221 +
               fStack_370 * fVar270 + auVar337._16_4_ * fVar248 + fStack_490 * fVar314;
          auVar307._20_4_ =
               fStack_34c * fVar223 +
               fStack_36c * fVar271 + auVar337._20_4_ * fVar249 + fStack_48c * fVar228;
          auVar307._24_4_ =
               fStack_348 * fVar226 +
               fStack_368 * fVar272 + auVar337._24_4_ * fVar310 + fStack_488 * fVar188;
          auVar307._28_4_ = fVar203 + fVar161;
          auVar202._0_4_ =
               (float)local_140._0_4_ * fVar204 +
               (float)local_120._0_4_ * fVar251 + fVar252 * fVar241 + fVar273 * fVar311;
          auVar202._4_4_ =
               (float)local_140._4_4_ * fVar217 +
               (float)local_120._4_4_ * fVar262 + fVar263 * fVar243 + fVar282 * fVar225;
          auVar202._8_4_ =
               fStack_138 * fVar218 + fStack_118 * fVar264 + fVar265 * fVar245 + fVar283 * fVar313;
          auVar202._12_4_ =
               fStack_134 * fVar219 + fStack_114 * fVar267 + fVar268 * fVar247 + fVar284 * fVar312;
          auVar202._16_4_ =
               fStack_130 * fVar221 + fStack_110 * fVar270 + fVar252 * fVar248 + fVar273 * fVar314;
          auVar202._20_4_ =
               fStack_12c * fVar223 + fStack_10c * fVar271 + fVar263 * fVar249 + fVar282 * fVar228;
          auVar202._24_4_ =
               fStack_128 * fVar226 + fStack_108 * fVar272 + fVar265 * fVar310 + fVar283 * fVar188;
          auVar202._28_4_ = fVar161 + fVar155 + fVar155 + auVar240._28_4_;
          fVar203 = fVar204 * (float)local_1a0._0_4_ +
                    (float)local_a0._0_4_ * fVar251 +
                    fVar241 * (float)local_160._0_4_ + fVar311 * (float)local_180._0_4_;
          fVar155 = fVar217 * (float)local_1a0._4_4_ +
                    (float)local_a0._4_4_ * fVar262 +
                    fVar243 * (float)local_160._4_4_ + fVar225 * (float)local_180._4_4_;
          fVar156 = fVar218 * fStack_198 +
                    fStack_98 * fVar264 + fVar245 * fStack_158 + fVar313 * fStack_178;
          fVar157 = fVar219 * fStack_194 +
                    fStack_94 * fVar267 + fVar247 * fStack_154 + fVar312 * fStack_174;
          fVar158 = fVar221 * fStack_190 +
                    fStack_90 * fVar270 + fVar248 * fStack_150 + fVar314 * fStack_170;
          fVar159 = fVar223 * fStack_18c +
                    fStack_8c * fVar271 + fVar249 * fStack_14c + fVar228 * fStack_16c;
          fVar160 = fVar226 * fStack_188 +
                    fStack_88 * fVar272 + fVar310 * fStack_148 + fVar188 * fStack_168;
          fVar161 = fVar161 + fVar250;
          pauVar2 = (undefined1 (*) [32])(bezier_basis1 + local_740._0_8_ * 4 + lVar139);
          auVar128 = *(undefined1 (*) [24])*pauVar2;
          pauVar1 = (undefined1 (*) [28])(lVar139 + 0x21acb88 + local_740._0_8_ * 4);
          fVar217 = *(float *)*pauVar1;
          fVar219 = *(float *)(*pauVar1 + 4);
          fVar223 = *(float *)(*pauVar1 + 8);
          fVar243 = *(float *)(*pauVar1 + 0xc);
          fVar247 = *(float *)(*pauVar1 + 0x10);
          fVar249 = *(float *)(*pauVar1 + 0x14);
          fVar310 = *(float *)(*pauVar1 + 0x18);
          auVar129 = *pauVar1;
          auVar23 = *(undefined1 (*) [32])(lVar139 + 0x21ad00c + local_740._0_8_ * 4);
          auVar154 = ZEXT3264(auVar23);
          pfVar3 = (float *)(lVar139 + 0x21ad490 + local_740._0_8_ * 4);
          fVar311 = *pfVar3;
          fVar225 = pfVar3[1];
          fVar313 = pfVar3[2];
          fVar312 = pfVar3[3];
          fVar314 = pfVar3[4];
          fVar228 = pfVar3[5];
          fVar188 = pfVar3[6];
          fVar204 = auVar23._0_4_;
          fVar218 = auVar23._4_4_;
          fVar221 = auVar23._8_4_;
          fVar226 = auVar23._12_4_;
          fVar241 = auVar23._16_4_;
          fVar245 = auVar23._20_4_;
          fVar248 = auVar23._24_4_;
          fVar285 = fVar229 + pfVar3[7];
          fVar250 = fVar229 + fVar229 + fVar250;
          local_700._0_4_ = auVar128._0_4_;
          local_700._4_4_ = auVar128._4_4_;
          auStack_6f8._0_4_ = auVar128._8_4_;
          auStack_6f8._4_4_ = auVar128._12_4_;
          fStack_6f0 = auVar128._16_4_;
          fStack_6ec = auVar128._20_4_;
          fStack_6e8 = (float)*(undefined8 *)(*pauVar2 + 0x18);
          local_4e0._0_4_ =
               (float)local_360._0_4_ * (float)local_700._0_4_ +
               (float)local_380._0_4_ * fVar217 +
               auVar337._0_4_ * fVar204 + (float)local_4a0._0_4_ * fVar311;
          local_4e0._4_4_ =
               (float)local_360._4_4_ * (float)local_700._4_4_ +
               (float)local_380._4_4_ * fVar219 +
               auVar337._4_4_ * fVar218 + (float)local_4a0._4_4_ * fVar225;
          local_4e0._8_4_ =
               fStack_358 * (float)auStack_6f8._0_4_ +
               fStack_378 * fVar223 + auVar337._8_4_ * fVar221 + fStack_498 * fVar313;
          local_4e0._12_4_ =
               fStack_354 * (float)auStack_6f8._4_4_ +
               fStack_374 * fVar243 + auVar337._12_4_ * fVar226 + fStack_494 * fVar312;
          local_4e0._16_4_ =
               fStack_350 * fStack_6f0 +
               fStack_370 * fVar247 + auVar337._16_4_ * fVar241 + fStack_490 * fVar314;
          local_4e0._20_4_ =
               fStack_34c * fStack_6ec +
               fStack_36c * fVar249 + auVar337._20_4_ * fVar245 + fStack_48c * fVar228;
          local_4e0._24_4_ =
               fStack_348 * fStack_6e8 +
               fStack_368 * fVar310 + auVar337._24_4_ * fVar248 + fStack_488 * fVar188;
          local_4e0._28_4_ = fVar285 + fVar250;
          auVar260._0_4_ =
               (float)local_140._0_4_ * (float)local_700._0_4_ +
               (float)local_120._0_4_ * fVar217 + fVar252 * fVar204 + fVar273 * fVar311;
          auVar260._4_4_ =
               (float)local_140._4_4_ * (float)local_700._4_4_ +
               (float)local_120._4_4_ * fVar219 + fVar263 * fVar218 + fVar282 * fVar225;
          auVar260._8_4_ =
               fStack_138 * (float)auStack_6f8._0_4_ +
               fStack_118 * fVar223 + fVar265 * fVar221 + fVar283 * fVar313;
          auVar260._12_4_ =
               fStack_134 * (float)auStack_6f8._4_4_ +
               fStack_114 * fVar243 + fVar268 * fVar226 + fVar284 * fVar312;
          auVar260._16_4_ =
               fStack_130 * fStack_6f0 +
               fStack_110 * fVar247 + fVar252 * fVar241 + fVar273 * fVar314;
          auVar260._20_4_ =
               fStack_12c * fStack_6ec +
               fStack_10c * fVar249 + fVar263 * fVar245 + fVar282 * fVar228;
          auVar260._24_4_ =
               fStack_128 * fStack_6e8 +
               fStack_108 * fVar310 + fVar265 * fVar248 + fVar283 * fVar188;
          auVar260._28_4_ = fVar250 + fVar229 + fVar229 + fVar284;
          auVar320._0_4_ =
               (float)local_a0._0_4_ * fVar217 +
               fVar204 * (float)local_160._0_4_ + fVar311 * (float)local_180._0_4_ +
               (float)local_700._0_4_ * (float)local_1a0._0_4_;
          auVar320._4_4_ =
               (float)local_a0._4_4_ * fVar219 +
               fVar218 * (float)local_160._4_4_ + fVar225 * (float)local_180._4_4_ +
               (float)local_700._4_4_ * (float)local_1a0._4_4_;
          auVar320._8_4_ =
               fStack_98 * fVar223 + fVar221 * fStack_158 + fVar313 * fStack_178 +
               (float)auStack_6f8._0_4_ * fStack_198;
          auVar320._12_4_ =
               fStack_94 * fVar243 + fVar226 * fStack_154 + fVar312 * fStack_174 +
               (float)auStack_6f8._4_4_ * fStack_194;
          auVar320._16_4_ =
               fStack_90 * fVar247 + fVar241 * fStack_150 + fVar314 * fStack_170 +
               fStack_6f0 * fStack_190;
          auVar320._20_4_ =
               fStack_8c * fVar249 + fVar245 * fStack_14c + fVar228 * fStack_16c +
               fStack_6ec * fStack_18c;
          auVar320._24_4_ =
               fStack_88 * fVar310 + fVar248 * fStack_148 + fVar188 * fStack_168 +
               fStack_6e8 * fStack_188;
          auVar320._28_4_ = fVar229 + fVar285 + fVar250;
          auVar216 = ZEXT3264(auVar337._0_32_);
          auVar319 = vsubps_avx(local_4e0,auVar307);
          auVar25 = vsubps_avx(auVar260,auVar202);
          fVar310 = auVar319._0_4_;
          fVar220 = auVar319._4_4_;
          auVar71._4_4_ = fVar220 * auVar202._4_4_;
          auVar71._0_4_ = fVar310 * auVar202._0_4_;
          fVar222 = auVar319._8_4_;
          auVar71._8_4_ = fVar222 * auVar202._8_4_;
          fVar224 = auVar319._12_4_;
          auVar71._12_4_ = fVar224 * auVar202._12_4_;
          fVar227 = auVar319._16_4_;
          auVar71._16_4_ = fVar227 * auVar202._16_4_;
          fVar162 = auVar319._20_4_;
          auVar71._20_4_ = fVar162 * auVar202._20_4_;
          fVar164 = auVar319._24_4_;
          auVar71._24_4_ = fVar164 * auVar202._24_4_;
          auVar71._28_4_ = fVar250;
          fVar217 = auVar25._0_4_;
          fVar219 = auVar25._4_4_;
          auVar72._4_4_ = auVar307._4_4_ * fVar219;
          auVar72._0_4_ = auVar307._0_4_ * fVar217;
          fVar223 = auVar25._8_4_;
          auVar72._8_4_ = auVar307._8_4_ * fVar223;
          fVar229 = auVar25._12_4_;
          auVar72._12_4_ = auVar307._12_4_ * fVar229;
          fVar243 = auVar25._16_4_;
          auVar72._16_4_ = auVar307._16_4_ * fVar243;
          fVar247 = auVar25._20_4_;
          auVar72._20_4_ = auVar307._20_4_ * fVar247;
          fVar249 = auVar25._24_4_;
          auVar72._24_4_ = auVar307._24_4_ * fVar249;
          auVar72._28_4_ = auVar260._28_4_;
          auVar26 = vsubps_avx(auVar71,auVar72);
          auVar117._4_4_ = fVar155;
          auVar117._0_4_ = fVar203;
          auVar117._8_4_ = fVar156;
          auVar117._12_4_ = fVar157;
          auVar117._16_4_ = fVar158;
          auVar117._20_4_ = fVar159;
          auVar117._24_4_ = fVar160;
          auVar117._28_4_ = fVar161;
          auVar24 = vmaxps_avx(auVar117,auVar320);
          auVar73._4_4_ = auVar24._4_4_ * auVar24._4_4_ * (fVar220 * fVar220 + fVar219 * fVar219);
          auVar73._0_4_ = auVar24._0_4_ * auVar24._0_4_ * (fVar310 * fVar310 + fVar217 * fVar217);
          auVar73._8_4_ = auVar24._8_4_ * auVar24._8_4_ * (fVar222 * fVar222 + fVar223 * fVar223);
          auVar73._12_4_ = auVar24._12_4_ * auVar24._12_4_ * (fVar224 * fVar224 + fVar229 * fVar229)
          ;
          auVar73._16_4_ = auVar24._16_4_ * auVar24._16_4_ * (fVar227 * fVar227 + fVar243 * fVar243)
          ;
          auVar73._20_4_ = auVar24._20_4_ * auVar24._20_4_ * (fVar162 * fVar162 + fVar247 * fVar247)
          ;
          auVar73._24_4_ = auVar24._24_4_ * auVar24._24_4_ * (fVar164 * fVar164 + fVar249 * fVar249)
          ;
          auVar73._28_4_ = fVar285 + auVar260._28_4_;
          auVar74._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar74._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar74._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar74._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar74._16_4_ = auVar26._16_4_ * auVar26._16_4_;
          auVar74._20_4_ = auVar26._20_4_ * auVar26._20_4_;
          auVar74._24_4_ = auVar26._24_4_ * auVar26._24_4_;
          auVar74._28_4_ = auVar26._28_4_;
          auVar240 = ZEXT3264(auVar74);
          auVar24 = vcmpps_avx(auVar74,auVar73,2);
          local_2c0 = (uint)local_740._0_8_;
          auVar195 = vpshufd_avx(ZEXT416(local_2c0),0);
          auVar207 = vpor_avx(auVar195,_DAT_01f7fcf0);
          auVar195 = vpor_avx(auVar195,_DAT_01fafea0);
          auVar123._4_4_ = fStack_51c;
          auVar123._0_4_ = local_520;
          auVar123._8_4_ = fStack_518;
          auVar123._12_4_ = fStack_514;
          auVar207 = vpcmpgtd_avx(auVar123,auVar207);
          auVar195 = vpcmpgtd_avx(auVar123,auVar195);
          auVar174._16_16_ = auVar195;
          auVar174._0_16_ = auVar207;
          auVar26 = auVar174 & auVar24;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            auVar337 = ZEXT3264(auVar337._0_32_);
            pRVar133 = (RTCIntersectArguments *)((ulong)pRVar133 & 0xffffffff);
            _local_700 = *pauVar2;
          }
          else {
            local_5a0._0_4_ = auVar129._0_4_;
            local_5a0._4_4_ = auVar129._4_4_;
            fStack_598 = auVar129._8_4_;
            fStack_594 = auVar129._12_4_;
            fStack_590 = auVar129._16_4_;
            fStack_58c = auVar129._20_4_;
            fStack_588 = auVar129._24_4_;
            local_5c0 = (float)local_700._0_4_ * (float)local_540._0_4_ +
                        (float)local_c0._0_4_ * (float)local_5a0._0_4_ +
                        (float)local_e0._0_4_ * fVar204 + (float)local_720._0_4_ * fVar311;
            fStack_5bc = (float)local_700._4_4_ * (float)local_540._4_4_ +
                         (float)local_c0._4_4_ * (float)local_5a0._4_4_ +
                         (float)local_e0._4_4_ * fVar218 + (float)local_720._4_4_ * fVar225;
            fStack_5b8 = (float)auStack_6f8._0_4_ * fStack_538 +
                         fStack_b8 * fStack_598 + fStack_d8 * fVar221 + fStack_718 * fVar313;
            fStack_5b4 = (float)auStack_6f8._4_4_ * fStack_534 +
                         fStack_b4 * fStack_594 + fStack_d4 * fVar226 + fStack_714 * fVar312;
            fStack_5b0 = fStack_6f0 * fStack_530 +
                         fStack_b0 * fStack_590 + fStack_d0 * fVar241 + fStack_710 * fVar314;
            fStack_5ac = fStack_6ec * fStack_52c +
                         fStack_ac * fStack_58c + fStack_cc * fVar245 + fStack_70c * fVar228;
            fStack_5a8 = fStack_6e8 * fStack_528 +
                         fStack_a8 * fStack_588 + fStack_c8 * fVar248 + fStack_708 * fVar188;
            fStack_5a4 = auVar320._28_4_ + auVar23._28_4_ + auVar195._12_4_ + 0.0;
            local_680._0_4_ = auVar126._0_4_;
            local_680._4_4_ = auVar126._4_4_;
            fStack_678 = auVar126._8_4_;
            fStack_674 = auVar126._12_4_;
            fStack_670 = auVar126._16_4_;
            fStack_66c = auVar126._20_4_;
            fStack_668 = auVar126._24_4_;
            fVar164 = (float)local_e0._0_4_ * (float)local_680._0_4_;
            fVar180 = (float)local_e0._4_4_ * (float)local_680._4_4_;
            fVar141 = fStack_d8 * fStack_678;
            fVar183 = fStack_d4 * fStack_674;
            fVar184 = fStack_d0 * fStack_670;
            fVar186 = fStack_cc * fStack_66c;
            fVar187 = fStack_c8 * fStack_668;
            local_500._0_4_ = auVar125._0_4_;
            local_500._4_4_ = auVar125._4_4_;
            fStack_4f8 = auVar125._8_4_;
            fStack_4f4 = auVar125._12_4_;
            fStack_4f0 = auVar125._16_4_;
            fStack_4ec = auVar125._20_4_;
            fStack_4e8 = auVar125._24_4_;
            pfVar3 = (float *)(lVar139 + 0x21abdfc + local_740._0_8_ * 4);
            fVar204 = *pfVar3;
            fVar217 = pfVar3[1];
            fVar218 = pfVar3[2];
            fVar219 = pfVar3[3];
            fVar221 = pfVar3[4];
            fVar223 = pfVar3[5];
            fVar226 = pfVar3[6];
            pfVar5 = (float *)(lVar139 + 0x21ac280 + local_740._0_8_ * 4);
            fVar229 = *pfVar5;
            fVar241 = pfVar5[1];
            fVar243 = pfVar5[2];
            fVar245 = pfVar5[3];
            fVar247 = pfVar5[4];
            fVar248 = pfVar5[5];
            fVar249 = pfVar5[6];
            pfVar6 = (float *)(lVar139 + 0x21ab978 + local_740._0_8_ * 4);
            fVar310 = *pfVar6;
            fVar311 = pfVar6[1];
            fVar225 = pfVar6[2];
            fVar313 = pfVar6[3];
            fVar312 = pfVar6[4];
            fVar314 = pfVar6[5];
            fVar228 = pfVar6[6];
            fVar162 = pfVar3[7] + pfVar5[7];
            fVar189 = pfVar5[7] + fStack_124 + 0.0;
            fVar286 = fStack_124 + fStack_344 + fStack_124 + 0.0;
            pfVar3 = (float *)(lVar139 + 0x21ab4f4 + local_740._0_8_ * 4);
            fVar188 = *pfVar3;
            fVar250 = pfVar3[1];
            fVar285 = pfVar3[2];
            fVar220 = pfVar3[3];
            fVar222 = pfVar3[4];
            fVar224 = pfVar3[5];
            fVar227 = pfVar3[6];
            local_680._4_4_ =
                 (float)local_360._4_4_ * fVar250 +
                 fVar311 * (float)local_380._4_4_ +
                 fVar217 * fVar179 + (float)local_4a0._4_4_ * fVar241;
            local_680._0_4_ =
                 (float)local_360._0_4_ * fVar188 +
                 fVar310 * (float)local_380._0_4_ +
                 fVar204 * fVar163 + (float)local_4a0._0_4_ * fVar229;
            fStack_678 = fStack_358 * fVar285 +
                         fVar225 * fStack_378 + fVar218 * fVar181 + fStack_498 * fVar243;
            fStack_674 = fStack_354 * fVar220 +
                         fVar313 * fStack_374 + fVar219 * fVar182 + fStack_494 * fVar245;
            fStack_670 = fStack_350 * fVar222 +
                         fVar312 * fStack_370 + fVar221 * fVar163 + fStack_490 * fVar247;
            fStack_66c = fStack_34c * fVar224 +
                         fVar314 * fStack_36c + fVar223 * fVar179 + fStack_48c * fVar248;
            fStack_668 = fStack_348 * fVar227 +
                         fVar228 * fStack_368 + fVar226 * fVar181 + fStack_488 * fVar249;
            fStack_664 = fVar162 + fVar189;
            auVar175._0_4_ =
                 (float)local_140._0_4_ * fVar188 +
                 fVar252 * fVar204 + fVar273 * fVar229 + (float)local_120._0_4_ * fVar310;
            auVar175._4_4_ =
                 (float)local_140._4_4_ * fVar250 +
                 fVar263 * fVar217 + fVar282 * fVar241 + (float)local_120._4_4_ * fVar311;
            auVar175._8_4_ =
                 fStack_138 * fVar285 + fVar265 * fVar218 + fVar283 * fVar243 + fStack_118 * fVar225
            ;
            auVar175._12_4_ =
                 fStack_134 * fVar220 + fVar268 * fVar219 + fVar284 * fVar245 + fStack_114 * fVar313
            ;
            auVar175._16_4_ =
                 fStack_130 * fVar222 + fVar252 * fVar221 + fVar273 * fVar247 + fStack_110 * fVar312
            ;
            auVar175._20_4_ =
                 fStack_12c * fVar224 + fVar263 * fVar223 + fVar282 * fVar248 + fStack_10c * fVar314
            ;
            auVar175._24_4_ =
                 fStack_128 * fVar227 + fVar265 * fVar226 + fVar283 * fVar249 + fStack_108 * fVar228
            ;
            auVar175._28_4_ = fVar189 + fVar286;
            auVar346._0_4_ =
                 fVar310 * (float)local_c0._0_4_ +
                 (float)local_e0._0_4_ * fVar204 + (float)local_720._0_4_ * fVar229 +
                 fVar188 * (float)local_540._0_4_;
            auVar346._4_4_ =
                 fVar311 * (float)local_c0._4_4_ +
                 (float)local_e0._4_4_ * fVar217 + (float)local_720._4_4_ * fVar241 +
                 fVar250 * (float)local_540._4_4_;
            auVar346._8_4_ =
                 fVar225 * fStack_b8 + fStack_d8 * fVar218 + fStack_718 * fVar243 +
                 fVar285 * fStack_538;
            auVar346._12_4_ =
                 fVar313 * fStack_b4 + fStack_d4 * fVar219 + fStack_714 * fVar245 +
                 fVar220 * fStack_534;
            auVar346._16_4_ =
                 fVar312 * fStack_b0 + fStack_d0 * fVar221 + fStack_710 * fVar247 +
                 fVar222 * fStack_530;
            auVar346._20_4_ =
                 fVar314 * fStack_ac + fStack_cc * fVar223 + fStack_70c * fVar248 +
                 fVar224 * fStack_52c;
            auVar346._24_4_ =
                 fVar228 * fStack_a8 + fStack_c8 * fVar226 + fStack_708 * fVar249 +
                 fVar227 * fStack_528;
            auVar346._28_4_ = pfVar6[7] + fVar162 + fVar286;
            pfVar3 = (float *)(lVar139 + 0x21ae21c + local_740._0_8_ * 4);
            fVar204 = *pfVar3;
            fVar217 = pfVar3[1];
            fVar218 = pfVar3[2];
            fVar219 = pfVar3[3];
            fVar221 = pfVar3[4];
            fVar223 = pfVar3[5];
            fVar226 = pfVar3[6];
            pfVar5 = (float *)(lVar139 + 0x21ae6a0 + local_740._0_8_ * 4);
            fVar229 = *pfVar5;
            fVar241 = pfVar5[1];
            fVar243 = pfVar5[2];
            fVar245 = pfVar5[3];
            fVar247 = pfVar5[4];
            fVar248 = pfVar5[5];
            fVar249 = pfVar5[6];
            pfVar6 = (float *)(lVar139 + 0x21add98 + local_740._0_8_ * 4);
            fVar310 = *pfVar6;
            fVar311 = pfVar6[1];
            fVar225 = pfVar6[2];
            fVar313 = pfVar6[3];
            fVar312 = pfVar6[4];
            fVar314 = pfVar6[5];
            fVar228 = pfVar6[6];
            pfVar7 = (float *)(lVar139 + 0x21ad914 + local_740._0_8_ * 4);
            fVar188 = *pfVar7;
            fVar250 = pfVar7[1];
            fVar285 = pfVar7[2];
            fVar220 = pfVar7[3];
            fVar222 = pfVar7[4];
            fVar224 = pfVar7[5];
            fVar227 = pfVar7[6];
            auVar321._0_4_ =
                 fVar188 * (float)local_360._0_4_ +
                 fVar310 * (float)local_380._0_4_ +
                 fVar204 * fVar163 + fVar229 * (float)local_4a0._0_4_;
            auVar321._4_4_ =
                 fVar250 * (float)local_360._4_4_ +
                 fVar311 * (float)local_380._4_4_ +
                 fVar217 * fVar179 + fVar241 * (float)local_4a0._4_4_;
            auVar321._8_4_ =
                 fVar285 * fStack_358 +
                 fVar225 * fStack_378 + fVar218 * fVar181 + fVar243 * fStack_498;
            auVar321._12_4_ =
                 fVar220 * fStack_354 +
                 fVar313 * fStack_374 + fVar219 * fVar182 + fVar245 * fStack_494;
            auVar321._16_4_ =
                 fVar222 * fStack_350 +
                 fVar312 * fStack_370 + fVar221 * fVar163 + fVar247 * fStack_490;
            auVar321._20_4_ =
                 fVar224 * fStack_34c +
                 fVar314 * fStack_36c + fVar223 * fVar179 + fVar248 * fStack_48c;
            auVar321._24_4_ =
                 fVar227 * fStack_348 +
                 fVar228 * fStack_368 + fVar226 * fVar181 + fVar249 * fStack_488;
            auVar321._28_4_ = fStack_704 + fStack_704 + fStack_344 + fStack_484;
            auVar342._0_4_ =
                 (float)local_140._0_4_ * fVar188 +
                 fVar310 * (float)local_120._0_4_ + fVar252 * fVar204 + fVar229 * fVar273;
            auVar342._4_4_ =
                 (float)local_140._4_4_ * fVar250 +
                 fVar311 * (float)local_120._4_4_ + fVar263 * fVar217 + fVar241 * fVar282;
            auVar342._8_4_ =
                 fStack_138 * fVar285 + fVar225 * fStack_118 + fVar265 * fVar218 + fVar243 * fVar283
            ;
            auVar342._12_4_ =
                 fStack_134 * fVar220 + fVar313 * fStack_114 + fVar268 * fVar219 + fVar245 * fVar284
            ;
            auVar342._16_4_ =
                 fStack_130 * fVar222 + fVar312 * fStack_110 + fVar252 * fVar221 + fVar247 * fVar273
            ;
            auVar342._20_4_ =
                 fStack_12c * fVar224 + fVar314 * fStack_10c + fVar263 * fVar223 + fVar248 * fVar282
            ;
            auVar342._24_4_ =
                 fStack_128 * fVar227 + fVar228 * fStack_108 + fVar265 * fVar226 + fVar249 * fVar283
            ;
            auVar342._28_4_ = fStack_704 + fStack_704 + fStack_104 + fStack_704;
            auVar261._8_4_ = 0x7fffffff;
            auVar261._0_8_ = 0x7fffffff7fffffff;
            auVar261._12_4_ = 0x7fffffff;
            auVar261._16_4_ = 0x7fffffff;
            auVar261._20_4_ = 0x7fffffff;
            auVar261._24_4_ = 0x7fffffff;
            auVar261._28_4_ = 0x7fffffff;
            auVar23 = vandps_avx(_local_680,auVar261);
            auVar26 = vandps_avx(auVar175,auVar261);
            auVar26 = vmaxps_avx(auVar23,auVar26);
            auVar23 = vandps_avx(auVar346,auVar261);
            auVar26 = vmaxps_avx(auVar26,auVar23);
            auVar26 = vcmpps_avx(auVar26,local_3a0,1);
            auVar27 = vblendvps_avx(_local_680,auVar319,auVar26);
            auVar151._0_4_ =
                 fVar188 * (float)local_540._0_4_ +
                 fVar310 * (float)local_c0._0_4_ +
                 fVar229 * (float)local_720._0_4_ + (float)local_e0._0_4_ * fVar204;
            auVar151._4_4_ =
                 fVar250 * (float)local_540._4_4_ +
                 fVar311 * (float)local_c0._4_4_ +
                 fVar241 * (float)local_720._4_4_ + (float)local_e0._4_4_ * fVar217;
            auVar151._8_4_ =
                 fVar285 * fStack_538 +
                 fVar225 * fStack_b8 + fVar243 * fStack_718 + fStack_d8 * fVar218;
            auVar151._12_4_ =
                 fVar220 * fStack_534 +
                 fVar313 * fStack_b4 + fVar245 * fStack_714 + fStack_d4 * fVar219;
            auVar151._16_4_ =
                 fVar222 * fStack_530 +
                 fVar312 * fStack_b0 + fVar247 * fStack_710 + fStack_d0 * fVar221;
            auVar151._20_4_ =
                 fVar224 * fStack_52c +
                 fVar314 * fStack_ac + fVar248 * fStack_70c + fStack_cc * fVar223;
            auVar151._24_4_ =
                 fVar227 * fStack_528 +
                 fVar228 * fStack_a8 + fVar249 * fStack_708 + fStack_c8 * fVar226;
            auVar151._28_4_ = auVar23._28_4_ + pfVar6[7] + pfVar5[7] + pfVar3[7];
            auVar28 = vblendvps_avx(auVar175,auVar25,auVar26);
            auVar23 = vandps_avx(auVar321,auVar261);
            auVar26 = vandps_avx(auVar342,auVar261);
            auVar29 = vmaxps_avx(auVar23,auVar26);
            auVar23 = vandps_avx(auVar151,auVar261);
            auVar23 = vmaxps_avx(auVar29,auVar23);
            local_640._0_4_ = auVar127._0_4_;
            local_640._4_4_ = auVar127._4_4_;
            fStack_638 = auVar127._8_4_;
            fStack_634 = auVar127._12_4_;
            auStack_630._0_4_ = auVar127._16_4_;
            auStack_630._4_4_ = auVar127._20_4_;
            fStack_628 = auVar127._24_4_;
            auVar26 = vcmpps_avx(auVar23,local_3a0,1);
            auVar23 = vblendvps_avx(auVar321,auVar319,auVar26);
            auVar152._0_4_ =
                 (float)local_540._0_4_ * (float)local_640._0_4_ +
                 (float)local_c0._0_4_ * fVar251 +
                 fVar164 + (float)local_720._0_4_ * (float)local_500._0_4_;
            auVar152._4_4_ =
                 (float)local_540._4_4_ * (float)local_640._4_4_ +
                 (float)local_c0._4_4_ * fVar262 +
                 fVar180 + (float)local_720._4_4_ * (float)local_500._4_4_;
            auVar152._8_4_ =
                 fStack_538 * fStack_638 + fStack_b8 * fVar264 + fVar141 + fStack_718 * fStack_4f8;
            auVar152._12_4_ =
                 fStack_534 * fStack_634 + fStack_b4 * fVar267 + fVar183 + fStack_714 * fStack_4f4;
            auVar152._16_4_ =
                 fStack_530 * (float)auStack_630._0_4_ +
                 fStack_b0 * fVar270 + fVar184 + fStack_710 * fStack_4f0;
            auVar152._20_4_ =
                 fStack_52c * (float)auStack_630._4_4_ +
                 fStack_ac * fVar271 + fVar186 + fStack_70c * fStack_4ec;
            auVar152._24_4_ =
                 fStack_528 * fStack_628 + fStack_a8 * fVar272 + fVar187 + fStack_708 * fStack_4e8;
            auVar152._28_4_ = auVar29._28_4_ + fStack_5a4 + auVar195._12_4_ + 0.0;
            auVar26 = vblendvps_avx(auVar342,auVar25,auVar26);
            fVar162 = auVar27._0_4_;
            fVar164 = auVar27._4_4_;
            fVar180 = auVar27._8_4_;
            fVar141 = auVar27._12_4_;
            fVar183 = auVar27._16_4_;
            fVar184 = auVar27._20_4_;
            fVar186 = auVar27._24_4_;
            fVar187 = auVar27._28_4_;
            fVar251 = auVar23._0_4_;
            fVar264 = auVar23._4_4_;
            fVar270 = auVar23._8_4_;
            fVar272 = auVar23._12_4_;
            fVar311 = auVar23._16_4_;
            fVar313 = auVar23._20_4_;
            fVar314 = auVar23._24_4_;
            fVar204 = auVar28._0_4_;
            fVar218 = auVar28._4_4_;
            fVar221 = auVar28._8_4_;
            fVar226 = auVar28._12_4_;
            fVar241 = auVar28._16_4_;
            fVar245 = auVar28._20_4_;
            fVar248 = auVar28._24_4_;
            auVar332._0_4_ = fVar204 * fVar204 + fVar162 * fVar162;
            auVar332._4_4_ = fVar218 * fVar218 + fVar164 * fVar164;
            auVar332._8_4_ = fVar221 * fVar221 + fVar180 * fVar180;
            auVar332._12_4_ = fVar226 * fVar226 + fVar141 * fVar141;
            auVar332._16_4_ = fVar241 * fVar241 + fVar183 * fVar183;
            auVar332._20_4_ = fVar245 * fVar245 + fVar184 * fVar184;
            auVar332._24_4_ = fVar248 * fVar248 + fVar186 * fVar186;
            auVar332._28_4_ = auVar319._28_4_ + auVar25._28_4_;
            auVar319 = vrsqrtps_avx(auVar332);
            fVar217 = auVar319._0_4_;
            fVar219 = auVar319._4_4_;
            auVar75._4_4_ = fVar219 * 1.5;
            auVar75._0_4_ = fVar217 * 1.5;
            fVar223 = auVar319._8_4_;
            auVar75._8_4_ = fVar223 * 1.5;
            fVar229 = auVar319._12_4_;
            auVar75._12_4_ = fVar229 * 1.5;
            fVar243 = auVar319._16_4_;
            auVar75._16_4_ = fVar243 * 1.5;
            fVar247 = auVar319._20_4_;
            auVar75._20_4_ = fVar247 * 1.5;
            fVar249 = auVar319._24_4_;
            auVar75._24_4_ = fVar249 * 1.5;
            auVar75._28_4_ = auVar342._28_4_;
            auVar76._4_4_ = fVar219 * fVar219 * fVar219 * auVar332._4_4_ * 0.5;
            auVar76._0_4_ = fVar217 * fVar217 * fVar217 * auVar332._0_4_ * 0.5;
            auVar76._8_4_ = fVar223 * fVar223 * fVar223 * auVar332._8_4_ * 0.5;
            auVar76._12_4_ = fVar229 * fVar229 * fVar229 * auVar332._12_4_ * 0.5;
            auVar76._16_4_ = fVar243 * fVar243 * fVar243 * auVar332._16_4_ * 0.5;
            auVar76._20_4_ = fVar247 * fVar247 * fVar247 * auVar332._20_4_ * 0.5;
            auVar76._24_4_ = fVar249 * fVar249 * fVar249 * auVar332._24_4_ * 0.5;
            auVar76._28_4_ = auVar332._28_4_;
            auVar25 = vsubps_avx(auVar75,auVar76);
            fVar188 = auVar25._0_4_;
            fVar250 = auVar25._4_4_;
            fVar285 = auVar25._8_4_;
            fVar220 = auVar25._12_4_;
            fVar222 = auVar25._16_4_;
            fVar224 = auVar25._20_4_;
            fVar227 = auVar25._24_4_;
            fVar217 = auVar26._0_4_;
            fVar219 = auVar26._4_4_;
            fVar223 = auVar26._8_4_;
            fVar229 = auVar26._12_4_;
            fVar243 = auVar26._16_4_;
            fVar247 = auVar26._20_4_;
            fVar249 = auVar26._24_4_;
            auVar308._0_4_ = fVar217 * fVar217 + fVar251 * fVar251;
            auVar308._4_4_ = fVar219 * fVar219 + fVar264 * fVar264;
            auVar308._8_4_ = fVar223 * fVar223 + fVar270 * fVar270;
            auVar308._12_4_ = fVar229 * fVar229 + fVar272 * fVar272;
            auVar308._16_4_ = fVar243 * fVar243 + fVar311 * fVar311;
            auVar308._20_4_ = fVar247 * fVar247 + fVar313 * fVar313;
            auVar308._24_4_ = fVar249 * fVar249 + fVar314 * fVar314;
            auVar308._28_4_ = auVar319._28_4_ + auVar23._28_4_;
            auVar23 = vrsqrtps_avx(auVar308);
            fVar262 = auVar23._0_4_;
            fVar267 = auVar23._4_4_;
            auVar77._4_4_ = fVar267 * 1.5;
            auVar77._0_4_ = fVar262 * 1.5;
            fVar271 = auVar23._8_4_;
            auVar77._8_4_ = fVar271 * 1.5;
            fVar310 = auVar23._12_4_;
            auVar77._12_4_ = fVar310 * 1.5;
            fVar225 = auVar23._16_4_;
            auVar77._16_4_ = fVar225 * 1.5;
            fVar312 = auVar23._20_4_;
            auVar77._20_4_ = fVar312 * 1.5;
            fVar228 = auVar23._24_4_;
            auVar77._24_4_ = fVar228 * 1.5;
            auVar77._28_4_ = auVar342._28_4_;
            auVar78._4_4_ = fVar267 * fVar267 * fVar267 * auVar308._4_4_ * 0.5;
            auVar78._0_4_ = fVar262 * fVar262 * fVar262 * auVar308._0_4_ * 0.5;
            auVar78._8_4_ = fVar271 * fVar271 * fVar271 * auVar308._8_4_ * 0.5;
            auVar78._12_4_ = fVar310 * fVar310 * fVar310 * auVar308._12_4_ * 0.5;
            auVar78._16_4_ = fVar225 * fVar225 * fVar225 * auVar308._16_4_ * 0.5;
            auVar78._20_4_ = fVar312 * fVar312 * fVar312 * auVar308._20_4_ * 0.5;
            auVar78._24_4_ = fVar228 * fVar228 * fVar228 * auVar308._24_4_ * 0.5;
            auVar78._28_4_ = auVar308._28_4_;
            auVar319 = vsubps_avx(auVar77,auVar78);
            fVar262 = auVar319._0_4_;
            fVar267 = auVar319._4_4_;
            fVar271 = auVar319._8_4_;
            fVar310 = auVar319._12_4_;
            fVar225 = auVar319._16_4_;
            fVar312 = auVar319._20_4_;
            fVar228 = auVar319._24_4_;
            fVar204 = fVar203 * fVar188 * fVar204;
            fVar218 = fVar155 * fVar250 * fVar218;
            auVar79._4_4_ = fVar218;
            auVar79._0_4_ = fVar204;
            fVar221 = fVar156 * fVar285 * fVar221;
            auVar79._8_4_ = fVar221;
            fVar226 = fVar157 * fVar220 * fVar226;
            auVar79._12_4_ = fVar226;
            fVar241 = fVar158 * fVar222 * fVar241;
            auVar79._16_4_ = fVar241;
            fVar245 = fVar159 * fVar224 * fVar245;
            auVar79._20_4_ = fVar245;
            fVar248 = fVar160 * fVar227 * fVar248;
            auVar79._24_4_ = fVar248;
            auVar79._28_4_ = auVar23._28_4_;
            local_640._4_4_ = fVar218 + auVar307._4_4_;
            local_640._0_4_ = fVar204 + auVar307._0_4_;
            fStack_638 = fVar221 + auVar307._8_4_;
            fStack_634 = fVar226 + auVar307._12_4_;
            auStack_630._0_4_ = fVar241 + auVar307._16_4_;
            auStack_630._4_4_ = fVar245 + auVar307._20_4_;
            fStack_628 = fVar248 + auVar307._24_4_;
            fStack_624 = auVar23._28_4_ + auVar307._28_4_;
            local_660 = fVar203 * fVar188 * -fVar162;
            fStack_65c = fVar155 * fVar250 * -fVar164;
            auVar80._4_4_ = fStack_65c;
            auVar80._0_4_ = local_660;
            fStack_658 = fVar156 * fVar285 * -fVar180;
            auVar80._8_4_ = fStack_658;
            fStack_654 = fVar157 * fVar220 * -fVar141;
            auVar80._12_4_ = fStack_654;
            fStack_650 = fVar158 * fVar222 * -fVar183;
            auVar80._16_4_ = fStack_650;
            fStack_64c = fVar159 * fVar224 * -fVar184;
            auVar80._20_4_ = fStack_64c;
            fStack_648 = fVar160 * fVar227 * -fVar186;
            auVar80._24_4_ = fStack_648;
            auVar80._28_4_ = -fVar187;
            local_660 = auVar202._0_4_ + local_660;
            fStack_65c = auVar202._4_4_ + fStack_65c;
            fStack_658 = auVar202._8_4_ + fStack_658;
            fStack_654 = auVar202._12_4_ + fStack_654;
            fStack_650 = auVar202._16_4_ + fStack_650;
            fStack_64c = auVar202._20_4_ + fStack_64c;
            fStack_648 = auVar202._24_4_ + fStack_648;
            fStack_644 = auVar202._28_4_ + -fVar187;
            fVar204 = fVar188 * 0.0 * fVar203;
            fVar218 = fVar250 * 0.0 * fVar155;
            auVar81._4_4_ = fVar218;
            auVar81._0_4_ = fVar204;
            fVar221 = fVar285 * 0.0 * fVar156;
            auVar81._8_4_ = fVar221;
            fVar226 = fVar220 * 0.0 * fVar157;
            auVar81._12_4_ = fVar226;
            fVar241 = fVar222 * 0.0 * fVar158;
            auVar81._16_4_ = fVar241;
            fVar245 = fVar224 * 0.0 * fVar159;
            auVar81._20_4_ = fVar245;
            fVar248 = fVar227 * 0.0 * fVar160;
            auVar81._24_4_ = fVar248;
            auVar81._28_4_ = fVar187;
            auVar23 = vsubps_avx(auVar307,auVar79);
            auVar361._0_4_ = fVar204 + auVar152._0_4_;
            auVar361._4_4_ = fVar218 + auVar152._4_4_;
            auVar361._8_4_ = fVar221 + auVar152._8_4_;
            auVar361._12_4_ = fVar226 + auVar152._12_4_;
            auVar361._16_4_ = fVar241 + auVar152._16_4_;
            auVar361._20_4_ = fVar245 + auVar152._20_4_;
            auVar361._24_4_ = fVar248 + auVar152._24_4_;
            auVar361._28_4_ = fVar187 + auVar152._28_4_;
            fVar204 = auVar320._0_4_ * fVar262 * fVar217;
            fVar217 = auVar320._4_4_ * fVar267 * fVar219;
            auVar82._4_4_ = fVar217;
            auVar82._0_4_ = fVar204;
            fVar218 = auVar320._8_4_ * fVar271 * fVar223;
            auVar82._8_4_ = fVar218;
            fVar219 = auVar320._12_4_ * fVar310 * fVar229;
            auVar82._12_4_ = fVar219;
            fVar221 = auVar320._16_4_ * fVar225 * fVar243;
            auVar82._16_4_ = fVar221;
            fVar223 = auVar320._20_4_ * fVar312 * fVar247;
            auVar82._20_4_ = fVar223;
            fVar226 = auVar320._24_4_ * fVar228 * fVar249;
            auVar82._24_4_ = fVar226;
            auVar82._28_4_ = fVar161;
            auVar170 = vsubps_avx(auVar202,auVar80);
            auVar347._0_4_ = (float)local_4e0._0_4_ + fVar204;
            auVar347._4_4_ = local_4e0._4_4_ + fVar217;
            auVar347._8_4_ = local_4e0._8_4_ + fVar218;
            auVar347._12_4_ = local_4e0._12_4_ + fVar219;
            auVar347._16_4_ = local_4e0._16_4_ + fVar221;
            auVar347._20_4_ = local_4e0._20_4_ + fVar223;
            auVar347._24_4_ = local_4e0._24_4_ + fVar226;
            auVar347._28_4_ = local_4e0._28_4_ + fVar161;
            fVar204 = fVar262 * -fVar251 * auVar320._0_4_;
            fVar217 = fVar267 * -fVar264 * auVar320._4_4_;
            auVar83._4_4_ = fVar217;
            auVar83._0_4_ = fVar204;
            fVar218 = fVar271 * -fVar270 * auVar320._8_4_;
            auVar83._8_4_ = fVar218;
            fVar219 = fVar310 * -fVar272 * auVar320._12_4_;
            auVar83._12_4_ = fVar219;
            fVar221 = fVar225 * -fVar311 * auVar320._16_4_;
            auVar83._16_4_ = fVar221;
            fVar223 = fVar312 * -fVar313 * auVar320._20_4_;
            auVar83._20_4_ = fVar223;
            fVar226 = fVar228 * -fVar314 * auVar320._24_4_;
            auVar83._24_4_ = fVar226;
            auVar83._28_4_ = auVar307._28_4_;
            auVar171 = vsubps_avx(auVar152,auVar81);
            auVar238._0_4_ = auVar260._0_4_ + fVar204;
            auVar238._4_4_ = auVar260._4_4_ + fVar217;
            auVar238._8_4_ = auVar260._8_4_ + fVar218;
            auVar238._12_4_ = auVar260._12_4_ + fVar219;
            auVar238._16_4_ = auVar260._16_4_ + fVar221;
            auVar238._20_4_ = auVar260._20_4_ + fVar223;
            auVar238._24_4_ = auVar260._24_4_ + fVar226;
            auVar238._28_4_ = auVar260._28_4_ + auVar307._28_4_;
            fVar204 = fVar262 * 0.0 * auVar320._0_4_;
            fVar217 = fVar267 * 0.0 * auVar320._4_4_;
            auVar84._4_4_ = fVar217;
            auVar84._0_4_ = fVar204;
            fVar218 = fVar271 * 0.0 * auVar320._8_4_;
            auVar84._8_4_ = fVar218;
            fVar219 = fVar310 * 0.0 * auVar320._12_4_;
            auVar84._12_4_ = fVar219;
            fVar221 = fVar225 * 0.0 * auVar320._16_4_;
            auVar84._16_4_ = fVar221;
            fVar223 = fVar312 * 0.0 * auVar320._20_4_;
            auVar84._20_4_ = fVar223;
            fVar226 = fVar228 * 0.0 * auVar320._24_4_;
            auVar84._24_4_ = fVar226;
            auVar84._28_4_ = auVar152._28_4_;
            auVar25 = vsubps_avx(local_4e0,auVar82);
            auVar122._4_4_ = fStack_5bc;
            auVar122._0_4_ = local_5c0;
            auVar122._8_4_ = fStack_5b8;
            auVar122._12_4_ = fStack_5b4;
            auVar122._16_4_ = fStack_5b0;
            auVar122._20_4_ = fStack_5ac;
            auVar122._24_4_ = fStack_5a8;
            auVar122._28_4_ = fStack_5a4;
            auVar322._0_4_ = local_5c0 + fVar204;
            auVar322._4_4_ = fStack_5bc + fVar217;
            auVar322._8_4_ = fStack_5b8 + fVar218;
            auVar322._12_4_ = fStack_5b4 + fVar219;
            auVar322._16_4_ = fStack_5b0 + fVar221;
            auVar322._20_4_ = fStack_5ac + fVar223;
            auVar322._24_4_ = fStack_5a8 + fVar226;
            auVar322._28_4_ = fStack_5a4 + auVar152._28_4_;
            auVar26 = vsubps_avx(auVar260,auVar83);
            auVar27 = vsubps_avx(auVar122,auVar84);
            auVar28 = vsubps_avx(auVar238,auVar170);
            auVar29 = vsubps_avx(auVar322,auVar171);
            auVar85._4_4_ = auVar171._4_4_ * auVar28._4_4_;
            auVar85._0_4_ = auVar171._0_4_ * auVar28._0_4_;
            auVar85._8_4_ = auVar171._8_4_ * auVar28._8_4_;
            auVar85._12_4_ = auVar171._12_4_ * auVar28._12_4_;
            auVar85._16_4_ = auVar171._16_4_ * auVar28._16_4_;
            auVar85._20_4_ = auVar171._20_4_ * auVar28._20_4_;
            auVar85._24_4_ = auVar171._24_4_ * auVar28._24_4_;
            auVar85._28_4_ = auVar342._28_4_;
            auVar86._4_4_ = auVar170._4_4_ * auVar29._4_4_;
            auVar86._0_4_ = auVar170._0_4_ * auVar29._0_4_;
            auVar86._8_4_ = auVar170._8_4_ * auVar29._8_4_;
            auVar86._12_4_ = auVar170._12_4_ * auVar29._12_4_;
            auVar86._16_4_ = auVar170._16_4_ * auVar29._16_4_;
            auVar86._20_4_ = auVar170._20_4_ * auVar29._20_4_;
            auVar86._24_4_ = auVar170._24_4_ * auVar29._24_4_;
            auVar86._28_4_ = auVar260._28_4_;
            auVar30 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar23._4_4_ * auVar29._4_4_;
            auVar87._0_4_ = auVar23._0_4_ * auVar29._0_4_;
            auVar87._8_4_ = auVar23._8_4_ * auVar29._8_4_;
            auVar87._12_4_ = auVar23._12_4_ * auVar29._12_4_;
            auVar87._16_4_ = auVar23._16_4_ * auVar29._16_4_;
            auVar87._20_4_ = auVar23._20_4_ * auVar29._20_4_;
            auVar87._24_4_ = auVar23._24_4_ * auVar29._24_4_;
            auVar87._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar347,auVar23);
            auVar88._4_4_ = auVar171._4_4_ * auVar29._4_4_;
            auVar88._0_4_ = auVar171._0_4_ * auVar29._0_4_;
            auVar88._8_4_ = auVar171._8_4_ * auVar29._8_4_;
            auVar88._12_4_ = auVar171._12_4_ * auVar29._12_4_;
            auVar88._16_4_ = auVar171._16_4_ * auVar29._16_4_;
            auVar88._20_4_ = auVar171._20_4_ * auVar29._20_4_;
            auVar88._24_4_ = auVar171._24_4_ * auVar29._24_4_;
            auVar88._28_4_ = auVar319._28_4_;
            auVar145 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar170._4_4_ * auVar29._4_4_;
            auVar89._0_4_ = auVar170._0_4_ * auVar29._0_4_;
            auVar89._8_4_ = auVar170._8_4_ * auVar29._8_4_;
            auVar89._12_4_ = auVar170._12_4_ * auVar29._12_4_;
            auVar89._16_4_ = auVar170._16_4_ * auVar29._16_4_;
            auVar89._20_4_ = auVar170._20_4_ * auVar29._20_4_;
            auVar89._24_4_ = auVar170._24_4_ * auVar29._24_4_;
            auVar89._28_4_ = auVar319._28_4_;
            auVar90._4_4_ = auVar23._4_4_ * auVar28._4_4_;
            auVar90._0_4_ = auVar23._0_4_ * auVar28._0_4_;
            auVar90._8_4_ = auVar23._8_4_ * auVar28._8_4_;
            auVar90._12_4_ = auVar23._12_4_ * auVar28._12_4_;
            auVar90._16_4_ = auVar23._16_4_ * auVar28._16_4_;
            auVar90._20_4_ = auVar23._20_4_ * auVar28._20_4_;
            auVar90._24_4_ = auVar23._24_4_ * auVar28._24_4_;
            auVar90._28_4_ = auVar28._28_4_;
            auVar319 = vsubps_avx(auVar90,auVar89);
            auVar176._0_4_ = auVar30._0_4_ * 0.0 + auVar319._0_4_ + auVar145._0_4_ * 0.0;
            auVar176._4_4_ = auVar30._4_4_ * 0.0 + auVar319._4_4_ + auVar145._4_4_ * 0.0;
            auVar176._8_4_ = auVar30._8_4_ * 0.0 + auVar319._8_4_ + auVar145._8_4_ * 0.0;
            auVar176._12_4_ = auVar30._12_4_ * 0.0 + auVar319._12_4_ + auVar145._12_4_ * 0.0;
            auVar176._16_4_ = auVar30._16_4_ * 0.0 + auVar319._16_4_ + auVar145._16_4_ * 0.0;
            auVar176._20_4_ = auVar30._20_4_ * 0.0 + auVar319._20_4_ + auVar145._20_4_ * 0.0;
            auVar176._24_4_ = auVar30._24_4_ * 0.0 + auVar319._24_4_ + auVar145._24_4_ * 0.0;
            auVar176._28_4_ = auVar30._28_4_ + auVar319._28_4_ + auVar145._28_4_;
            auVar169 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,2);
            auVar319 = vblendvps_avx(auVar25,_local_640,auVar169);
            auVar216 = ZEXT3264(auVar319);
            auVar120._4_4_ = fStack_65c;
            auVar120._0_4_ = local_660;
            auVar120._8_4_ = fStack_658;
            auVar120._12_4_ = fStack_654;
            auVar120._16_4_ = fStack_650;
            auVar120._20_4_ = fStack_64c;
            auVar120._24_4_ = fStack_648;
            auVar120._28_4_ = fStack_644;
            auVar25 = vblendvps_avx(auVar26,auVar120,auVar169);
            auVar26 = vblendvps_avx(auVar27,auVar361,auVar169);
            auVar27 = vblendvps_avx(auVar23,auVar347,auVar169);
            auVar28 = vblendvps_avx(auVar170,auVar238,auVar169);
            auVar29 = vblendvps_avx(auVar171,auVar322,auVar169);
            auVar30 = vblendvps_avx(auVar347,auVar23,auVar169);
            auVar145 = vblendvps_avx(auVar238,auVar170,auVar169);
            auVar146 = vblendvps_avx(auVar322,auVar171,auVar169);
            auVar23 = vandps_avx(auVar174,auVar24);
            auVar30 = vsubps_avx(auVar30,auVar319);
            auVar172 = vsubps_avx(auVar145,auVar25);
            auVar146 = vsubps_avx(auVar146,auVar26);
            auVar198 = vsubps_avx(auVar25,auVar28);
            fVar204 = auVar172._0_4_;
            fVar244 = auVar26._0_4_;
            fVar229 = auVar172._4_4_;
            fVar246 = auVar26._4_4_;
            auVar91._4_4_ = fVar246 * fVar229;
            auVar91._0_4_ = fVar244 * fVar204;
            fVar251 = auVar172._8_4_;
            fVar298 = auVar26._8_4_;
            auVar91._8_4_ = fVar298 * fVar251;
            fVar310 = auVar172._12_4_;
            fVar299 = auVar26._12_4_;
            auVar91._12_4_ = fVar299 * fVar310;
            fVar188 = auVar172._16_4_;
            fVar300 = auVar26._16_4_;
            auVar91._16_4_ = fVar300 * fVar188;
            fVar162 = auVar172._20_4_;
            fVar301 = auVar26._20_4_;
            auVar91._20_4_ = fVar301 * fVar162;
            fVar187 = auVar172._24_4_;
            fVar302 = auVar26._24_4_;
            auVar91._24_4_ = fVar302 * fVar187;
            auVar91._28_4_ = auVar145._28_4_;
            fVar217 = auVar25._0_4_;
            fVar315 = auVar146._0_4_;
            fVar241 = auVar25._4_4_;
            fVar324 = auVar146._4_4_;
            auVar92._4_4_ = fVar324 * fVar241;
            auVar92._0_4_ = fVar315 * fVar217;
            fVar262 = auVar25._8_4_;
            fVar325 = auVar146._8_4_;
            auVar92._8_4_ = fVar325 * fVar262;
            fVar311 = auVar25._12_4_;
            fVar326 = auVar146._12_4_;
            auVar92._12_4_ = fVar326 * fVar311;
            fVar250 = auVar25._16_4_;
            fVar327 = auVar146._16_4_;
            auVar92._16_4_ = fVar327 * fVar250;
            fVar164 = auVar25._20_4_;
            fVar328 = auVar146._20_4_;
            auVar92._20_4_ = fVar328 * fVar164;
            fVar189 = auVar25._24_4_;
            fVar329 = auVar146._24_4_;
            uVar8 = auVar170._28_4_;
            auVar92._24_4_ = fVar329 * fVar189;
            auVar92._28_4_ = uVar8;
            auVar145 = vsubps_avx(auVar92,auVar91);
            fVar218 = auVar319._0_4_;
            fVar243 = auVar319._4_4_;
            auVar93._4_4_ = fVar324 * fVar243;
            auVar93._0_4_ = fVar315 * fVar218;
            fVar264 = auVar319._8_4_;
            auVar93._8_4_ = fVar325 * fVar264;
            fVar225 = auVar319._12_4_;
            auVar93._12_4_ = fVar326 * fVar225;
            fVar285 = auVar319._16_4_;
            auVar93._16_4_ = fVar327 * fVar285;
            fVar180 = auVar319._20_4_;
            auVar93._20_4_ = fVar328 * fVar180;
            fVar286 = auVar319._24_4_;
            auVar93._24_4_ = fVar329 * fVar286;
            auVar93._28_4_ = uVar8;
            fVar219 = auVar30._0_4_;
            fVar245 = auVar30._4_4_;
            auVar94._4_4_ = fVar246 * fVar245;
            auVar94._0_4_ = fVar244 * fVar219;
            fVar267 = auVar30._8_4_;
            auVar94._8_4_ = fVar298 * fVar267;
            fVar313 = auVar30._12_4_;
            auVar94._12_4_ = fVar299 * fVar313;
            fVar220 = auVar30._16_4_;
            auVar94._16_4_ = fVar300 * fVar220;
            fVar141 = auVar30._20_4_;
            auVar94._20_4_ = fVar301 * fVar141;
            fVar266 = auVar30._24_4_;
            auVar94._24_4_ = fVar302 * fVar266;
            auVar94._28_4_ = auVar347._28_4_;
            auVar170 = vsubps_avx(auVar94,auVar93);
            auVar95._4_4_ = fVar241 * fVar245;
            auVar95._0_4_ = fVar217 * fVar219;
            auVar95._8_4_ = fVar262 * fVar267;
            auVar95._12_4_ = fVar311 * fVar313;
            auVar95._16_4_ = fVar250 * fVar220;
            auVar95._20_4_ = fVar164 * fVar141;
            auVar95._24_4_ = fVar189 * fVar266;
            auVar95._28_4_ = uVar8;
            auVar96._4_4_ = fVar243 * fVar229;
            auVar96._0_4_ = fVar218 * fVar204;
            auVar96._8_4_ = fVar264 * fVar251;
            auVar96._12_4_ = fVar225 * fVar310;
            auVar96._16_4_ = fVar285 * fVar188;
            auVar96._20_4_ = fVar180 * fVar162;
            auVar96._24_4_ = fVar286 * fVar187;
            auVar96._28_4_ = auVar171._28_4_;
            auVar171 = vsubps_avx(auVar96,auVar95);
            auVar199 = vsubps_avx(auVar26,auVar29);
            fVar223 = auVar171._28_4_ + auVar170._28_4_;
            auVar333._0_4_ = auVar171._0_4_ + auVar170._0_4_ * 0.0 + auVar145._0_4_ * 0.0;
            auVar333._4_4_ = auVar171._4_4_ + auVar170._4_4_ * 0.0 + auVar145._4_4_ * 0.0;
            auVar333._8_4_ = auVar171._8_4_ + auVar170._8_4_ * 0.0 + auVar145._8_4_ * 0.0;
            auVar333._12_4_ = auVar171._12_4_ + auVar170._12_4_ * 0.0 + auVar145._12_4_ * 0.0;
            auVar333._16_4_ = auVar171._16_4_ + auVar170._16_4_ * 0.0 + auVar145._16_4_ * 0.0;
            auVar333._20_4_ = auVar171._20_4_ + auVar170._20_4_ * 0.0 + auVar145._20_4_ * 0.0;
            auVar333._24_4_ = auVar171._24_4_ + auVar170._24_4_ * 0.0 + auVar145._24_4_ * 0.0;
            auVar333._28_4_ = fVar223 + auVar145._28_4_;
            fVar221 = auVar198._0_4_;
            fVar247 = auVar198._4_4_;
            auVar97._4_4_ = auVar29._4_4_ * fVar247;
            auVar97._0_4_ = auVar29._0_4_ * fVar221;
            fVar270 = auVar198._8_4_;
            auVar97._8_4_ = auVar29._8_4_ * fVar270;
            fVar312 = auVar198._12_4_;
            auVar97._12_4_ = auVar29._12_4_ * fVar312;
            fVar222 = auVar198._16_4_;
            auVar97._16_4_ = auVar29._16_4_ * fVar222;
            fVar183 = auVar198._20_4_;
            auVar97._20_4_ = auVar29._20_4_ * fVar183;
            fVar269 = auVar198._24_4_;
            auVar97._24_4_ = auVar29._24_4_ * fVar269;
            auVar97._28_4_ = fVar223;
            fVar223 = auVar199._0_4_;
            fVar248 = auVar199._4_4_;
            auVar98._4_4_ = auVar28._4_4_ * fVar248;
            auVar98._0_4_ = auVar28._0_4_ * fVar223;
            fVar271 = auVar199._8_4_;
            auVar98._8_4_ = auVar28._8_4_ * fVar271;
            fVar314 = auVar199._12_4_;
            auVar98._12_4_ = auVar28._12_4_ * fVar314;
            fVar224 = auVar199._16_4_;
            auVar98._16_4_ = auVar28._16_4_ * fVar224;
            fVar184 = auVar199._20_4_;
            auVar98._20_4_ = auVar28._20_4_ * fVar184;
            fVar230 = auVar199._24_4_;
            auVar98._24_4_ = auVar28._24_4_ * fVar230;
            auVar98._28_4_ = auVar171._28_4_;
            auVar170 = vsubps_avx(auVar98,auVar97);
            auVar171 = vsubps_avx(auVar319,auVar27);
            fVar226 = auVar171._0_4_;
            fVar249 = auVar171._4_4_;
            auVar99._4_4_ = auVar29._4_4_ * fVar249;
            auVar99._0_4_ = auVar29._0_4_ * fVar226;
            fVar272 = auVar171._8_4_;
            auVar99._8_4_ = auVar29._8_4_ * fVar272;
            fVar228 = auVar171._12_4_;
            auVar99._12_4_ = auVar29._12_4_ * fVar228;
            fVar227 = auVar171._16_4_;
            auVar99._16_4_ = auVar29._16_4_ * fVar227;
            fVar186 = auVar171._20_4_;
            auVar99._20_4_ = auVar29._20_4_ * fVar186;
            fVar242 = auVar171._24_4_;
            auVar99._24_4_ = auVar29._24_4_ * fVar242;
            auVar99._28_4_ = auVar29._28_4_;
            auVar100._4_4_ = fVar248 * auVar27._4_4_;
            auVar100._0_4_ = fVar223 * auVar27._0_4_;
            auVar100._8_4_ = fVar271 * auVar27._8_4_;
            auVar100._12_4_ = fVar314 * auVar27._12_4_;
            auVar100._16_4_ = fVar224 * auVar27._16_4_;
            auVar100._20_4_ = fVar184 * auVar27._20_4_;
            auVar100._24_4_ = fVar230 * auVar27._24_4_;
            auVar100._28_4_ = auVar145._28_4_;
            auVar29 = vsubps_avx(auVar99,auVar100);
            auVar101._4_4_ = auVar28._4_4_ * fVar249;
            auVar101._0_4_ = auVar28._0_4_ * fVar226;
            auVar101._8_4_ = auVar28._8_4_ * fVar272;
            auVar101._12_4_ = auVar28._12_4_ * fVar228;
            auVar101._16_4_ = auVar28._16_4_ * fVar227;
            auVar101._20_4_ = auVar28._20_4_ * fVar186;
            auVar101._24_4_ = auVar28._24_4_ * fVar242;
            auVar101._28_4_ = auVar28._28_4_;
            auVar102._4_4_ = fVar247 * auVar27._4_4_;
            auVar102._0_4_ = fVar221 * auVar27._0_4_;
            auVar102._8_4_ = fVar270 * auVar27._8_4_;
            auVar102._12_4_ = fVar312 * auVar27._12_4_;
            auVar102._16_4_ = fVar222 * auVar27._16_4_;
            auVar102._20_4_ = fVar183 * auVar27._20_4_;
            auVar102._24_4_ = fVar269 * auVar27._24_4_;
            auVar102._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar102,auVar101);
            auVar153._0_4_ = auVar170._0_4_ * 0.0 + auVar27._0_4_ + auVar29._0_4_ * 0.0;
            auVar153._4_4_ = auVar170._4_4_ * 0.0 + auVar27._4_4_ + auVar29._4_4_ * 0.0;
            auVar153._8_4_ = auVar170._8_4_ * 0.0 + auVar27._8_4_ + auVar29._8_4_ * 0.0;
            auVar153._12_4_ = auVar170._12_4_ * 0.0 + auVar27._12_4_ + auVar29._12_4_ * 0.0;
            auVar153._16_4_ = auVar170._16_4_ * 0.0 + auVar27._16_4_ + auVar29._16_4_ * 0.0;
            auVar153._20_4_ = auVar170._20_4_ * 0.0 + auVar27._20_4_ + auVar29._20_4_ * 0.0;
            auVar153._24_4_ = auVar170._24_4_ * 0.0 + auVar27._24_4_ + auVar29._24_4_ * 0.0;
            auVar153._28_4_ = auVar29._28_4_ + auVar27._28_4_ + auVar29._28_4_;
            auVar154 = ZEXT3264(auVar153);
            auVar27 = vmaxps_avx(auVar333,auVar153);
            auVar27 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,2);
            auVar240 = ZEXT3264(auVar23);
            auVar28 = auVar23 & auVar27;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) {
LAB_00ffc7b3:
              auVar178._8_8_ = uStack_578;
              auVar178._0_8_ = local_580;
              auVar178._16_8_ = uStack_570;
              auVar178._24_8_ = uStack_568;
              auVar344._4_4_ = fVar155;
              auVar344._0_4_ = fVar203;
              auVar344._8_4_ = fVar156;
              auVar344._12_4_ = fVar157;
              auVar344._16_4_ = fVar158;
              auVar344._20_4_ = fVar159;
              auVar344._24_4_ = fVar160;
              auVar344._28_4_ = fVar161;
            }
            else {
              auVar28 = vandps_avx(auVar27,auVar23);
              auVar103._4_4_ = fVar248 * fVar229;
              auVar103._0_4_ = fVar223 * fVar204;
              auVar103._8_4_ = fVar271 * fVar251;
              auVar103._12_4_ = fVar314 * fVar310;
              auVar103._16_4_ = fVar224 * fVar188;
              auVar103._20_4_ = fVar184 * fVar162;
              auVar103._24_4_ = fVar230 * fVar187;
              auVar103._28_4_ = auVar23._28_4_;
              auVar104._4_4_ = fVar247 * fVar324;
              auVar104._0_4_ = fVar221 * fVar315;
              auVar104._8_4_ = fVar270 * fVar325;
              auVar104._12_4_ = fVar312 * fVar326;
              auVar104._16_4_ = fVar222 * fVar327;
              auVar104._20_4_ = fVar183 * fVar328;
              auVar104._24_4_ = fVar269 * fVar329;
              auVar104._28_4_ = auVar27._28_4_;
              auVar27 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar249 * fVar324;
              auVar105._0_4_ = fVar226 * fVar315;
              auVar105._8_4_ = fVar272 * fVar325;
              auVar105._12_4_ = fVar228 * fVar326;
              auVar105._16_4_ = fVar227 * fVar327;
              auVar105._20_4_ = fVar186 * fVar328;
              auVar105._24_4_ = fVar242 * fVar329;
              auVar105._28_4_ = auVar146._28_4_;
              auVar106._4_4_ = fVar248 * fVar245;
              auVar106._0_4_ = fVar223 * fVar219;
              auVar106._8_4_ = fVar271 * fVar267;
              auVar106._12_4_ = fVar314 * fVar313;
              auVar106._16_4_ = fVar224 * fVar220;
              auVar106._20_4_ = fVar184 * fVar141;
              auVar106._24_4_ = fVar230 * fVar266;
              auVar106._28_4_ = auVar199._28_4_;
              auVar29 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar247 * fVar245;
              auVar107._0_4_ = fVar221 * fVar219;
              auVar107._8_4_ = fVar270 * fVar267;
              auVar107._12_4_ = fVar312 * fVar313;
              auVar107._16_4_ = fVar222 * fVar220;
              auVar107._20_4_ = fVar183 * fVar141;
              auVar107._24_4_ = fVar269 * fVar266;
              auVar107._28_4_ = auVar30._28_4_;
              auVar108._4_4_ = fVar249 * fVar229;
              auVar108._0_4_ = fVar226 * fVar204;
              auVar108._8_4_ = fVar272 * fVar251;
              auVar108._12_4_ = fVar228 * fVar310;
              auVar108._16_4_ = fVar227 * fVar188;
              auVar108._20_4_ = fVar186 * fVar162;
              auVar108._24_4_ = fVar242 * fVar187;
              auVar108._28_4_ = auVar172._28_4_;
              auVar145 = vsubps_avx(auVar108,auVar107);
              auVar177._0_4_ = auVar27._0_4_ * 0.0 + auVar145._0_4_ + auVar29._0_4_ * 0.0;
              auVar177._4_4_ = auVar27._4_4_ * 0.0 + auVar145._4_4_ + auVar29._4_4_ * 0.0;
              auVar177._8_4_ = auVar27._8_4_ * 0.0 + auVar145._8_4_ + auVar29._8_4_ * 0.0;
              auVar177._12_4_ = auVar27._12_4_ * 0.0 + auVar145._12_4_ + auVar29._12_4_ * 0.0;
              auVar177._16_4_ = auVar27._16_4_ * 0.0 + auVar145._16_4_ + auVar29._16_4_ * 0.0;
              auVar177._20_4_ = auVar27._20_4_ * 0.0 + auVar145._20_4_ + auVar29._20_4_ * 0.0;
              auVar177._24_4_ = auVar27._24_4_ * 0.0 + auVar145._24_4_ + auVar29._24_4_ * 0.0;
              auVar177._28_4_ = auVar172._28_4_ + auVar145._28_4_ + auVar30._28_4_;
              auVar23 = vrcpps_avx(auVar177);
              fVar204 = auVar23._0_4_;
              fVar219 = auVar23._4_4_;
              auVar109._4_4_ = auVar177._4_4_ * fVar219;
              auVar109._0_4_ = auVar177._0_4_ * fVar204;
              fVar221 = auVar23._8_4_;
              auVar109._8_4_ = auVar177._8_4_ * fVar221;
              fVar223 = auVar23._12_4_;
              auVar109._12_4_ = auVar177._12_4_ * fVar223;
              fVar226 = auVar23._16_4_;
              auVar109._16_4_ = auVar177._16_4_ * fVar226;
              fVar229 = auVar23._20_4_;
              auVar109._20_4_ = auVar177._20_4_ * fVar229;
              fVar245 = auVar23._24_4_;
              auVar109._24_4_ = auVar177._24_4_ * fVar245;
              auVar109._28_4_ = auVar199._28_4_;
              auVar343._8_4_ = 0x3f800000;
              auVar343._0_8_ = 0x3f8000003f800000;
              auVar343._12_4_ = 0x3f800000;
              auVar343._16_4_ = 0x3f800000;
              auVar343._20_4_ = 0x3f800000;
              auVar343._24_4_ = 0x3f800000;
              auVar343._28_4_ = 0x3f800000;
              auVar23 = vsubps_avx(auVar343,auVar109);
              fVar204 = auVar23._0_4_ * fVar204 + fVar204;
              fVar219 = auVar23._4_4_ * fVar219 + fVar219;
              fVar221 = auVar23._8_4_ * fVar221 + fVar221;
              fVar223 = auVar23._12_4_ * fVar223 + fVar223;
              fVar226 = auVar23._16_4_ * fVar226 + fVar226;
              fVar229 = auVar23._20_4_ * fVar229 + fVar229;
              fVar245 = auVar23._24_4_ * fVar245 + fVar245;
              auVar110._4_4_ =
                   (fVar243 * auVar27._4_4_ + auVar29._4_4_ * fVar241 + auVar145._4_4_ * fVar246) *
                   fVar219;
              auVar110._0_4_ =
                   (fVar218 * auVar27._0_4_ + auVar29._0_4_ * fVar217 + auVar145._0_4_ * fVar244) *
                   fVar204;
              auVar110._8_4_ =
                   (fVar264 * auVar27._8_4_ + auVar29._8_4_ * fVar262 + auVar145._8_4_ * fVar298) *
                   fVar221;
              auVar110._12_4_ =
                   (fVar225 * auVar27._12_4_ + auVar29._12_4_ * fVar311 + auVar145._12_4_ * fVar299)
                   * fVar223;
              auVar110._16_4_ =
                   (fVar285 * auVar27._16_4_ + auVar29._16_4_ * fVar250 + auVar145._16_4_ * fVar300)
                   * fVar226;
              auVar110._20_4_ =
                   (fVar180 * auVar27._20_4_ + auVar29._20_4_ * fVar164 + auVar145._20_4_ * fVar301)
                   * fVar229;
              auVar110._24_4_ =
                   (fVar286 * auVar27._24_4_ + auVar29._24_4_ * fVar189 + auVar145._24_4_ * fVar302)
                   * fVar245;
              auVar110._28_4_ = auVar319._28_4_ + auVar25._28_4_ + auVar26._28_4_;
              auVar216 = ZEXT3264(auVar110);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar239._4_4_ = uVar8;
              auVar239._0_4_ = uVar8;
              auVar239._8_4_ = uVar8;
              auVar239._12_4_ = uVar8;
              auVar239._16_4_ = uVar8;
              auVar239._20_4_ = uVar8;
              auVar239._24_4_ = uVar8;
              auVar239._28_4_ = uVar8;
              auVar23 = vcmpps_avx(local_560,auVar110,2);
              auVar319 = vcmpps_avx(auVar110,auVar239,2);
              auVar240 = ZEXT3264(auVar319);
              auVar23 = vandps_avx(auVar23,auVar319);
              auVar25 = auVar28 & auVar23;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0x7f,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0xbf,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar25[0x1f]) goto LAB_00ffc7b3;
              auVar23 = vandps_avx(auVar28,auVar23);
              auVar25 = vcmpps_avx(ZEXT832(0) << 0x20,auVar177,4);
              auVar26 = auVar23 & auVar25;
              auVar178._8_8_ = uStack_578;
              auVar178._0_8_ = local_580;
              auVar178._16_8_ = uStack_570;
              auVar178._24_8_ = uStack_568;
              auVar344._4_4_ = fVar155;
              auVar344._0_4_ = fVar203;
              auVar344._8_4_ = fVar156;
              auVar344._12_4_ = fVar157;
              auVar344._16_4_ = fVar158;
              auVar344._20_4_ = fVar159;
              auVar344._24_4_ = fVar160;
              auVar344._28_4_ = fVar161;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar178 = vandps_avx(auVar25,auVar23);
                auVar111._4_4_ = fVar219 * auVar333._4_4_;
                auVar111._0_4_ = fVar204 * auVar333._0_4_;
                auVar111._8_4_ = fVar221 * auVar333._8_4_;
                auVar111._12_4_ = fVar223 * auVar333._12_4_;
                auVar111._16_4_ = fVar226 * auVar333._16_4_;
                auVar111._20_4_ = fVar229 * auVar333._20_4_;
                auVar111._24_4_ = fVar245 * auVar333._24_4_;
                auVar111._28_4_ = auVar319._28_4_;
                auVar112._4_4_ = auVar153._4_4_ * fVar219;
                auVar112._0_4_ = auVar153._0_4_ * fVar204;
                auVar112._8_4_ = auVar153._8_4_ * fVar221;
                auVar112._12_4_ = auVar153._12_4_ * fVar223;
                auVar112._16_4_ = auVar153._16_4_ * fVar226;
                auVar112._20_4_ = auVar153._20_4_ * fVar229;
                auVar112._24_4_ = auVar153._24_4_ * fVar245;
                auVar112._28_4_ = auVar153._28_4_;
                auVar281._8_4_ = 0x3f800000;
                auVar281._0_8_ = 0x3f8000003f800000;
                auVar281._12_4_ = 0x3f800000;
                auVar281._16_4_ = 0x3f800000;
                auVar281._20_4_ = 0x3f800000;
                auVar281._24_4_ = 0x3f800000;
                auVar281._28_4_ = 0x3f800000;
                auVar23 = vsubps_avx(auVar281,auVar111);
                local_1c0 = vblendvps_avx(auVar23,auVar111,auVar169);
                auVar23 = vsubps_avx(auVar281,auVar112);
                auVar240 = ZEXT3264(auVar23);
                _local_3e0 = vblendvps_avx(auVar23,auVar112,auVar169);
                auVar154 = ZEXT3264(_local_3e0);
                local_1e0 = auVar110;
              }
            }
            auVar337 = ZEXT3264(auVar173);
            pRVar133 = (RTCIntersectArguments *)((ulong)pRVar133 & 0xffffffff);
            _local_700 = auVar320;
            local_4c0 = auVar174;
            if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar178 >> 0x7f,0) != '\0') ||
                  (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0xbf,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar178[0x1f] < '\0') {
              auVar23 = vsubps_avx(auVar320,auVar344);
              auVar216 = ZEXT3264(local_1c0);
              fVar217 = auVar344._0_4_ + auVar23._0_4_ * local_1c0._0_4_;
              fVar218 = auVar344._4_4_ + auVar23._4_4_ * local_1c0._4_4_;
              fVar219 = auVar344._8_4_ + auVar23._8_4_ * local_1c0._8_4_;
              fVar221 = auVar344._12_4_ + auVar23._12_4_ * local_1c0._12_4_;
              fVar223 = auVar344._16_4_ + auVar23._16_4_ * local_1c0._16_4_;
              fVar226 = auVar344._20_4_ + auVar23._20_4_ * local_1c0._20_4_;
              fVar229 = auVar344._24_4_ + auVar23._24_4_ * local_1c0._24_4_;
              fVar241 = auVar344._28_4_ + auVar23._28_4_;
              fVar204 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar113._4_4_ = (fVar218 + fVar218) * fVar204;
              auVar113._0_4_ = (fVar217 + fVar217) * fVar204;
              auVar113._8_4_ = (fVar219 + fVar219) * fVar204;
              auVar113._12_4_ = (fVar221 + fVar221) * fVar204;
              auVar113._16_4_ = (fVar223 + fVar223) * fVar204;
              auVar113._20_4_ = (fVar226 + fVar226) * fVar204;
              auVar113._24_4_ = (fVar229 + fVar229) * fVar204;
              auVar113._28_4_ = fVar241 + fVar241;
              auVar240 = ZEXT3264(local_1e0);
              auVar23 = vcmpps_avx(local_1e0,auVar113,6);
              auVar154 = ZEXT3264(auVar23);
              auVar319 = auVar178 & auVar23;
              if ((((((((auVar319 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar319 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar319 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar319 >> 0x7f,0) != '\0') ||
                    (auVar319 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar319 >> 0xbf,0) != '\0') ||
                  (auVar319 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar319[0x1f] < '\0') {
                local_260 = vandps_avx(auVar23,auVar178);
                auVar154 = ZEXT3264(local_260);
                local_300 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
                fStack_2fc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
                fStack_2f8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                fStack_2f4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                fStack_2f0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                fStack_2ec = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                fStack_2e8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                fStack_2e4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                local_320 = local_1c0;
                local_2e0 = local_1e0;
                local_2a0 = local_6d0;
                uStack_298 = uStack_6c8;
                local_290 = local_5d0;
                uStack_288 = uStack_5c8;
                local_280 = local_5e0;
                uStack_278 = uStack_5d8;
                pGVar21 = (context->scene->geometries).items[local_768].ptr;
                local_3e0._4_4_ = fStack_2fc;
                local_3e0._0_4_ = local_300;
                uStack_3d8._0_4_ = fStack_2f8;
                uStack_3d8._4_4_ = fStack_2f4;
                uStack_3d0._0_4_ = fStack_2f0;
                uStack_3d0._4_4_ = fStack_2ec;
                auVar128 = _local_3e0;
                uStack_3c8._0_4_ = fStack_2e8;
                uStack_3c8._4_4_ = fStack_2e4;
                auVar23 = _local_3e0;
                _local_3e0 = auVar23;
                if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar133 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar133 = context->args;
                  if ((pRVar133->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar133 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar133 >> 8),1),
                     pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    stack0xfffffffffffff8c8 = auVar333._8_24_;
                    auVar207 = vshufps_avx(ZEXT416((uint)(float)(int)local_2c0),
                                           ZEXT416((uint)(float)(int)local_2c0),0);
                    local_240[0] = (auVar207._0_4_ + local_1c0._0_4_ + 0.0) * (float)local_100._0_4_
                    ;
                    local_240[1] = (auVar207._4_4_ + local_1c0._4_4_ + 1.0) * (float)local_100._4_4_
                    ;
                    local_240[2] = (auVar207._8_4_ + local_1c0._8_4_ + 2.0) * fStack_f8;
                    local_240[3] = (auVar207._12_4_ + local_1c0._12_4_ + 3.0) * fStack_f4;
                    fStack_230 = (auVar207._0_4_ + local_1c0._16_4_ + 4.0) * fStack_f0;
                    fStack_22c = (auVar207._4_4_ + local_1c0._20_4_ + 5.0) * fStack_ec;
                    fStack_228 = (auVar207._8_4_ + local_1c0._24_4_ + 6.0) * fStack_e8;
                    fStack_224 = auVar207._12_4_ + (float)local_1c0._28_4_ + 7.0;
                    uStack_3d0 = auVar128._16_8_;
                    uStack_3c8 = auVar23._24_8_;
                    local_220 = local_3e0;
                    uStack_218 = uStack_3d8;
                    uStack_210 = uStack_3d0;
                    uStack_208 = uStack_3c8;
                    local_200 = local_1e0;
                    iVar132 = vmovmskps_avx(local_260);
                    local_700 = (undefined1  [8])CONCAT44((int)((ulong)pRVar133 >> 0x20),iVar132);
                    lVar140 = 0;
                    if (local_700 != (undefined1  [8])0x0) {
                      for (; ((ulong)local_700 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
                      }
                    }
                    local_7a0 = (uint)lVar140;
                    uStack_79c = (undefined4)((ulong)lVar140 >> 0x20);
                    _auStack_6f8 = auVar320._8_24_;
                    if (iVar132 == 0) {
                      pRVar133 = (RTCIntersectArguments *)0x0;
                    }
                    else {
                      auStack_610 = auVar260._16_16_;
                      local_620 = *local_6b8;
                      local_640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      _local_5a0 = auVar24;
                      _local_500 = *pauVar4;
                      local_2bc = uVar20;
                      local_2b0 = uVar130;
                      uStack_2a8 = uVar131;
                      do {
                        lVar140 = CONCAT44(uStack_79c,local_7a0);
                        local_440 = local_240[lVar140];
                        local_430 = *(undefined4 *)((long)&local_220 + lVar140 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_200 + lVar140 * 4);
                        fVar217 = 1.0 - local_440;
                        fVar204 = local_440 * fVar217 + local_440 * fVar217;
                        auVar207 = ZEXT416((uint)(local_440 * local_440 * 3.0));
                        auVar207 = vshufps_avx(auVar207,auVar207,0);
                        auVar195 = ZEXT416((uint)((fVar204 - local_440 * local_440) * 3.0));
                        auVar195 = vshufps_avx(auVar195,auVar195,0);
                        auVar234._0_4_ =
                             auVar207._0_4_ * (float)local_5e0._0_4_ +
                             auVar195._0_4_ * (float)local_5d0._0_4_;
                        auVar234._4_4_ =
                             auVar207._4_4_ * (float)local_5e0._4_4_ +
                             auVar195._4_4_ * (float)local_5d0._4_4_;
                        auVar234._8_4_ =
                             auVar207._8_4_ * (float)uStack_5d8 + auVar195._8_4_ * (float)uStack_5c8
                        ;
                        auVar234._12_4_ =
                             auVar207._12_4_ * uStack_5d8._4_4_ + auVar195._12_4_ * uStack_5c8._4_4_
                        ;
                        auVar240 = ZEXT1664(auVar234);
                        auVar207 = ZEXT416((uint)((fVar217 * fVar217 - fVar204) * 3.0));
                        auVar207 = vshufps_avx(auVar207,auVar207,0);
                        local_6b0.context = context->user;
                        auVar195 = ZEXT416((uint)(fVar217 * fVar217 * -3.0));
                        auVar195 = vshufps_avx(auVar195,auVar195,0);
                        auVar196._0_4_ =
                             local_870 * auVar195._0_4_ +
                             auVar207._0_4_ * (float)local_6d0._0_4_ + auVar234._0_4_;
                        auVar196._4_4_ =
                             fStack_86c * auVar195._4_4_ +
                             auVar207._4_4_ * (float)local_6d0._4_4_ + auVar234._4_4_;
                        auVar196._8_4_ =
                             fStack_868 * auVar195._8_4_ +
                             auVar207._8_4_ * (float)uStack_6c8 + auVar234._8_4_;
                        auVar196._12_4_ =
                             fStack_864 * auVar195._12_4_ +
                             auVar207._12_4_ * uStack_6c8._4_4_ + auVar234._12_4_;
                        local_470 = (RTCHitN  [16])vshufps_avx(auVar196,auVar196,0);
                        local_460 = vshufps_avx(auVar196,auVar196,0x55);
                        auVar216 = ZEXT1664(local_460);
                        local_450 = vshufps_avx(auVar196,auVar196,0xaa);
                        local_420 = local_5f0._0_8_;
                        uStack_418 = local_5f0._8_8_;
                        local_410 = local_330._0_8_;
                        uStack_408 = local_330._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_3fc = (local_6b0.context)->instID[0];
                        local_400 = uStack_3fc;
                        uStack_3f8 = uStack_3fc;
                        uStack_3f4 = uStack_3fc;
                        uStack_3f0 = (local_6b0.context)->instPrimID[0];
                        uStack_3ec = uStack_3f0;
                        uStack_3e8 = uStack_3f0;
                        uStack_3e4 = uStack_3f0;
                        local_780 = local_620;
                        local_6b0.valid = (int *)local_780;
                        local_6b0.geometryUserPtr = pGVar21->userPtr;
                        local_6b0.hit = local_470;
                        local_6b0.N = 4;
                        local_6b0.ray = (RTCRayN *)ray;
                        fStack_43c = local_440;
                        fStack_438 = local_440;
                        fStack_434 = local_440;
                        uStack_42c = local_430;
                        uStack_428 = local_430;
                        uStack_424 = local_430;
                        if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar216 = ZEXT1664(local_460);
                          auVar240 = ZEXT1664(auVar234);
                          (*pGVar21->occlusionFilterN)(&local_6b0);
                        }
                        if (local_780 == (undefined1  [16])0x0) {
                          auVar207 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar207 = auVar207 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var22 = context->args->filter;
                          if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar216 = ZEXT1664(auVar216._0_16_);
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            (*p_Var22)(&local_6b0);
                          }
                          auVar195 = vpcmpeqd_avx(local_780,_DAT_01f7aa10);
                          auVar207 = auVar195 ^ _DAT_01f7ae20;
                          auVar197._8_4_ = 0xff800000;
                          auVar197._0_8_ = 0xff800000ff800000;
                          auVar197._12_4_ = 0xff800000;
                          auVar195 = vblendvps_avx(auVar197,*(undefined1 (*) [16])
                                                             (local_6b0.ray + 0x80),auVar195);
                          *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar195;
                        }
                        auVar154 = ZEXT1664(auVar207);
                        auVar168._8_8_ = 0x100000001;
                        auVar168._0_8_ = 0x100000001;
                        if ((auVar168 & auVar207) != (undefined1  [16])0x0) {
                          pRVar133 = (RTCIntersectArguments *)0x1;
                          break;
                        }
                        auVar154 = ZEXT464((uint)local_640._0_4_);
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_640._0_4_;
                        uVar137 = (ulong)local_700 ^ 1L << ((ulong)local_7a0 & 0x3f);
                        lVar140 = 0;
                        if (uVar137 != 0) {
                          for (; (uVar137 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
                          }
                        }
                        local_7a0 = (uint)lVar140;
                        uStack_79c = (undefined4)((ulong)lVar140 >> 0x20);
                        pRVar133 = (RTCIntersectArguments *)0x0;
                        local_700 = (undefined1  [8])uVar137;
                      } while (uVar137 != 0);
                    }
                  }
                }
                auVar337 = ZEXT3264(auVar173);
                pRVar133 = (RTCIntersectArguments *)
                           (ulong)CONCAT31((int3)(local_760 >> 8),(byte)local_760 | (byte)pRVar133);
              }
            }
          }
          auVar323 = ZEXT3264(auVar306);
          auVar309 = ZEXT3264(auVar144);
          uVar136 = (uint)pRVar133;
          local_740._0_8_ = local_740._0_8_ + 8;
        } while ((int)local_740._0_8_ < (int)uVar20);
      }
      bVar135 = (byte)uVar136;
      if ((uVar136 & 1) != 0) break;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar150._4_4_ = uVar8;
      auVar150._0_4_ = uVar8;
      auVar150._8_4_ = uVar8;
      auVar150._12_4_ = uVar8;
      auVar150._16_4_ = uVar8;
      auVar150._20_4_ = uVar8;
      auVar150._24_4_ = uVar8;
      auVar150._28_4_ = uVar8;
      auVar144 = vcmpps_avx(local_80,auVar150,2);
      uVar136 = vmovmskps_avx(auVar144);
      uVar136 = (uint)uVar138 & uVar136;
    } while (uVar136 != 0);
  }
  return (bool)(bVar135 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }